

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_avx2.c
# Opt level: O2

void av1_highbd_dr_prediction_z3_avx2
               (uint16_t *dst,ptrdiff_t stride,int bw,int bh,uint16_t *above,uint16_t *left,
               int upsample_left,int dx,int dy,int bd)

{
  int iVar1;
  int iVar2;
  uint16_t uVar3;
  undefined8 uVar4;
  __m256i alVar5;
  ushort uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [32];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  uint16_t *puVar23;
  undefined1 (*pauVar24) [16];
  undefined1 (*pauVar25) [32];
  byte bVar26;
  ulong uVar27;
  int iVar28;
  int i_2;
  uint uVar29;
  long lVar30;
  undefined1 *puVar31;
  ptrdiff_t pitchSrc;
  uint uVar32;
  long lVar33;
  uint uVar34;
  ulong uVar35;
  undefined1 (*pauVar36) [16];
  undefined1 (*pauVar37) [32];
  uint uVar38;
  int iVar39;
  int iVar40;
  ulong uVar41;
  __m256i *palVar42;
  int i;
  ulong uVar43;
  __m256i *palVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar64 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  __m128i alVar155;
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  undefined1 auVar170 [32];
  undefined1 auVar171 [32];
  undefined1 auVar172 [32];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [32];
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [32];
  undefined1 auVar205 [32];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [32];
  undefined1 auVar237 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [32];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  undefined1 auVar265 [32];
  undefined1 auVar266 [32];
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [32];
  undefined1 auVar274 [32];
  undefined1 auVar275 [32];
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar196 [16];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [32];
  undefined1 auVar306 [32];
  undefined1 auVar293 [16];
  undefined1 auVar307 [32];
  undefined1 auVar308 [32];
  undefined1 auVar309 [32];
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar318 [32];
  undefined1 auVar319 [32];
  undefined1 auVar320 [32];
  undefined1 auVar321 [32];
  undefined1 auVar322 [32];
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar389 [16];
  undefined1 auVar390 [16];
  undefined1 auVar391 [16];
  undefined1 auVar392 [16];
  undefined1 auVar393 [16];
  undefined1 auVar394 [16];
  undefined1 auVar395 [16];
  undefined1 auVar396 [16];
  undefined1 auVar397 [16];
  undefined1 auVar398 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar334 [32];
  undefined1 auVar326 [16];
  undefined1 auVar335 [32];
  undefined1 auVar327 [16];
  undefined1 auVar336 [32];
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar330 [16];
  undefined1 auVar340 [32];
  undefined1 auVar331 [16];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  undefined1 auVar346 [32];
  undefined1 auVar347 [32];
  undefined1 auVar348 [32];
  undefined1 auVar349 [32];
  undefined1 auVar350 [32];
  undefined1 auVar351 [32];
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar357 [32];
  undefined1 auVar358 [32];
  undefined1 auVar359 [32];
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  undefined1 auVar370 [32];
  undefined1 auVar371 [32];
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  undefined1 auVar376 [32];
  undefined1 auVar377 [32];
  undefined1 auVar378 [32];
  undefined1 auVar379 [32];
  undefined1 auVar380 [32];
  undefined1 auVar381 [32];
  undefined1 auVar382 [32];
  undefined1 auVar383 [32];
  undefined1 auVar384 [32];
  undefined1 auVar385 [32];
  undefined1 auVar386 [32];
  ushort uVar387;
  undefined1 auVar388 [16];
  undefined1 auVar399 [32];
  undefined1 auVar400 [32];
  undefined1 auVar401 [32];
  undefined1 auVar402 [32];
  __m128i dstvec_3 [4];
  __m128i dstvec [8];
  int in_stack_ffffffffffffdb60;
  undefined1 local_2460 [16];
  undefined1 auStack_2450 [16];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined8 auStack_23e0 [112];
  longlong local_2060 [2];
  __m128i alStack_2050;
  longlong local_2040 [2];
  __m128i alStack_2030;
  longlong local_2020 [2];
  __m128i alStack_2010;
  longlong local_2000 [2];
  __m128i alStack_1ff0;
  undefined1 local_1fe0 [16];
  undefined1 local_1fd0 [16];
  undefined1 local_1fc0 [16];
  undefined1 local_1fb0 [16];
  undefined1 local_1fa0 [16];
  undefined1 local_1f90 [16];
  undefined1 local_1f80 [16];
  undefined1 local_1f70 [16];
  undefined1 local_1f60 [256];
  longlong local_1e60 [64];
  longlong local_1c60 [64];
  longlong local_1a60 [64];
  undefined1 auStack_1860 [6192];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  
  uVar43 = (ulong)(uint)dy;
  iVar28 = (int)left;
  bVar26 = (byte)upsample_left;
  if (bw == bh) {
    if (bw != 0x40) {
      if (bw == 8) {
        iVar28 = 0xf << (bVar26 & 0x1f);
        uVar3 = left[iVar28];
        auVar50._2_2_ = uVar3;
        auVar50._0_2_ = uVar3;
        auVar50._4_2_ = uVar3;
        auVar50._6_2_ = uVar3;
        auVar50._8_2_ = uVar3;
        auVar50._10_2_ = uVar3;
        auVar50._12_2_ = uVar3;
        auVar50._14_2_ = uVar3;
        auVar60._16_2_ = uVar3;
        auVar60._0_16_ = auVar50;
        auVar60._18_2_ = uVar3;
        auVar60._20_2_ = uVar3;
        auVar60._22_2_ = uVar3;
        auVar60._24_2_ = uVar3;
        auVar60._26_2_ = uVar3;
        auVar60._28_2_ = uVar3;
        auVar60._30_2_ = uVar3;
        if (bd < 0xc) {
          auVar73._0_2_ = (undefined2)iVar28;
          auVar73._2_2_ = auVar73._0_2_;
          auVar73._4_2_ = auVar73._0_2_;
          auVar73._6_2_ = auVar73._0_2_;
          auVar73._8_2_ = auVar73._0_2_;
          auVar73._10_2_ = auVar73._0_2_;
          auVar73._12_2_ = auVar73._0_2_;
          auVar73._14_2_ = auVar73._0_2_;
          auVar99._8_2_ = 0x10;
          auVar99._0_8_ = 0x10001000100010;
          auVar99._10_2_ = 0x10;
          auVar99._12_2_ = 0x10;
          auVar99._14_2_ = 0x10;
          auVar159._8_2_ = 0x1f;
          auVar159._0_8_ = 0x1f001f001f001f;
          auVar159._10_2_ = 0x1f;
          auVar159._12_2_ = 0x1f;
          auVar159._14_2_ = 0x1f;
          auVar159._16_2_ = 0x1f;
          auVar159._18_2_ = 0x1f;
          auVar159._20_2_ = 0x1f;
          auVar159._22_2_ = 0x1f;
          auVar159._24_2_ = 0x1f;
          auVar159._26_2_ = 0x1f;
          auVar159._28_2_ = 0x1f;
          auVar159._30_2_ = 0x1f;
          for (lVar30 = 0; lVar30 != 0x80; lVar30 = lVar30 + 0x10) {
            uVar38 = (int)uVar43 >> (6 - bVar26 & 0x1f);
            if (iVar28 <= (int)uVar38) goto LAB_002f8f1e;
            auVar291 = *(undefined1 (*) [16])(left + (int)uVar38);
            if (upsample_left == 0) {
              auVar325 = *(undefined1 (*) [16])(left + (long)(int)uVar38 + 1);
              auVar179 = vpinsrw_avx(ZEXT416(uVar38),uVar38 + 1,1);
              auVar179 = vpinsrw_avx(auVar179,uVar38 + 2,2);
              auVar179 = vpinsrw_avx(auVar179,uVar38 + 3,3);
              auVar179 = vpinsrw_avx(auVar179,uVar38 + 4,4);
              auVar179 = vpinsrw_avx(auVar179,uVar38 + 5,5);
              auVar179 = vpinsrw_avx(auVar179,uVar38 + 6,6);
              auVar179 = vpinsrw_avx(auVar179,uVar38 + 7,7);
              uVar6 = (ushort)(uVar43 >> 1);
              uVar387 = uVar6 & 0x1f;
              auVar327._0_8_ =
                   CONCAT26(uVar6,CONCAT24(uVar6,CONCAT22(uVar6,uVar6))) & 0x1f001f001f001f;
              auVar327._8_2_ = uVar387;
              auVar327._10_2_ = uVar387;
              auVar327._12_2_ = uVar387;
              auVar327._14_2_ = uVar387;
            }
            else {
              auVar325 = vpblendw_avx(auVar291,(undefined1  [16])0x0,0xaa);
              auVar179 = vpblendw_avx(*(undefined1 (*) [16])(left + (long)(int)uVar38 + 8),
                                      (undefined1  [16])0x0,0xaa);
              auVar397 = vpsrld_avx(auVar291,0x10);
              auVar291 = vpackusdw_avx(auVar325,auVar179);
              auVar329 = vpsrld_avx(*(undefined1 (*) [16])(left + (long)(int)uVar38 + 8),0x10);
              auVar325 = vpinsrw_avx(ZEXT416(uVar38),uVar38 + 2,1);
              auVar325 = vpinsrw_avx(auVar325,uVar38 + 4,2);
              auVar325 = vpinsrw_avx(auVar325,uVar38 + 6,3);
              auVar325 = vpinsrw_avx(auVar325,uVar38 + 8,4);
              auVar325 = vpinsrw_avx(auVar325,uVar38 + 10,5);
              auVar325 = vpinsrw_avx(auVar325,uVar38 + 0xc,6);
              auVar179 = vpinsrw_avx(auVar325,uVar38 + 0xe,7);
              auVar335._0_2_ = (undefined2)uVar43;
              auVar335._2_2_ = auVar335._0_2_;
              auVar335._4_2_ = auVar335._0_2_;
              auVar335._6_2_ = auVar335._0_2_;
              auVar335._8_2_ = auVar335._0_2_;
              auVar335._10_2_ = auVar335._0_2_;
              auVar335._12_2_ = auVar335._0_2_;
              auVar335._14_2_ = auVar335._0_2_;
              auVar335._16_2_ = auVar335._0_2_;
              auVar335._18_2_ = auVar335._0_2_;
              auVar335._20_2_ = auVar335._0_2_;
              auVar335._22_2_ = auVar335._0_2_;
              auVar335._24_2_ = auVar335._0_2_;
              auVar335._26_2_ = auVar335._0_2_;
              auVar335._28_2_ = auVar335._0_2_;
              auVar335._30_2_ = auVar335._0_2_;
              auVar400 = vpsllw_avx2(auVar335,ZEXT416((uint)upsample_left));
              auVar325 = vpackusdw_avx(auVar397,auVar329);
              auVar400 = vpsrlw_avx2(auVar400,1);
              auVar400 = vpand_avx2(auVar400,auVar159);
              auVar327 = auVar400._0_16_;
            }
            auVar329 = vpsllw_avx(auVar291,5);
            auVar329 = vpaddw_avx(auVar329,auVar99);
            auVar291 = vpsubw_avx(auVar325,auVar291);
            auVar291 = vpmullw_avx(auVar327,auVar291);
            auVar291 = vpaddw_avx(auVar329,auVar291);
            auVar325 = vpsrlw_avx(auVar291,5);
            auVar291 = vpcmpgtw_avx(auVar73,auVar179);
            auVar291 = vpblendvb_avx(auVar50,auVar325,auVar291);
            *(undefined1 (*) [16])((long)local_2060 + lVar30) = auVar291;
            uVar43 = (ulong)(uint)((int)uVar43 + dy);
          }
        }
        else {
          auVar82._4_4_ = iVar28;
          auVar82._0_4_ = iVar28;
          auVar82._8_4_ = iVar28;
          auVar82._12_4_ = iVar28;
          auVar82._16_4_ = iVar28;
          auVar82._20_4_ = iVar28;
          auVar82._24_4_ = iVar28;
          auVar82._28_4_ = iVar28;
          lVar30 = 0;
          auVar291 = vpmovsxbd_avx(ZEXT416(0x3020104));
          auVar111._8_4_ = 0x10;
          auVar111._0_8_ = 0x1000000010;
          auVar111._12_4_ = 0x10;
          auVar111._16_4_ = 0x10;
          auVar111._20_4_ = 0x10;
          auVar111._24_4_ = 0x10;
          auVar111._28_4_ = 0x10;
          auVar325 = vpmovsxbd_avx(ZEXT416(0x6040208));
          auVar182._8_4_ = 0x1f;
          auVar182._0_8_ = 0x1f0000001f;
          auVar182._12_4_ = 0x1f;
          auVar182._16_4_ = 0x1f;
          auVar182._20_4_ = 0x1f;
          auVar182._24_4_ = 0x1f;
          auVar182._28_4_ = 0x1f;
          for (; lVar30 != 0x80; lVar30 = lVar30 + 0x10) {
            iVar40 = (int)uVar43;
            iVar39 = iVar40 >> (6 - bVar26 & 0x1f);
            if (iVar28 <= iVar39) goto LAB_002f9554;
            auVar217 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + iVar39));
            if (upsample_left == 0) {
              auVar400 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)iVar39 + 1));
              auVar328._4_4_ = iVar39;
              auVar328._0_4_ = iVar39;
              auVar328._8_4_ = iVar39;
              auVar328._12_4_ = iVar39;
              iVar1 = iVar39 + 5;
              iVar2 = iVar39 + 6;
              iVar39 = iVar39 + 7;
              auVar179 = vpaddd_avx(auVar328,auVar291);
              auVar160 = vpermq_avx2(ZEXT1632(auVar179),0xc4);
              auVar160 = vpblendd_avx2(auVar160,ZEXT1632(auVar328),1);
              auVar350._4_4_ = iVar1;
              auVar350._0_4_ = iVar1;
              auVar350._8_4_ = iVar1;
              auVar350._12_4_ = iVar1;
              auVar350._16_4_ = iVar1;
              auVar350._20_4_ = iVar1;
              auVar350._24_4_ = iVar1;
              auVar350._28_4_ = iVar1;
              auVar160 = vpblendd_avx2(auVar160,auVar350,0x20);
              auVar351._4_4_ = iVar2;
              auVar351._0_4_ = iVar2;
              auVar351._8_4_ = iVar2;
              auVar351._12_4_ = iVar2;
              auVar351._16_4_ = iVar2;
              auVar351._20_4_ = iVar2;
              auVar351._24_4_ = iVar2;
              auVar351._28_4_ = iVar2;
              auVar160 = vpblendd_avx2(auVar160,auVar351,0x40);
              auVar352._4_4_ = iVar39;
              auVar352._0_4_ = iVar39;
              auVar352._8_4_ = iVar39;
              auVar352._12_4_ = iVar39;
              auVar352._16_4_ = iVar39;
              auVar352._20_4_ = iVar39;
              auVar352._24_4_ = iVar39;
              auVar352._28_4_ = iVar39;
              auVar160 = vpblendd_avx2(auVar160,auVar352,0x80);
              uVar38 = (uint)(uVar43 >> 1);
              uVar34 = uVar38 & 0x1f;
              auVar353._0_8_ = CONCAT44(uVar38,uVar38) & 0x1f0000001f;
              auVar353._8_4_ = uVar34;
              auVar353._12_4_ = uVar34;
              auVar353._16_4_ = uVar34;
              auVar353._20_4_ = uVar34;
              auVar353._24_4_ = uVar34;
              auVar353._28_4_ = uVar34;
            }
            else {
              auVar400 = vpshufd_avx2(auVar217,0xd8);
              auVar135 = vpermq_avx2(auVar400,0xd8);
              auVar400 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)iVar39 + 8));
              auVar400 = vpshufd_avx2(auVar400,0xd8);
              auVar139 = vpermq_avx2(auVar400,0xd8);
              auVar195._4_4_ = iVar39;
              auVar195._0_4_ = iVar39;
              auVar195._8_4_ = iVar39;
              auVar195._12_4_ = iVar39;
              iVar1 = iVar39 + 10;
              iVar2 = iVar39 + 0xc;
              iVar39 = iVar39 + 0xe;
              auVar179 = vpaddd_avx(auVar195,auVar325);
              auVar400 = vpermq_avx2(ZEXT1632(auVar179),0xc4);
              auVar400 = vpblendd_avx2(auVar400,ZEXT1632(auVar195),1);
              auVar336._4_4_ = iVar1;
              auVar336._0_4_ = iVar1;
              auVar336._8_4_ = iVar1;
              auVar336._12_4_ = iVar1;
              auVar336._16_4_ = iVar1;
              auVar336._20_4_ = iVar1;
              auVar336._24_4_ = iVar1;
              auVar336._28_4_ = iVar1;
              auVar400 = vpblendd_avx2(auVar400,auVar336,0x20);
              auVar337._4_4_ = iVar2;
              auVar337._0_4_ = iVar2;
              auVar337._8_4_ = iVar2;
              auVar337._12_4_ = iVar2;
              auVar337._16_4_ = iVar2;
              auVar337._20_4_ = iVar2;
              auVar337._24_4_ = iVar2;
              auVar337._28_4_ = iVar2;
              auVar400 = vpblendd_avx2(auVar400,auVar337,0x40);
              auVar338._4_4_ = iVar39;
              auVar338._0_4_ = iVar39;
              auVar338._8_4_ = iVar39;
              auVar338._12_4_ = iVar39;
              auVar338._16_4_ = iVar39;
              auVar338._20_4_ = iVar39;
              auVar338._24_4_ = iVar39;
              auVar338._28_4_ = iVar39;
              auVar160 = vpblendd_avx2(auVar400,auVar338,0x80);
              auVar216._4_4_ = iVar40;
              auVar216._0_4_ = iVar40;
              auVar216._8_4_ = iVar40;
              auVar216._12_4_ = iVar40;
              auVar216._16_4_ = iVar40;
              auVar216._20_4_ = iVar40;
              auVar216._24_4_ = iVar40;
              auVar216._28_4_ = iVar40;
              auVar400 = vpslld_avx2(auVar216,ZEXT416((uint)upsample_left));
              auVar217._0_16_ = ZEXT116(0) * auVar139._0_16_ + ZEXT116(1) * auVar135._0_16_;
              auVar217._16_16_ = ZEXT116(0) * auVar135._16_16_ + ZEXT116(1) * auVar139._0_16_;
              auVar400 = vpsrld_avx2(auVar400,1);
              auVar353 = vpand_avx2(auVar400,auVar182);
              auVar400 = vperm2i128_avx2(auVar135,auVar139,0x31);
            }
            auVar160 = vpcmpgtd_avx2(auVar82,auVar160);
            auVar400 = vpsubd_avx2(auVar400,auVar217);
            auVar135 = vpmulld_avx2(auVar400,auVar353);
            auVar400 = vpslld_avx2(auVar217,5);
            auVar400 = vpaddd_avx2(auVar400,auVar111);
            auVar400 = vpaddd_avx2(auVar135,auVar400);
            auVar400 = vpsrld_avx2(auVar400,5);
            auVar329 = vpackusdw_avx(auVar400._0_16_,auVar400._16_16_);
            auVar179 = vpackssdw_avx(auVar160._0_16_,auVar160._16_16_);
            auVar400 = vpblendvb_avx2(auVar60,ZEXT1632(auVar329),ZEXT1632(auVar179));
            *(undefined1 (*) [16])((long)local_2060 + lVar30) = auVar400._0_16_;
            uVar43 = (ulong)(uint)(iVar40 + dy);
          }
        }
        goto LAB_002f955d;
      }
      if (bw == 0x10) {
        uVar3 = left[0x1f];
        auVar52._2_2_ = uVar3;
        auVar52._0_2_ = uVar3;
        auVar52._4_2_ = uVar3;
        auVar52._6_2_ = uVar3;
        auVar52._8_2_ = uVar3;
        auVar52._10_2_ = uVar3;
        auVar52._12_2_ = uVar3;
        auVar52._14_2_ = uVar3;
        auVar62._16_2_ = uVar3;
        auVar62._0_16_ = auVar52;
        auVar62._18_2_ = uVar3;
        auVar62._20_2_ = uVar3;
        auVar62._22_2_ = uVar3;
        auVar62._24_2_ = uVar3;
        auVar62._26_2_ = uVar3;
        auVar62._28_2_ = uVar3;
        auVar62._30_2_ = uVar3;
        lVar30 = 0;
        if (bd < 0xc) {
          auVar81._8_2_ = 0x10;
          auVar81._0_8_ = 0x10001000100010;
          auVar81._10_2_ = 0x10;
          auVar81._12_2_ = 0x10;
          auVar81._14_2_ = 0x10;
          auVar81._16_2_ = 0x10;
          auVar81._18_2_ = 0x10;
          auVar81._20_2_ = 0x10;
          auVar81._22_2_ = 0x10;
          auVar81._24_2_ = 0x10;
          auVar81._26_2_ = 0x10;
          auVar81._28_2_ = 0x10;
          auVar81._30_2_ = 0x10;
          auVar291 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
          auVar110._8_2_ = 0x1e;
          auVar110._0_8_ = 0x1e001e001e001e;
          auVar110._10_2_ = 0x1e;
          auVar110._12_2_ = 0x1e;
          auVar110._14_2_ = 0x1e;
          auVar110._16_2_ = 0x1e;
          auVar110._18_2_ = 0x1e;
          auVar110._20_2_ = 0x1e;
          auVar110._22_2_ = 0x1e;
          auVar110._24_2_ = 0x1e;
          auVar110._26_2_ = 0x1e;
          auVar110._28_2_ = 0x1e;
          auVar110._30_2_ = 0x1e;
          for (; lVar30 != 0x200; lVar30 = lVar30 + 0x20) {
            uVar38 = (int)uVar43 >> 6;
            if (0x1e < (int)uVar38) goto LAB_002f935e;
            uVar6 = (ushort)(uVar43 >> 1);
            uVar387 = uVar6 & 0x1f;
            auVar129._0_8_ =
                 CONCAT26(uVar6,CONCAT24(uVar6,CONCAT22(uVar6,uVar6))) & 0x1f001f001f001f;
            auVar129._8_2_ = uVar387;
            auVar129._10_2_ = uVar387;
            auVar129._12_2_ = uVar387;
            auVar129._14_2_ = uVar387;
            auVar129._16_2_ = uVar387;
            auVar129._18_2_ = uVar387;
            auVar129._20_2_ = uVar387;
            auVar129._22_2_ = uVar387;
            auVar129._24_2_ = uVar387;
            auVar129._26_2_ = uVar387;
            auVar129._28_2_ = uVar387;
            auVar129._30_2_ = uVar387;
            auVar400 = vpsubw_avx2(*(undefined1 (*) [32])(left + (long)(int)uVar38 + 1),
                                   *(undefined1 (*) [32])(left + (int)uVar38));
            auVar160 = vpmullw_avx2(auVar400,auVar129);
            auVar400 = vpsllw_avx2(*(undefined1 (*) [32])(left + (int)uVar38),5);
            auVar400 = vpaddw_avx2(auVar400,auVar81);
            auVar400 = vpaddw_avx2(auVar160,auVar400);
            auVar160 = vpsrlw_avx2(auVar400,5);
            auVar149._0_2_ = (undefined2)uVar38;
            auVar149._2_2_ = auVar149._0_2_;
            auVar149._4_2_ = auVar149._0_2_;
            auVar149._6_2_ = auVar149._0_2_;
            auVar149._8_2_ = auVar149._0_2_;
            auVar149._10_2_ = auVar149._0_2_;
            auVar149._12_2_ = auVar149._0_2_;
            auVar149._14_2_ = auVar149._0_2_;
            auVar325 = vpaddw_avx(auVar149,auVar291);
            auVar179 = vpslldq_avx(auVar325,2);
            auVar179 = vpblendw_avx(auVar179,ZEXT416(uVar38),1);
            auVar325 = vpsrldq_avx(auVar325,0xe);
            auVar161._0_16_ = ZEXT116(0) * auVar325 + ZEXT116(1) * auVar52;
            auVar161._16_16_ = ZEXT116(0) * auVar62._16_16_ + ZEXT116(1) * auVar325;
            auVar209._0_2_ = (undefined2)(uVar38 + 9);
            auVar209._2_2_ = auVar209._0_2_;
            auVar209._4_2_ = auVar209._0_2_;
            auVar209._6_2_ = auVar209._0_2_;
            auVar209._8_2_ = auVar209._0_2_;
            auVar209._10_2_ = auVar209._0_2_;
            auVar209._12_2_ = auVar209._0_2_;
            auVar209._14_2_ = auVar209._0_2_;
            auVar209._16_2_ = auVar209._0_2_;
            auVar209._18_2_ = auVar209._0_2_;
            auVar209._20_2_ = auVar209._0_2_;
            auVar209._22_2_ = auVar209._0_2_;
            auVar209._24_2_ = auVar209._0_2_;
            auVar209._26_2_ = auVar209._0_2_;
            auVar209._28_2_ = auVar209._0_2_;
            auVar209._30_2_ = auVar209._0_2_;
            auVar400 = vpblendw_avx2(auVar161,auVar209,2);
            auVar210._0_2_ = (undefined2)(uVar38 + 10);
            auVar210._2_2_ = auVar210._0_2_;
            auVar210._4_2_ = auVar210._0_2_;
            auVar210._6_2_ = auVar210._0_2_;
            auVar210._8_2_ = auVar210._0_2_;
            auVar210._10_2_ = auVar210._0_2_;
            auVar210._12_2_ = auVar210._0_2_;
            auVar210._14_2_ = auVar210._0_2_;
            auVar210._16_2_ = auVar210._0_2_;
            auVar210._18_2_ = auVar210._0_2_;
            auVar210._20_2_ = auVar210._0_2_;
            auVar210._22_2_ = auVar210._0_2_;
            auVar210._24_2_ = auVar210._0_2_;
            auVar210._26_2_ = auVar210._0_2_;
            auVar210._28_2_ = auVar210._0_2_;
            auVar210._30_2_ = auVar210._0_2_;
            auVar400 = vpblendw_avx2(auVar400,auVar210,4);
            auVar211._0_2_ = (undefined2)(uVar38 + 0xb);
            auVar211._2_2_ = auVar211._0_2_;
            auVar211._4_2_ = auVar211._0_2_;
            auVar211._6_2_ = auVar211._0_2_;
            auVar211._8_2_ = auVar211._0_2_;
            auVar211._10_2_ = auVar211._0_2_;
            auVar211._12_2_ = auVar211._0_2_;
            auVar211._14_2_ = auVar211._0_2_;
            auVar211._16_2_ = auVar211._0_2_;
            auVar211._18_2_ = auVar211._0_2_;
            auVar211._20_2_ = auVar211._0_2_;
            auVar211._22_2_ = auVar211._0_2_;
            auVar211._24_2_ = auVar211._0_2_;
            auVar211._26_2_ = auVar211._0_2_;
            auVar211._28_2_ = auVar211._0_2_;
            auVar211._30_2_ = auVar211._0_2_;
            auVar400 = vpblendw_avx2(auVar400,auVar211,8);
            auVar212._0_2_ = (undefined2)(uVar38 + 0xc);
            auVar212._2_2_ = auVar212._0_2_;
            auVar212._4_2_ = auVar212._0_2_;
            auVar212._6_2_ = auVar212._0_2_;
            auVar212._8_2_ = auVar212._0_2_;
            auVar212._10_2_ = auVar212._0_2_;
            auVar212._12_2_ = auVar212._0_2_;
            auVar212._14_2_ = auVar212._0_2_;
            auVar212._16_2_ = auVar212._0_2_;
            auVar212._18_2_ = auVar212._0_2_;
            auVar212._20_2_ = auVar212._0_2_;
            auVar212._22_2_ = auVar212._0_2_;
            auVar212._24_2_ = auVar212._0_2_;
            auVar212._26_2_ = auVar212._0_2_;
            auVar212._28_2_ = auVar212._0_2_;
            auVar212._30_2_ = auVar212._0_2_;
            auVar400 = vpblendw_avx2(auVar400,auVar212,0x10);
            auVar213._0_2_ = (undefined2)(uVar38 + 0xd);
            auVar213._2_2_ = auVar213._0_2_;
            auVar213._4_2_ = auVar213._0_2_;
            auVar213._6_2_ = auVar213._0_2_;
            auVar213._8_2_ = auVar213._0_2_;
            auVar213._10_2_ = auVar213._0_2_;
            auVar213._12_2_ = auVar213._0_2_;
            auVar213._14_2_ = auVar213._0_2_;
            auVar213._16_2_ = auVar213._0_2_;
            auVar213._18_2_ = auVar213._0_2_;
            auVar213._20_2_ = auVar213._0_2_;
            auVar213._22_2_ = auVar213._0_2_;
            auVar213._24_2_ = auVar213._0_2_;
            auVar213._26_2_ = auVar213._0_2_;
            auVar213._28_2_ = auVar213._0_2_;
            auVar213._30_2_ = auVar213._0_2_;
            auVar400 = vpblendw_avx2(auVar400,auVar213,0x20);
            auVar214._0_2_ = (undefined2)(uVar38 + 0xe);
            auVar214._2_2_ = auVar214._0_2_;
            auVar214._4_2_ = auVar214._0_2_;
            auVar214._6_2_ = auVar214._0_2_;
            auVar214._8_2_ = auVar214._0_2_;
            auVar214._10_2_ = auVar214._0_2_;
            auVar214._12_2_ = auVar214._0_2_;
            auVar214._14_2_ = auVar214._0_2_;
            auVar214._16_2_ = auVar214._0_2_;
            auVar214._18_2_ = auVar214._0_2_;
            auVar214._20_2_ = auVar214._0_2_;
            auVar214._22_2_ = auVar214._0_2_;
            auVar214._24_2_ = auVar214._0_2_;
            auVar214._26_2_ = auVar214._0_2_;
            auVar214._28_2_ = auVar214._0_2_;
            auVar214._30_2_ = auVar214._0_2_;
            auVar400 = vpblendw_avx2(auVar400,auVar214,0x40);
            auVar215._0_2_ = (undefined2)(uVar38 + 0xf);
            auVar215._2_2_ = auVar215._0_2_;
            auVar215._4_2_ = auVar215._0_2_;
            auVar215._6_2_ = auVar215._0_2_;
            auVar215._8_2_ = auVar215._0_2_;
            auVar215._10_2_ = auVar215._0_2_;
            auVar215._12_2_ = auVar215._0_2_;
            auVar215._14_2_ = auVar215._0_2_;
            auVar215._16_2_ = auVar215._0_2_;
            auVar215._18_2_ = auVar215._0_2_;
            auVar215._20_2_ = auVar215._0_2_;
            auVar215._22_2_ = auVar215._0_2_;
            auVar215._24_2_ = auVar215._0_2_;
            auVar215._26_2_ = auVar215._0_2_;
            auVar215._28_2_ = auVar215._0_2_;
            auVar215._30_2_ = auVar215._0_2_;
            auVar400 = vpblendw_avx2(auVar400,auVar215,0x80);
            auVar400 = vpblendd_avx2(ZEXT1632(auVar179),auVar400,0xf0);
            auVar400 = vpcmpgtw_avx2(auVar400,auVar110);
            auVar400 = vpblendvb_avx2(auVar160,auVar62,auVar400);
            *(undefined1 (*) [32])((long)local_2060 + lVar30) = auVar400;
            uVar43 = (ulong)(uint)((int)uVar43 + dy);
          }
        }
        else {
          auVar84._8_4_ = 0x10;
          auVar84._0_8_ = 0x1000000010;
          auVar84._12_4_ = 0x10;
          auVar84._16_4_ = 0x10;
          auVar84._20_4_ = 0x10;
          auVar84._24_4_ = 0x10;
          auVar84._28_4_ = 0x10;
          auVar291 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
          auVar113._8_2_ = 0x1e;
          auVar113._0_8_ = 0x1e001e001e001e;
          auVar113._10_2_ = 0x1e;
          auVar113._12_2_ = 0x1e;
          auVar113._14_2_ = 0x1e;
          auVar113._16_2_ = 0x1e;
          auVar113._18_2_ = 0x1e;
          auVar113._20_2_ = 0x1e;
          auVar113._22_2_ = 0x1e;
          auVar113._24_2_ = 0x1e;
          auVar113._26_2_ = 0x1e;
          auVar113._28_2_ = 0x1e;
          auVar113._30_2_ = 0x1e;
          for (; lVar30 != 0x200; lVar30 = lVar30 + 0x20) {
            uVar38 = (int)uVar43 >> 6;
            if (0x1e < (int)uVar38) goto LAB_002f9a68;
            uVar34 = (uint)(uVar43 >> 1);
            uVar32 = uVar34 & 0x1f;
            auVar130._0_8_ = CONCAT44(uVar34,uVar34) & 0x1f0000001f;
            auVar130._8_4_ = uVar32;
            auVar130._12_4_ = uVar32;
            auVar130._16_4_ = uVar32;
            auVar130._20_4_ = uVar32;
            auVar130._24_4_ = uVar32;
            auVar130._28_4_ = uVar32;
            auVar325 = auVar52;
            if (uVar38 - 0x20 < 0xfffffff7) {
              auVar400 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar38 + 8));
              auVar160 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar38 + 9));
              auVar160 = vpsubd_avx2(auVar160,auVar400);
              auVar400 = vpslld_avx2(auVar400,5);
              auVar160 = vpmulld_avx2(auVar160,auVar130);
              auVar400 = vpaddd_avx2(auVar400,auVar84);
              auVar400 = vpaddd_avx2(auVar160,auVar400);
              auVar400 = vpsrld_avx2(auVar400,5);
              auVar184._0_16_ = ZEXT116(0) * auVar52 + ZEXT116(1) * auVar400._16_16_;
              auVar184._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar52;
              auVar400 = vpackusdw_avx2(auVar400,auVar184);
              auVar325 = auVar400._0_16_;
            }
            auVar400 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (int)uVar38));
            auVar160 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar38 + 1));
            auVar160 = vpsubd_avx2(auVar160,auVar400);
            auVar400 = vpslld_avx2(auVar400,5);
            auVar160 = vpmulld_avx2(auVar160,auVar130);
            auVar400 = vpaddd_avx2(auVar400,auVar84);
            auVar400 = vpaddd_avx2(auVar160,auVar400);
            auVar400 = vpsrld_avx2(auVar400,5);
            auVar400 = vpackusdw_avx2(auVar400,ZEXT1632(auVar400._16_16_));
            auVar131._0_16_ = ZEXT116(0) * auVar325 + ZEXT116(1) * auVar400._0_16_;
            auVar131._16_16_ = ZEXT116(0) * auVar400._16_16_ + ZEXT116(1) * auVar325;
            auVar150._0_2_ = (undefined2)uVar38;
            auVar150._2_2_ = auVar150._0_2_;
            auVar150._4_2_ = auVar150._0_2_;
            auVar150._6_2_ = auVar150._0_2_;
            auVar150._8_2_ = auVar150._0_2_;
            auVar150._10_2_ = auVar150._0_2_;
            auVar150._12_2_ = auVar150._0_2_;
            auVar150._14_2_ = auVar150._0_2_;
            auVar325 = vpaddw_avx(auVar150,auVar291);
            auVar179 = vpslldq_avx(auVar325,2);
            auVar179 = vpblendw_avx(auVar179,ZEXT416(uVar38),1);
            auVar325 = vpsrldq_avx(auVar325,0xe);
            auVar164._0_16_ = ZEXT116(0) * auVar325 + ZEXT116(1) * auVar52;
            auVar164._16_16_ = ZEXT116(0) * auVar62._16_16_ + ZEXT116(1) * auVar325;
            auVar221._0_2_ = (undefined2)(uVar38 + 9);
            auVar221._2_2_ = auVar221._0_2_;
            auVar221._4_2_ = auVar221._0_2_;
            auVar221._6_2_ = auVar221._0_2_;
            auVar221._8_2_ = auVar221._0_2_;
            auVar221._10_2_ = auVar221._0_2_;
            auVar221._12_2_ = auVar221._0_2_;
            auVar221._14_2_ = auVar221._0_2_;
            auVar221._16_2_ = auVar221._0_2_;
            auVar221._18_2_ = auVar221._0_2_;
            auVar221._20_2_ = auVar221._0_2_;
            auVar221._22_2_ = auVar221._0_2_;
            auVar221._24_2_ = auVar221._0_2_;
            auVar221._26_2_ = auVar221._0_2_;
            auVar221._28_2_ = auVar221._0_2_;
            auVar221._30_2_ = auVar221._0_2_;
            auVar400 = vpblendw_avx2(auVar164,auVar221,2);
            auVar222._0_2_ = (undefined2)(uVar38 + 10);
            auVar222._2_2_ = auVar222._0_2_;
            auVar222._4_2_ = auVar222._0_2_;
            auVar222._6_2_ = auVar222._0_2_;
            auVar222._8_2_ = auVar222._0_2_;
            auVar222._10_2_ = auVar222._0_2_;
            auVar222._12_2_ = auVar222._0_2_;
            auVar222._14_2_ = auVar222._0_2_;
            auVar222._16_2_ = auVar222._0_2_;
            auVar222._18_2_ = auVar222._0_2_;
            auVar222._20_2_ = auVar222._0_2_;
            auVar222._22_2_ = auVar222._0_2_;
            auVar222._24_2_ = auVar222._0_2_;
            auVar222._26_2_ = auVar222._0_2_;
            auVar222._28_2_ = auVar222._0_2_;
            auVar222._30_2_ = auVar222._0_2_;
            auVar400 = vpblendw_avx2(auVar400,auVar222,4);
            auVar223._0_2_ = (undefined2)(uVar38 + 0xb);
            auVar223._2_2_ = auVar223._0_2_;
            auVar223._4_2_ = auVar223._0_2_;
            auVar223._6_2_ = auVar223._0_2_;
            auVar223._8_2_ = auVar223._0_2_;
            auVar223._10_2_ = auVar223._0_2_;
            auVar223._12_2_ = auVar223._0_2_;
            auVar223._14_2_ = auVar223._0_2_;
            auVar223._16_2_ = auVar223._0_2_;
            auVar223._18_2_ = auVar223._0_2_;
            auVar223._20_2_ = auVar223._0_2_;
            auVar223._22_2_ = auVar223._0_2_;
            auVar223._24_2_ = auVar223._0_2_;
            auVar223._26_2_ = auVar223._0_2_;
            auVar223._28_2_ = auVar223._0_2_;
            auVar223._30_2_ = auVar223._0_2_;
            auVar400 = vpblendw_avx2(auVar400,auVar223,8);
            auVar224._0_2_ = (undefined2)(uVar38 + 0xc);
            auVar224._2_2_ = auVar224._0_2_;
            auVar224._4_2_ = auVar224._0_2_;
            auVar224._6_2_ = auVar224._0_2_;
            auVar224._8_2_ = auVar224._0_2_;
            auVar224._10_2_ = auVar224._0_2_;
            auVar224._12_2_ = auVar224._0_2_;
            auVar224._14_2_ = auVar224._0_2_;
            auVar224._16_2_ = auVar224._0_2_;
            auVar224._18_2_ = auVar224._0_2_;
            auVar224._20_2_ = auVar224._0_2_;
            auVar224._22_2_ = auVar224._0_2_;
            auVar224._24_2_ = auVar224._0_2_;
            auVar224._26_2_ = auVar224._0_2_;
            auVar224._28_2_ = auVar224._0_2_;
            auVar224._30_2_ = auVar224._0_2_;
            auVar400 = vpblendw_avx2(auVar400,auVar224,0x10);
            auVar225._0_2_ = (undefined2)(uVar38 + 0xd);
            auVar225._2_2_ = auVar225._0_2_;
            auVar225._4_2_ = auVar225._0_2_;
            auVar225._6_2_ = auVar225._0_2_;
            auVar225._8_2_ = auVar225._0_2_;
            auVar225._10_2_ = auVar225._0_2_;
            auVar225._12_2_ = auVar225._0_2_;
            auVar225._14_2_ = auVar225._0_2_;
            auVar225._16_2_ = auVar225._0_2_;
            auVar225._18_2_ = auVar225._0_2_;
            auVar225._20_2_ = auVar225._0_2_;
            auVar225._22_2_ = auVar225._0_2_;
            auVar225._24_2_ = auVar225._0_2_;
            auVar225._26_2_ = auVar225._0_2_;
            auVar225._28_2_ = auVar225._0_2_;
            auVar225._30_2_ = auVar225._0_2_;
            auVar400 = vpblendw_avx2(auVar400,auVar225,0x20);
            auVar226._0_2_ = (undefined2)(uVar38 + 0xe);
            auVar226._2_2_ = auVar226._0_2_;
            auVar226._4_2_ = auVar226._0_2_;
            auVar226._6_2_ = auVar226._0_2_;
            auVar226._8_2_ = auVar226._0_2_;
            auVar226._10_2_ = auVar226._0_2_;
            auVar226._12_2_ = auVar226._0_2_;
            auVar226._14_2_ = auVar226._0_2_;
            auVar226._16_2_ = auVar226._0_2_;
            auVar226._18_2_ = auVar226._0_2_;
            auVar226._20_2_ = auVar226._0_2_;
            auVar226._22_2_ = auVar226._0_2_;
            auVar226._24_2_ = auVar226._0_2_;
            auVar226._26_2_ = auVar226._0_2_;
            auVar226._28_2_ = auVar226._0_2_;
            auVar226._30_2_ = auVar226._0_2_;
            auVar400 = vpblendw_avx2(auVar400,auVar226,0x40);
            auVar227._0_2_ = (undefined2)(uVar38 + 0xf);
            auVar227._2_2_ = auVar227._0_2_;
            auVar227._4_2_ = auVar227._0_2_;
            auVar227._6_2_ = auVar227._0_2_;
            auVar227._8_2_ = auVar227._0_2_;
            auVar227._10_2_ = auVar227._0_2_;
            auVar227._12_2_ = auVar227._0_2_;
            auVar227._14_2_ = auVar227._0_2_;
            auVar227._16_2_ = auVar227._0_2_;
            auVar227._18_2_ = auVar227._0_2_;
            auVar227._20_2_ = auVar227._0_2_;
            auVar227._22_2_ = auVar227._0_2_;
            auVar227._24_2_ = auVar227._0_2_;
            auVar227._26_2_ = auVar227._0_2_;
            auVar227._28_2_ = auVar227._0_2_;
            auVar227._30_2_ = auVar227._0_2_;
            auVar400 = vpblendw_avx2(auVar400,auVar227,0x80);
            auVar400 = vpblendd_avx2(ZEXT1632(auVar179),auVar400,0xf0);
            auVar400 = vpcmpgtw_avx2(auVar400,auVar113);
            auVar400 = vpblendvb_avx2(auVar131,auVar62,auVar400);
            *(undefined1 (*) [32])((long)local_2060 + lVar30) = auVar400;
            uVar43 = (ulong)(uint)((int)uVar43 + dy);
          }
        }
        goto LAB_002f9a70;
      }
      if (bw == 0x20) {
        uVar3 = left[0x3f];
        auVar51._2_2_ = uVar3;
        auVar51._0_2_ = uVar3;
        auVar51._4_2_ = uVar3;
        auVar51._6_2_ = uVar3;
        auVar51._8_2_ = uVar3;
        auVar51._10_2_ = uVar3;
        auVar51._12_2_ = uVar3;
        auVar51._14_2_ = uVar3;
        auVar61._16_2_ = uVar3;
        auVar61._0_16_ = auVar51;
        auVar61._18_2_ = uVar3;
        auVar61._20_2_ = uVar3;
        auVar61._22_2_ = uVar3;
        auVar61._24_2_ = uVar3;
        auVar61._26_2_ = uVar3;
        auVar61._28_2_ = uVar3;
        auVar61._30_2_ = uVar3;
        lVar30 = -0x400;
        uVar27 = 0;
        if (bd < 0xc) {
          auVar80._8_2_ = 0x10;
          auVar80._0_8_ = 0x10001000100010;
          auVar80._10_2_ = 0x10;
          auVar80._12_2_ = 0x10;
          auVar80._14_2_ = 0x10;
          auVar80._16_2_ = 0x10;
          auVar80._18_2_ = 0x10;
          auVar80._20_2_ = 0x10;
          auVar80._22_2_ = 0x10;
          auVar80._24_2_ = 0x10;
          auVar80._26_2_ = 0x10;
          auVar80._28_2_ = 0x10;
          auVar80._30_2_ = 0x10;
          auVar291 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
          auVar109._8_2_ = 0x3e;
          auVar109._0_8_ = 0x3e003e003e003e;
          auVar109._10_2_ = 0x3e;
          auVar109._12_2_ = 0x3e;
          auVar109._14_2_ = 0x3e;
          auVar109._16_2_ = 0x3e;
          auVar109._18_2_ = 0x3e;
          auVar109._20_2_ = 0x3e;
          auVar109._22_2_ = 0x3e;
          auVar109._24_2_ = 0x3e;
          auVar109._26_2_ = 0x3e;
          auVar109._28_2_ = 0x3e;
          auVar109._30_2_ = 0x3e;
          do {
            if (uVar27 == 0x20) break;
            iVar28 = (int)uVar43 >> 6;
            lVar33 = lVar30;
            if (iVar28 < 0x3f) {
              uVar6 = (ushort)(uVar43 >> 1);
              uVar387 = uVar6 & 0x1f;
              auVar128._0_8_ =
                   CONCAT26(uVar6,CONCAT24(uVar6,CONCAT22(uVar6,uVar6))) & 0x1f001f001f001f;
              auVar128._8_2_ = uVar387;
              auVar128._10_2_ = uVar387;
              auVar128._12_2_ = uVar387;
              auVar128._14_2_ = uVar387;
              auVar128._16_2_ = uVar387;
              auVar128._18_2_ = uVar387;
              auVar128._20_2_ = uVar387;
              auVar128._22_2_ = uVar387;
              auVar128._24_2_ = uVar387;
              auVar128._26_2_ = uVar387;
              auVar128._28_2_ = uVar387;
              auVar128._30_2_ = uVar387;
              lVar33 = (long)iVar28;
              for (uVar41 = 0; uVar41 < 0x20; uVar41 = uVar41 + 0x10) {
                auVar400 = auVar61;
                if ((long)(lVar33 + uVar41) < 0x3f) {
                  auVar400 = vpsubw_avx2(*(undefined1 (*) [32])(left + lVar33 + uVar41 + 1),
                                         *(undefined1 (*) [32])(left + lVar33 + uVar41));
                  auVar160 = vpmullw_avx2(auVar400,auVar128);
                  auVar400 = vpsllw_avx2(*(undefined1 (*) [32])(left + lVar33 + uVar41),5);
                  auVar400 = vpaddw_avx2(auVar400,auVar80);
                  auVar400 = vpaddw_avx2(auVar160,auVar400);
                  auVar160 = vpsrlw_avx2(auVar400,5);
                  iVar40 = (int)uVar41;
                  auVar178._0_2_ = (undefined2)(iVar28 + iVar40);
                  auVar178._2_2_ = auVar178._0_2_;
                  auVar178._4_2_ = auVar178._0_2_;
                  auVar178._6_2_ = auVar178._0_2_;
                  auVar178._8_2_ = auVar178._0_2_;
                  auVar178._10_2_ = auVar178._0_2_;
                  auVar178._12_2_ = auVar178._0_2_;
                  auVar178._14_2_ = auVar178._0_2_;
                  auVar325 = vpaddw_avx(auVar178,auVar291);
                  auVar179 = vpslldq_avx(auVar325,2);
                  auVar179 = vpblendw_avx(auVar179,ZEXT416((uint)(iVar28 + iVar40)),1);
                  auVar325 = vpsrldq_avx(auVar325,0xe);
                  auVar208._0_16_ = ZEXT116(0) * auVar325 + ZEXT116(1) * auVar51;
                  auVar208._16_16_ = ZEXT116(0) * auVar61._16_16_ + ZEXT116(1) * auVar325;
                  auVar298._0_2_ = (undefined2)(iVar28 + 9 + iVar40);
                  auVar298._2_2_ = auVar298._0_2_;
                  auVar298._4_2_ = auVar298._0_2_;
                  auVar298._6_2_ = auVar298._0_2_;
                  auVar298._8_2_ = auVar298._0_2_;
                  auVar298._10_2_ = auVar298._0_2_;
                  auVar298._12_2_ = auVar298._0_2_;
                  auVar298._14_2_ = auVar298._0_2_;
                  auVar298._16_2_ = auVar298._0_2_;
                  auVar298._18_2_ = auVar298._0_2_;
                  auVar298._20_2_ = auVar298._0_2_;
                  auVar298._22_2_ = auVar298._0_2_;
                  auVar298._24_2_ = auVar298._0_2_;
                  auVar298._26_2_ = auVar298._0_2_;
                  auVar298._28_2_ = auVar298._0_2_;
                  auVar298._30_2_ = auVar298._0_2_;
                  auVar400 = vpblendw_avx2(auVar208,auVar298,2);
                  auVar299._0_2_ = (undefined2)(iVar28 + 10 + iVar40);
                  auVar299._2_2_ = auVar299._0_2_;
                  auVar299._4_2_ = auVar299._0_2_;
                  auVar299._6_2_ = auVar299._0_2_;
                  auVar299._8_2_ = auVar299._0_2_;
                  auVar299._10_2_ = auVar299._0_2_;
                  auVar299._12_2_ = auVar299._0_2_;
                  auVar299._14_2_ = auVar299._0_2_;
                  auVar299._16_2_ = auVar299._0_2_;
                  auVar299._18_2_ = auVar299._0_2_;
                  auVar299._20_2_ = auVar299._0_2_;
                  auVar299._22_2_ = auVar299._0_2_;
                  auVar299._24_2_ = auVar299._0_2_;
                  auVar299._26_2_ = auVar299._0_2_;
                  auVar299._28_2_ = auVar299._0_2_;
                  auVar299._30_2_ = auVar299._0_2_;
                  auVar400 = vpblendw_avx2(auVar400,auVar299,4);
                  auVar300._0_2_ = (undefined2)(iVar28 + 0xb + iVar40);
                  auVar300._2_2_ = auVar300._0_2_;
                  auVar300._4_2_ = auVar300._0_2_;
                  auVar300._6_2_ = auVar300._0_2_;
                  auVar300._8_2_ = auVar300._0_2_;
                  auVar300._10_2_ = auVar300._0_2_;
                  auVar300._12_2_ = auVar300._0_2_;
                  auVar300._14_2_ = auVar300._0_2_;
                  auVar300._16_2_ = auVar300._0_2_;
                  auVar300._18_2_ = auVar300._0_2_;
                  auVar300._20_2_ = auVar300._0_2_;
                  auVar300._22_2_ = auVar300._0_2_;
                  auVar300._24_2_ = auVar300._0_2_;
                  auVar300._26_2_ = auVar300._0_2_;
                  auVar300._28_2_ = auVar300._0_2_;
                  auVar300._30_2_ = auVar300._0_2_;
                  auVar400 = vpblendw_avx2(auVar400,auVar300,8);
                  auVar301._0_2_ = (undefined2)(iVar28 + 0xc + iVar40);
                  auVar301._2_2_ = auVar301._0_2_;
                  auVar301._4_2_ = auVar301._0_2_;
                  auVar301._6_2_ = auVar301._0_2_;
                  auVar301._8_2_ = auVar301._0_2_;
                  auVar301._10_2_ = auVar301._0_2_;
                  auVar301._12_2_ = auVar301._0_2_;
                  auVar301._14_2_ = auVar301._0_2_;
                  auVar301._16_2_ = auVar301._0_2_;
                  auVar301._18_2_ = auVar301._0_2_;
                  auVar301._20_2_ = auVar301._0_2_;
                  auVar301._22_2_ = auVar301._0_2_;
                  auVar301._24_2_ = auVar301._0_2_;
                  auVar301._26_2_ = auVar301._0_2_;
                  auVar301._28_2_ = auVar301._0_2_;
                  auVar301._30_2_ = auVar301._0_2_;
                  auVar400 = vpblendw_avx2(auVar400,auVar301,0x10);
                  auVar302._0_2_ = (undefined2)(iVar28 + 0xd + iVar40);
                  auVar302._2_2_ = auVar302._0_2_;
                  auVar302._4_2_ = auVar302._0_2_;
                  auVar302._6_2_ = auVar302._0_2_;
                  auVar302._8_2_ = auVar302._0_2_;
                  auVar302._10_2_ = auVar302._0_2_;
                  auVar302._12_2_ = auVar302._0_2_;
                  auVar302._14_2_ = auVar302._0_2_;
                  auVar302._16_2_ = auVar302._0_2_;
                  auVar302._18_2_ = auVar302._0_2_;
                  auVar302._20_2_ = auVar302._0_2_;
                  auVar302._22_2_ = auVar302._0_2_;
                  auVar302._24_2_ = auVar302._0_2_;
                  auVar302._26_2_ = auVar302._0_2_;
                  auVar302._28_2_ = auVar302._0_2_;
                  auVar302._30_2_ = auVar302._0_2_;
                  auVar400 = vpblendw_avx2(auVar400,auVar302,0x20);
                  auVar303._0_2_ = (undefined2)(iVar28 + 0xe + iVar40);
                  auVar303._2_2_ = auVar303._0_2_;
                  auVar303._4_2_ = auVar303._0_2_;
                  auVar303._6_2_ = auVar303._0_2_;
                  auVar303._8_2_ = auVar303._0_2_;
                  auVar303._10_2_ = auVar303._0_2_;
                  auVar303._12_2_ = auVar303._0_2_;
                  auVar303._14_2_ = auVar303._0_2_;
                  auVar303._16_2_ = auVar303._0_2_;
                  auVar303._18_2_ = auVar303._0_2_;
                  auVar303._20_2_ = auVar303._0_2_;
                  auVar303._22_2_ = auVar303._0_2_;
                  auVar303._24_2_ = auVar303._0_2_;
                  auVar303._26_2_ = auVar303._0_2_;
                  auVar303._28_2_ = auVar303._0_2_;
                  auVar303._30_2_ = auVar303._0_2_;
                  auVar400 = vpblendw_avx2(auVar400,auVar303,0x40);
                  auVar304._0_2_ = (undefined2)(iVar28 + 0xf + iVar40);
                  auVar304._2_2_ = auVar304._0_2_;
                  auVar304._4_2_ = auVar304._0_2_;
                  auVar304._6_2_ = auVar304._0_2_;
                  auVar304._8_2_ = auVar304._0_2_;
                  auVar304._10_2_ = auVar304._0_2_;
                  auVar304._12_2_ = auVar304._0_2_;
                  auVar304._14_2_ = auVar304._0_2_;
                  auVar304._16_2_ = auVar304._0_2_;
                  auVar304._18_2_ = auVar304._0_2_;
                  auVar304._20_2_ = auVar304._0_2_;
                  auVar304._22_2_ = auVar304._0_2_;
                  auVar304._24_2_ = auVar304._0_2_;
                  auVar304._26_2_ = auVar304._0_2_;
                  auVar304._28_2_ = auVar304._0_2_;
                  auVar304._30_2_ = auVar304._0_2_;
                  auVar400 = vpblendw_avx2(auVar400,auVar304,0x80);
                  auVar400 = vpblendd_avx2(ZEXT1632(auVar179),auVar400,0xf0);
                  auVar400 = vpcmpgtw_avx2(auVar400,auVar109);
                  auVar400 = vpblendvb_avx2(auVar160,auVar61,auVar400);
                }
                uVar35 = uVar27 | 0x20;
                if (uVar41 == 0) {
                  uVar35 = uVar27;
                }
                *(undefined1 (*) [32])(local_2060 + uVar35 * 4) = auVar400;
              }
              uVar43 = (ulong)(uint)((int)uVar43 + dy);
            }
            else {
              for (; lVar33 != 0; lVar33 = lVar33 + 0x20) {
                *(undefined1 (*) [32])((long)local_1c60 + lVar33) = auVar61;
                *(undefined1 (*) [32])(auStack_1860 + lVar33) = auVar61;
              }
            }
            uVar27 = uVar27 + 1;
            lVar30 = lVar30 + 0x20;
          } while (iVar28 < 0x3f);
        }
        else {
          auVar83._8_4_ = 0x10;
          auVar83._0_8_ = 0x1000000010;
          auVar83._12_4_ = 0x10;
          auVar83._16_4_ = 0x10;
          auVar83._20_4_ = 0x10;
          auVar83._24_4_ = 0x10;
          auVar83._28_4_ = 0x10;
          auVar291 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
          auVar112._8_2_ = 0x3e;
          auVar112._0_8_ = 0x3e003e003e003e;
          auVar112._10_2_ = 0x3e;
          auVar112._12_2_ = 0x3e;
          auVar112._14_2_ = 0x3e;
          auVar112._16_2_ = 0x3e;
          auVar112._18_2_ = 0x3e;
          auVar112._20_2_ = 0x3e;
          auVar112._22_2_ = 0x3e;
          auVar112._24_2_ = 0x3e;
          auVar112._26_2_ = 0x3e;
          auVar112._28_2_ = 0x3e;
          auVar112._30_2_ = 0x3e;
          auVar400 = vpmovsxbw_avx2(_DAT_0046f570);
          do {
            if (uVar27 == 0x20) break;
            uVar38 = (int)uVar43 >> 6;
            lVar33 = lVar30;
            if ((int)uVar38 < 0x3f) {
              uVar34 = (uint)(uVar43 >> 1);
              uVar32 = uVar34 & 0x1f801f;
              auVar162._0_8_ = CONCAT44(uVar34,uVar34) & 0x1f801f001f801f;
              auVar162._8_4_ = uVar32;
              auVar162._12_4_ = uVar32;
              auVar162._16_4_ = uVar32;
              auVar162._20_4_ = uVar32;
              auVar162._24_4_ = uVar32;
              auVar162._28_4_ = uVar32;
              auVar325 = auVar51;
              if (uVar38 - 0x40 < 0xfffffff7) {
                auVar160 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar38 + 8));
                auVar135 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar38 + 9));
                auVar135 = vpsubd_avx2(auVar135,auVar160);
                auVar160 = vpslld_avx2(auVar160,5);
                auVar135 = vpmulld_avx2(auVar135,auVar162);
                auVar160 = vpaddd_avx2(auVar160,auVar83);
                auVar160 = vpaddd_avx2(auVar135,auVar160);
                auVar160 = vpsrld_avx2(auVar160,5);
                auVar218._0_16_ = ZEXT116(0) * auVar51 + ZEXT116(1) * auVar160._16_16_;
                auVar218._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar51;
                auVar160 = vpackusdw_avx2(auVar160,auVar218);
                auVar325 = auVar160._0_16_;
              }
              auVar160 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (int)uVar38));
              auVar135 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar38 + 1));
              auVar135 = vpsubd_avx2(auVar135,auVar160);
              auVar160 = vpslld_avx2(auVar160,5);
              auVar135 = vpmulld_avx2(auVar135,auVar162);
              auVar160 = vpaddd_avx2(auVar160,auVar83);
              auVar160 = vpaddd_avx2(auVar135,auVar160);
              auVar160 = vpsrld_avx2(auVar160,5);
              auVar160 = vpackusdw_avx2(auVar160,ZEXT1632(auVar160._16_16_));
              auVar292._0_2_ = (undefined2)uVar38;
              auVar292._2_2_ = auVar292._0_2_;
              auVar292._4_2_ = auVar292._0_2_;
              auVar292._6_2_ = auVar292._0_2_;
              auVar292._8_2_ = auVar292._0_2_;
              auVar292._10_2_ = auVar292._0_2_;
              auVar292._12_2_ = auVar292._0_2_;
              auVar292._14_2_ = auVar292._0_2_;
              auVar179 = vpaddw_avx(auVar292,auVar291);
              auVar329 = vpslldq_avx(auVar179,2);
              auVar329 = vpblendw_avx(auVar329,ZEXT416(uVar38),1);
              auVar179 = vpsrldq_avx(auVar179,0xe);
              auVar305._0_16_ = ZEXT116(0) * auVar179 + ZEXT116(1) * auVar51;
              auVar305._16_16_ = ZEXT116(0) * auVar61._16_16_ + ZEXT116(1) * auVar179;
              auVar354._0_2_ = (undefined2)(uVar38 + 9);
              auVar354._2_2_ = auVar354._0_2_;
              auVar354._4_2_ = auVar354._0_2_;
              auVar354._6_2_ = auVar354._0_2_;
              auVar354._8_2_ = auVar354._0_2_;
              auVar354._10_2_ = auVar354._0_2_;
              auVar354._12_2_ = auVar354._0_2_;
              auVar354._14_2_ = auVar354._0_2_;
              auVar354._16_2_ = auVar354._0_2_;
              auVar354._18_2_ = auVar354._0_2_;
              auVar354._20_2_ = auVar354._0_2_;
              auVar354._22_2_ = auVar354._0_2_;
              auVar354._24_2_ = auVar354._0_2_;
              auVar354._26_2_ = auVar354._0_2_;
              auVar354._28_2_ = auVar354._0_2_;
              auVar354._30_2_ = auVar354._0_2_;
              auVar135 = vpblendw_avx2(auVar305,auVar354,2);
              auVar355._0_2_ = (undefined2)(uVar38 + 10);
              auVar355._2_2_ = auVar355._0_2_;
              auVar355._4_2_ = auVar355._0_2_;
              auVar355._6_2_ = auVar355._0_2_;
              auVar355._8_2_ = auVar355._0_2_;
              auVar355._10_2_ = auVar355._0_2_;
              auVar355._12_2_ = auVar355._0_2_;
              auVar355._14_2_ = auVar355._0_2_;
              auVar355._16_2_ = auVar355._0_2_;
              auVar355._18_2_ = auVar355._0_2_;
              auVar355._20_2_ = auVar355._0_2_;
              auVar355._22_2_ = auVar355._0_2_;
              auVar355._24_2_ = auVar355._0_2_;
              auVar355._26_2_ = auVar355._0_2_;
              auVar355._28_2_ = auVar355._0_2_;
              auVar355._30_2_ = auVar355._0_2_;
              auVar135 = vpblendw_avx2(auVar135,auVar355,4);
              auVar356._0_2_ = (undefined2)(uVar38 + 0xb);
              auVar356._2_2_ = auVar356._0_2_;
              auVar356._4_2_ = auVar356._0_2_;
              auVar356._6_2_ = auVar356._0_2_;
              auVar356._8_2_ = auVar356._0_2_;
              auVar356._10_2_ = auVar356._0_2_;
              auVar356._12_2_ = auVar356._0_2_;
              auVar356._14_2_ = auVar356._0_2_;
              auVar356._16_2_ = auVar356._0_2_;
              auVar356._18_2_ = auVar356._0_2_;
              auVar356._20_2_ = auVar356._0_2_;
              auVar356._22_2_ = auVar356._0_2_;
              auVar356._24_2_ = auVar356._0_2_;
              auVar356._26_2_ = auVar356._0_2_;
              auVar356._28_2_ = auVar356._0_2_;
              auVar356._30_2_ = auVar356._0_2_;
              auVar135 = vpblendw_avx2(auVar135,auVar356,8);
              auVar357._0_2_ = (undefined2)(uVar38 + 0xc);
              auVar357._2_2_ = auVar357._0_2_;
              auVar357._4_2_ = auVar357._0_2_;
              auVar357._6_2_ = auVar357._0_2_;
              auVar357._8_2_ = auVar357._0_2_;
              auVar357._10_2_ = auVar357._0_2_;
              auVar357._12_2_ = auVar357._0_2_;
              auVar357._14_2_ = auVar357._0_2_;
              auVar357._16_2_ = auVar357._0_2_;
              auVar357._18_2_ = auVar357._0_2_;
              auVar357._20_2_ = auVar357._0_2_;
              auVar357._22_2_ = auVar357._0_2_;
              auVar357._24_2_ = auVar357._0_2_;
              auVar357._26_2_ = auVar357._0_2_;
              auVar357._28_2_ = auVar357._0_2_;
              auVar357._30_2_ = auVar357._0_2_;
              auVar135 = vpblendw_avx2(auVar135,auVar357,0x10);
              auVar358._0_2_ = (undefined2)(uVar38 + 0xd);
              auVar358._2_2_ = auVar358._0_2_;
              auVar358._4_2_ = auVar358._0_2_;
              auVar358._6_2_ = auVar358._0_2_;
              auVar358._8_2_ = auVar358._0_2_;
              auVar358._10_2_ = auVar358._0_2_;
              auVar358._12_2_ = auVar358._0_2_;
              auVar358._14_2_ = auVar358._0_2_;
              auVar358._16_2_ = auVar358._0_2_;
              auVar358._18_2_ = auVar358._0_2_;
              auVar358._20_2_ = auVar358._0_2_;
              auVar358._22_2_ = auVar358._0_2_;
              auVar358._24_2_ = auVar358._0_2_;
              auVar358._26_2_ = auVar358._0_2_;
              auVar358._28_2_ = auVar358._0_2_;
              auVar358._30_2_ = auVar358._0_2_;
              auVar135 = vpblendw_avx2(auVar135,auVar358,0x20);
              auVar359._0_2_ = (undefined2)(uVar38 + 0xe);
              auVar359._2_2_ = auVar359._0_2_;
              auVar359._4_2_ = auVar359._0_2_;
              auVar359._6_2_ = auVar359._0_2_;
              auVar359._8_2_ = auVar359._0_2_;
              auVar359._10_2_ = auVar359._0_2_;
              auVar359._12_2_ = auVar359._0_2_;
              auVar359._14_2_ = auVar359._0_2_;
              auVar359._16_2_ = auVar359._0_2_;
              auVar359._18_2_ = auVar359._0_2_;
              auVar359._20_2_ = auVar359._0_2_;
              auVar359._22_2_ = auVar359._0_2_;
              auVar359._24_2_ = auVar359._0_2_;
              auVar359._26_2_ = auVar359._0_2_;
              auVar359._28_2_ = auVar359._0_2_;
              auVar359._30_2_ = auVar359._0_2_;
              auVar135 = vpblendw_avx2(auVar135,auVar359,0x40);
              auVar360._0_2_ = (undefined2)(uVar38 + 0xf);
              auVar360._2_2_ = auVar360._0_2_;
              auVar360._4_2_ = auVar360._0_2_;
              auVar360._6_2_ = auVar360._0_2_;
              auVar360._8_2_ = auVar360._0_2_;
              auVar360._10_2_ = auVar360._0_2_;
              auVar360._12_2_ = auVar360._0_2_;
              auVar360._14_2_ = auVar360._0_2_;
              auVar360._16_2_ = auVar360._0_2_;
              auVar360._18_2_ = auVar360._0_2_;
              auVar360._20_2_ = auVar360._0_2_;
              auVar360._22_2_ = auVar360._0_2_;
              auVar360._24_2_ = auVar360._0_2_;
              auVar360._26_2_ = auVar360._0_2_;
              auVar360._28_2_ = auVar360._0_2_;
              auVar360._30_2_ = auVar360._0_2_;
              auVar135 = vpblendw_avx2(auVar135,auVar360,0x80);
              auVar135 = vpblendd_avx2(ZEXT1632(auVar329),auVar135,0xf0);
              auVar135 = vpcmpgtw_avx2(auVar135,auVar112);
              auVar183._0_16_ = ZEXT116(0) * auVar325 + ZEXT116(1) * auVar160._0_16_;
              auVar183._16_16_ = ZEXT116(0) * auVar160._16_16_ + ZEXT116(1) * auVar325;
              auVar160 = vpblendvb_avx2(auVar183,auVar61,auVar135);
              *(undefined1 (*) [32])(local_2060 + uVar27 * 4) = auVar160;
              auVar160 = auVar61;
              if ((int)uVar38 < 0x2f) {
                auVar325 = auVar51;
                if (uVar38 - 0x30 < 0xfffffff7) {
                  auVar160 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar38 + 0x18))
                  ;
                  auVar135 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar38 + 0x19))
                  ;
                  auVar135 = vpsubd_avx2(auVar135,auVar160);
                  auVar160 = vpslld_avx2(auVar160,5);
                  auVar135 = vpmulld_avx2(auVar135,auVar162);
                  auVar160 = vpaddd_avx2(auVar160,auVar83);
                  auVar160 = vpaddd_avx2(auVar135,auVar160);
                  auVar160 = vpsrld_avx2(auVar160,5);
                  auVar219._0_16_ = ZEXT116(0) * auVar51 + ZEXT116(1) * auVar160._16_16_;
                  auVar219._16_16_ =
                       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar51;
                  auVar160 = vpackusdw_avx2(auVar160,auVar219);
                  auVar325 = auVar160._0_16_;
                }
                auVar160 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar38 + 0x10));
                auVar135 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar38 + 0x11));
                auVar135 = vpsubd_avx2(auVar135,auVar160);
                auVar160 = vpslld_avx2(auVar160,5);
                auVar135 = vpmulld_avx2(auVar135,auVar162);
                auVar160 = vpaddd_avx2(auVar160,auVar83);
                auVar160 = vpaddd_avx2(auVar135,auVar160);
                auVar160 = vpsrld_avx2(auVar160,5);
                auVar160 = vpackusdw_avx2(auVar160,ZEXT1632(auVar160._16_16_));
                auVar220._2_2_ = auVar292._0_2_;
                auVar220._0_2_ = auVar292._0_2_;
                auVar220._4_2_ = auVar292._0_2_;
                auVar220._6_2_ = auVar292._0_2_;
                auVar220._8_2_ = auVar292._0_2_;
                auVar220._10_2_ = auVar292._0_2_;
                auVar220._12_2_ = auVar292._0_2_;
                auVar220._14_2_ = auVar292._0_2_;
                auVar220._16_2_ = auVar292._0_2_;
                auVar220._18_2_ = auVar292._0_2_;
                auVar220._20_2_ = auVar292._0_2_;
                auVar220._22_2_ = auVar292._0_2_;
                auVar220._24_2_ = auVar292._0_2_;
                auVar220._26_2_ = auVar292._0_2_;
                auVar220._28_2_ = auVar292._0_2_;
                auVar220._30_2_ = auVar292._0_2_;
                auVar135 = vpaddw_avx2(auVar220,auVar400);
                auVar135 = vpcmpgtw_avx2(auVar135,auVar112);
                auVar163._0_16_ = ZEXT116(0) * auVar325 + ZEXT116(1) * auVar160._0_16_;
                auVar163._16_16_ = ZEXT116(0) * auVar160._16_16_ + ZEXT116(1) * auVar325;
                auVar160 = vpblendvb_avx2(auVar163,auVar61,auVar135);
              }
              *(undefined1 (*) [32])(local_1c60 + uVar27 * 4) = auVar160;
              uVar43 = (ulong)(uint)((int)uVar43 + dy);
            }
            else {
              for (; lVar33 != 0; lVar33 = lVar33 + 0x20) {
                *(undefined1 (*) [32])((long)local_1c60 + lVar33) = auVar61;
                *(undefined1 (*) [32])(auStack_1860 + lVar33) = auVar61;
              }
            }
            uVar27 = uVar27 + 1;
            lVar30 = lVar30 + 0x20;
          } while ((int)uVar38 < 0x3f);
        }
        highbd_transpose16x16_avx2((__m256i *)local_2060,(__m256i *)local_2460);
        puVar23 = dst;
        for (lVar30 = 0; lVar30 != 0x200; lVar30 = lVar30 + 0x20) {
          uVar4 = *(undefined8 *)(local_2460 + lVar30 + 8);
          uVar7 = *(undefined8 *)(local_2460 + lVar30 + 0x10);
          uVar8 = *(undefined8 *)(local_2440 + lVar30 + -8);
          *(undefined8 *)puVar23 = *(undefined8 *)(local_2460 + lVar30);
          *(undefined8 *)(puVar23 + 4) = uVar4;
          *(undefined8 *)(puVar23 + 8) = uVar7;
          *(undefined8 *)(puVar23 + 0xc) = uVar8;
          puVar23 = puVar23 + stride;
        }
        highbd_transpose16x16_avx2((__m256i *)local_1e60,(__m256i *)local_2460);
        puVar23 = dst + 0x10;
        for (lVar30 = 0; lVar30 != 0x200; lVar30 = lVar30 + 0x20) {
          uVar4 = *(undefined8 *)(local_2460 + lVar30 + 8);
          uVar7 = *(undefined8 *)(local_2460 + lVar30 + 0x10);
          uVar8 = *(undefined8 *)(local_2440 + lVar30 + -8);
          *(undefined8 *)puVar23 = *(undefined8 *)(local_2460 + lVar30);
          *(undefined8 *)(puVar23 + 4) = uVar4;
          *(undefined8 *)(puVar23 + 8) = uVar7;
          *(undefined8 *)(puVar23 + 0xc) = uVar8;
          puVar23 = puVar23 + stride;
        }
        highbd_transpose16x16_avx2((__m256i *)local_1c60,(__m256i *)local_2460);
        puVar23 = dst + stride * 0x10;
        for (lVar30 = 0; lVar30 != 0x200; lVar30 = lVar30 + 0x20) {
          uVar4 = *(undefined8 *)(local_2460 + lVar30 + 8);
          uVar7 = *(undefined8 *)(local_2460 + lVar30 + 0x10);
          uVar8 = *(undefined8 *)(local_2440 + lVar30 + -8);
          *(undefined8 *)puVar23 = *(undefined8 *)(local_2460 + lVar30);
          *(undefined8 *)(puVar23 + 4) = uVar4;
          *(undefined8 *)(puVar23 + 8) = uVar7;
          *(undefined8 *)(puVar23 + 0xc) = uVar8;
          puVar23 = puVar23 + stride;
        }
        highbd_transpose16x16_avx2((__m256i *)local_1a60,(__m256i *)local_2460);
        puVar23 = dst + stride * 0x10 + 0x10;
        for (lVar30 = 0; lVar30 != 0x200; lVar30 = lVar30 + 0x20) {
          uVar4 = *(undefined8 *)(local_2460 + lVar30 + 8);
          uVar7 = *(undefined8 *)(local_2460 + lVar30 + 0x10);
          uVar8 = *(undefined8 *)(local_2440 + lVar30 + -8);
          *(undefined8 *)puVar23 = *(undefined8 *)(local_2460 + lVar30);
          *(undefined8 *)(puVar23 + 4) = uVar4;
          *(undefined8 *)(puVar23 + 8) = uVar7;
          *(undefined8 *)(puVar23 + 0xc) = uVar8;
          puVar23 = puVar23 + stride;
        }
        return;
      }
      if (bw != 4) {
        return;
      }
      iVar28 = 7 << (bVar26 & 0x1f);
      uVar3 = left[iVar28];
      auVar45._2_2_ = uVar3;
      auVar45._0_2_ = uVar3;
      auVar45._4_2_ = uVar3;
      auVar45._6_2_ = uVar3;
      auVar45._8_2_ = uVar3;
      auVar45._10_2_ = uVar3;
      auVar45._12_2_ = uVar3;
      auVar45._14_2_ = uVar3;
      if (bd < 0xc) {
        auVar69._0_2_ = (undefined2)iVar28;
        auVar69._2_2_ = auVar69._0_2_;
        auVar69._4_2_ = auVar69._0_2_;
        auVar69._6_2_ = auVar69._0_2_;
        auVar69._8_2_ = auVar69._0_2_;
        auVar69._10_2_ = auVar69._0_2_;
        auVar69._12_2_ = auVar69._0_2_;
        auVar69._14_2_ = auVar69._0_2_;
        auVar105._8_2_ = 0x10;
        auVar105._0_8_ = 0x10001000100010;
        auVar105._10_2_ = 0x10;
        auVar105._12_2_ = 0x10;
        auVar105._14_2_ = 0x10;
        auVar198._8_2_ = 0x1f;
        auVar198._0_8_ = 0x1f001f001f001f;
        auVar198._10_2_ = 0x1f;
        auVar198._12_2_ = 0x1f;
        auVar198._14_2_ = 0x1f;
        auVar198._16_2_ = 0x1f;
        auVar198._18_2_ = 0x1f;
        auVar198._20_2_ = 0x1f;
        auVar198._22_2_ = 0x1f;
        auVar198._24_2_ = 0x1f;
        auVar198._26_2_ = 0x1f;
        auVar198._28_2_ = 0x1f;
        auVar198._30_2_ = 0x1f;
        for (lVar30 = 0; lVar30 != 0x40; lVar30 = lVar30 + 0x10) {
          uVar38 = (int)uVar43 >> (6 - bVar26 & 0x1f);
          if (iVar28 <= (int)uVar38) goto LAB_002f86a4;
          auVar291 = *(undefined1 (*) [16])(left + (int)uVar38);
          auVar388._0_2_ = (undefined2)uVar38;
          if (upsample_left == 0) {
            auVar325 = *(undefined1 (*) [16])(left + (long)(int)uVar38 + 1);
            auVar389._2_2_ = auVar388._0_2_;
            auVar389._0_2_ = auVar388._0_2_;
            auVar389._4_2_ = auVar388._0_2_;
            auVar389._6_2_ = auVar388._0_2_;
            auVar389._8_2_ = auVar388._0_2_;
            auVar389._10_2_ = auVar388._0_2_;
            auVar389._12_2_ = auVar388._0_2_;
            auVar389._14_2_ = auVar388._0_2_;
            auVar179 = vpaddw_avx(auVar389,ZEXT816(0x7000600050004));
            auVar329 = vpinsrw_avx(ZEXT416(uVar38),uVar38 + 1,1);
            auVar329 = vpinsrw_avx(auVar329,uVar38 + 2,2);
            auVar329 = vpinsrw_avx(auVar329,uVar38 + 3,3);
            auVar179 = vpunpcklqdq_avx(auVar329,auVar179);
            uVar6 = (ushort)(uVar43 >> 1);
            uVar387 = uVar6 & 0x1f;
            auVar390._0_8_ =
                 CONCAT26(uVar6,CONCAT24(uVar6,CONCAT22(uVar6,uVar6))) & 0x1f001f001f001f;
            auVar390._8_2_ = uVar387;
            auVar390._10_2_ = uVar387;
            auVar390._12_2_ = uVar387;
            auVar390._14_2_ = uVar387;
          }
          else {
            auVar291 = vpshufb_avx(auVar291,_DAT_0046f500);
            auVar325 = vpsrldq_avx(auVar291,8);
            auVar388._2_2_ = auVar388._0_2_;
            auVar388._4_2_ = auVar388._0_2_;
            auVar388._6_2_ = auVar388._0_2_;
            auVar388._8_2_ = auVar388._0_2_;
            auVar388._10_2_ = auVar388._0_2_;
            auVar388._12_2_ = auVar388._0_2_;
            auVar388._14_2_ = auVar388._0_2_;
            auVar179 = vpinsrw_avx(ZEXT416(uVar38),uVar38 + 2,1);
            auVar179 = vpinsrw_avx(auVar179,uVar38 + 4,2);
            auVar329 = vpinsrw_avx(auVar179,uVar38 + 6,3);
            auVar179 = vpaddw_avx(auVar388,ZEXT816(0xe000c000a0008));
            auVar179 = vpunpcklqdq_avx(auVar329,auVar179);
            auVar399._0_2_ = (undefined2)uVar43;
            auVar399._2_2_ = auVar399._0_2_;
            auVar399._4_2_ = auVar399._0_2_;
            auVar399._6_2_ = auVar399._0_2_;
            auVar399._8_2_ = auVar399._0_2_;
            auVar399._10_2_ = auVar399._0_2_;
            auVar399._12_2_ = auVar399._0_2_;
            auVar399._14_2_ = auVar399._0_2_;
            auVar399._16_2_ = auVar399._0_2_;
            auVar399._18_2_ = auVar399._0_2_;
            auVar399._20_2_ = auVar399._0_2_;
            auVar399._22_2_ = auVar399._0_2_;
            auVar399._24_2_ = auVar399._0_2_;
            auVar399._26_2_ = auVar399._0_2_;
            auVar399._28_2_ = auVar399._0_2_;
            auVar399._30_2_ = auVar399._0_2_;
            auVar400 = vpsllw_avx2(auVar399,ZEXT416((uint)upsample_left));
            auVar400 = vpsrlw_avx2(auVar400,1);
            auVar400 = vpand_avx2(auVar400,auVar198);
            auVar390 = auVar400._0_16_;
          }
          auVar179 = vpcmpgtw_avx(auVar69,auVar179);
          auVar325 = vpsubw_avx(auVar325,auVar291);
          auVar325 = vpmullw_avx(auVar325,auVar390);
          auVar291 = vpsllw_avx(auVar291,5);
          auVar291 = vpaddw_avx(auVar291,auVar105);
          auVar291 = vpaddw_avx(auVar325,auVar291);
          auVar291 = vpsrlw_avx(auVar291,5);
          auVar291 = vpblendvb_avx(auVar45,auVar291,auVar179);
          *(undefined1 (*) [16])((long)local_2060 + lVar30) = auVar291;
          uVar43 = (ulong)(uint)((int)uVar43 + dy);
        }
      }
      else {
        auVar74._4_4_ = iVar28;
        auVar74._0_4_ = iVar28;
        auVar74._8_4_ = iVar28;
        auVar74._12_4_ = iVar28;
        auVar100._8_4_ = 0x10;
        auVar100._0_8_ = 0x1000000010;
        auVar100._12_4_ = 0x10;
        auVar132._8_4_ = 0x1f;
        auVar132._0_8_ = 0x1f0000001f;
        auVar132._12_4_ = 0x1f;
        auVar132._16_4_ = 0x1f;
        auVar132._20_4_ = 0x1f;
        auVar132._24_4_ = 0x1f;
        auVar132._28_4_ = 0x1f;
        for (lVar30 = 0; lVar30 != 0x40; lVar30 = lVar30 + 0x10) {
          iVar40 = (int)uVar43;
          uVar38 = iVar40 >> (6 - bVar26 & 0x1f);
          if (iVar28 <= (int)uVar38) goto LAB_002f9bc8;
          auVar400 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (int)uVar38));
          auVar291 = auVar400._0_16_;
          if (upsample_left == 0) {
            auVar400 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar38 + 1));
            auVar179 = auVar400._0_16_;
            auVar325 = vpinsrd_avx(ZEXT416(uVar38),uVar38 + 1,1);
            auVar325 = vpinsrd_avx(auVar325,uVar38 + 2,2);
            auVar325 = vpinsrd_avx(auVar325,uVar38 + 3,3);
            uVar38 = (uint)(uVar43 >> 1);
            auVar293._0_8_ = CONCAT44(uVar38,uVar38) & 0x1f0000001f;
            auVar293._8_4_ = uVar38 & 0x1f;
            auVar293._12_4_ = uVar38 & 0x1f;
          }
          else {
            auVar400 = vpshufd_avx2(auVar400,0xd8);
            auVar400 = vpermq_avx2(auVar400,0xd8);
            auVar291 = auVar400._0_16_;
            auVar179 = ZEXT116(0) * auVar45 + ZEXT116(1) * auVar400._16_16_;
            auVar325 = vpinsrd_avx(ZEXT416(uVar38),uVar38 + 2,1);
            auVar325 = vpinsrd_avx(auVar325,uVar38 + 4,2);
            auVar325 = vpinsrd_avx(auVar325,uVar38 + 6,3);
            auVar306._4_4_ = iVar40;
            auVar306._0_4_ = iVar40;
            auVar306._8_4_ = iVar40;
            auVar306._12_4_ = iVar40;
            auVar306._16_4_ = iVar40;
            auVar306._20_4_ = iVar40;
            auVar306._24_4_ = iVar40;
            auVar306._28_4_ = iVar40;
            auVar400 = vpslld_avx2(auVar306,ZEXT416((uint)upsample_left));
            auVar400 = vpsrld_avx2(auVar400,1);
            auVar400 = vpand_avx2(auVar400,auVar132);
            auVar293 = auVar400._0_16_;
          }
          auVar329 = vpcmpgtd_avx(auVar74,auVar325);
          auVar325 = vpsubd_avx(auVar179,auVar291);
          auVar325 = vpmulld_avx(auVar325,auVar293);
          auVar291 = vpslld_avx(auVar291,5);
          auVar291 = vpaddd_avx(auVar291,auVar100);
          auVar291 = vpaddd_avx(auVar325,auVar291);
          auVar291 = vpsrld_avx(auVar291,5);
          auVar325 = vpackusdw_avx(auVar291,auVar291);
          auVar291 = vpackssdw_avx(auVar329,auVar329);
          auVar291 = vpblendvb_avx(auVar45,auVar325,auVar291);
          *(undefined1 (*) [16])((long)local_2060 + lVar30) = auVar291;
          uVar43 = (ulong)(uint)(iVar40 + dy);
        }
      }
      goto LAB_002f9bce;
    }
    if (bd < 0xc) {
      highbd_dr_prediction_z1_64xN_avx2(0x40,(uint16_t *)local_2060,0x40,left,dy,iVar28);
    }
    else {
      highbd_dr_prediction_32bit_z1_64xN_avx2(0x40,(uint16_t *)local_2060,0x40,left,dy,iVar28);
    }
    pitchSrc = 0x40;
    iVar40 = 0x40;
    iVar28 = iVar40;
  }
  else if (bw < bh) {
    if (bw * 2 == bh) {
      switch(bw << 0x1e | bw - 4U >> 2) {
      case 0:
        iVar28 = 0xb << (bVar26 & 0x1f);
        uVar3 = left[iVar28];
        auVar46._2_2_ = uVar3;
        auVar46._0_2_ = uVar3;
        auVar46._4_2_ = uVar3;
        auVar46._6_2_ = uVar3;
        auVar46._8_2_ = uVar3;
        auVar46._10_2_ = uVar3;
        auVar46._12_2_ = uVar3;
        auVar46._14_2_ = uVar3;
        auVar58._16_2_ = uVar3;
        auVar58._0_16_ = auVar46;
        auVar58._18_2_ = uVar3;
        auVar58._20_2_ = uVar3;
        auVar58._22_2_ = uVar3;
        auVar58._24_2_ = uVar3;
        auVar58._26_2_ = uVar3;
        auVar58._28_2_ = uVar3;
        auVar58._30_2_ = uVar3;
        if (bd < 0xc) {
          auVar70._0_2_ = (undefined2)iVar28;
          auVar70._2_2_ = auVar70._0_2_;
          auVar70._4_2_ = auVar70._0_2_;
          auVar70._6_2_ = auVar70._0_2_;
          auVar70._8_2_ = auVar70._0_2_;
          auVar70._10_2_ = auVar70._0_2_;
          auVar70._12_2_ = auVar70._0_2_;
          auVar70._14_2_ = auVar70._0_2_;
          auVar98._8_2_ = 0x10;
          auVar98._0_8_ = 0x10001000100010;
          auVar98._10_2_ = 0x10;
          auVar98._12_2_ = 0x10;
          auVar98._14_2_ = 0x10;
          auVar157._8_2_ = 0x1f;
          auVar157._0_8_ = 0x1f001f001f001f;
          auVar157._10_2_ = 0x1f;
          auVar157._12_2_ = 0x1f;
          auVar157._14_2_ = 0x1f;
          auVar157._16_2_ = 0x1f;
          auVar157._18_2_ = 0x1f;
          auVar157._20_2_ = 0x1f;
          auVar157._22_2_ = 0x1f;
          auVar157._24_2_ = 0x1f;
          auVar157._26_2_ = 0x1f;
          auVar157._28_2_ = 0x1f;
          auVar157._30_2_ = 0x1f;
          for (lVar30 = 0; lVar30 != 0x40; lVar30 = lVar30 + 0x10) {
            uVar38 = (int)uVar43 >> (6 - bVar26 & 0x1f);
            if (iVar28 <= (int)uVar38) goto LAB_002f8a1e;
            auVar291 = *(undefined1 (*) [16])(left + (int)uVar38);
            if (upsample_left == 0) {
              auVar325 = *(undefined1 (*) [16])(left + (long)(int)uVar38 + 1);
              auVar179 = vpinsrw_avx(ZEXT416(uVar38),uVar38 + 1,1);
              auVar179 = vpinsrw_avx(auVar179,uVar38 + 2,2);
              auVar179 = vpinsrw_avx(auVar179,uVar38 + 3,3);
              auVar179 = vpinsrw_avx(auVar179,uVar38 + 4,4);
              auVar179 = vpinsrw_avx(auVar179,uVar38 + 5,5);
              auVar179 = vpinsrw_avx(auVar179,uVar38 + 6,6);
              auVar179 = vpinsrw_avx(auVar179,uVar38 + 7,7);
              uVar6 = (ushort)(uVar43 >> 1);
              uVar387 = uVar6 & 0x1f;
              auVar326._0_8_ =
                   CONCAT26(uVar6,CONCAT24(uVar6,CONCAT22(uVar6,uVar6))) & 0x1f001f001f001f;
              auVar326._8_2_ = uVar387;
              auVar326._10_2_ = uVar387;
              auVar326._12_2_ = uVar387;
              auVar326._14_2_ = uVar387;
            }
            else {
              auVar325 = vpblendw_avx(auVar291,(undefined1  [16])0x0,0xaa);
              auVar179 = vpblendw_avx(*(undefined1 (*) [16])(left + (long)(int)uVar38 + 8),
                                      (undefined1  [16])0x0,0xaa);
              auVar397 = vpsrld_avx(auVar291,0x10);
              auVar291 = vpackusdw_avx(auVar325,auVar179);
              auVar329 = vpsrld_avx(*(undefined1 (*) [16])(left + (long)(int)uVar38 + 8),0x10);
              auVar325 = vpinsrw_avx(ZEXT416(uVar38),uVar38 + 2,1);
              auVar325 = vpinsrw_avx(auVar325,uVar38 + 4,2);
              auVar325 = vpinsrw_avx(auVar325,uVar38 + 6,3);
              auVar325 = vpinsrw_avx(auVar325,uVar38 + 8,4);
              auVar325 = vpinsrw_avx(auVar325,uVar38 + 10,5);
              auVar325 = vpinsrw_avx(auVar325,uVar38 + 0xc,6);
              auVar179 = vpinsrw_avx(auVar325,uVar38 + 0xe,7);
              auVar334._0_2_ = (undefined2)uVar43;
              auVar334._2_2_ = auVar334._0_2_;
              auVar334._4_2_ = auVar334._0_2_;
              auVar334._6_2_ = auVar334._0_2_;
              auVar334._8_2_ = auVar334._0_2_;
              auVar334._10_2_ = auVar334._0_2_;
              auVar334._12_2_ = auVar334._0_2_;
              auVar334._14_2_ = auVar334._0_2_;
              auVar334._16_2_ = auVar334._0_2_;
              auVar334._18_2_ = auVar334._0_2_;
              auVar334._20_2_ = auVar334._0_2_;
              auVar334._22_2_ = auVar334._0_2_;
              auVar334._24_2_ = auVar334._0_2_;
              auVar334._26_2_ = auVar334._0_2_;
              auVar334._28_2_ = auVar334._0_2_;
              auVar334._30_2_ = auVar334._0_2_;
              auVar400 = vpsllw_avx2(auVar334,ZEXT416((uint)upsample_left));
              auVar325 = vpackusdw_avx(auVar397,auVar329);
              auVar400 = vpsrlw_avx2(auVar400,1);
              auVar400 = vpand_avx2(auVar400,auVar157);
              auVar326 = auVar400._0_16_;
            }
            auVar329 = vpsllw_avx(auVar291,5);
            auVar329 = vpaddw_avx(auVar329,auVar98);
            auVar291 = vpsubw_avx(auVar325,auVar291);
            auVar291 = vpmullw_avx(auVar326,auVar291);
            auVar291 = vpaddw_avx(auVar329,auVar291);
            auVar325 = vpsrlw_avx(auVar291,5);
            auVar291 = vpcmpgtw_avx(auVar70,auVar179);
            auVar291 = vpblendvb_avx(auVar46,auVar325,auVar291);
            *(undefined1 (*) [16])(local_2460 + lVar30) = auVar291;
            uVar43 = (ulong)(uint)((int)uVar43 + dy);
          }
        }
        else {
          auVar95._4_4_ = iVar28;
          auVar95._0_4_ = iVar28;
          auVar95._8_4_ = iVar28;
          auVar95._12_4_ = iVar28;
          auVar95._16_4_ = iVar28;
          auVar95._20_4_ = iVar28;
          auVar95._24_4_ = iVar28;
          auVar95._28_4_ = iVar28;
          lVar30 = 0;
          auVar291 = vpmovsxbd_avx(ZEXT416(0x3020104));
          auVar124._8_4_ = 0x10;
          auVar124._0_8_ = 0x1000000010;
          auVar124._12_4_ = 0x10;
          auVar124._16_4_ = 0x10;
          auVar124._20_4_ = 0x10;
          auVar124._24_4_ = 0x10;
          auVar124._28_4_ = 0x10;
          auVar325 = vpmovsxbd_avx(ZEXT416(0x6040208));
          auVar192._8_4_ = 0x1f;
          auVar192._0_8_ = 0x1f0000001f;
          auVar192._12_4_ = 0x1f;
          auVar192._16_4_ = 0x1f;
          auVar192._20_4_ = 0x1f;
          auVar192._24_4_ = 0x1f;
          auVar192._28_4_ = 0x1f;
          uVar38 = dy;
          for (; lVar30 != 0x40; lVar30 = lVar30 + 0x10) {
            iVar40 = (int)uVar38 >> (6 - bVar26 & 0x1f);
            if (iVar28 <= iVar40) goto LAB_002fbd0e;
            auVar281 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + iVar40));
            if (upsample_left == 0) {
              auVar400 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)iVar40 + 1));
              auVar332._4_4_ = iVar40;
              auVar332._0_4_ = iVar40;
              auVar332._8_4_ = iVar40;
              auVar332._12_4_ = iVar40;
              iVar39 = iVar40 + 5;
              iVar1 = iVar40 + 6;
              iVar40 = iVar40 + 7;
              auVar179 = vpaddd_avx(auVar332,auVar291);
              auVar160 = vpermq_avx2(ZEXT1632(auVar179),0xc4);
              auVar160 = vpblendd_avx2(auVar160,ZEXT1632(auVar332),1);
              auVar379._4_4_ = iVar39;
              auVar379._0_4_ = iVar39;
              auVar379._8_4_ = iVar39;
              auVar379._12_4_ = iVar39;
              auVar379._16_4_ = iVar39;
              auVar379._20_4_ = iVar39;
              auVar379._24_4_ = iVar39;
              auVar379._28_4_ = iVar39;
              auVar160 = vpblendd_avx2(auVar160,auVar379,0x20);
              auVar380._4_4_ = iVar1;
              auVar380._0_4_ = iVar1;
              auVar380._8_4_ = iVar1;
              auVar380._12_4_ = iVar1;
              auVar380._16_4_ = iVar1;
              auVar380._20_4_ = iVar1;
              auVar380._24_4_ = iVar1;
              auVar380._28_4_ = iVar1;
              auVar160 = vpblendd_avx2(auVar160,auVar380,0x40);
              auVar381._4_4_ = iVar40;
              auVar381._0_4_ = iVar40;
              auVar381._8_4_ = iVar40;
              auVar381._12_4_ = iVar40;
              auVar381._16_4_ = iVar40;
              auVar381._20_4_ = iVar40;
              auVar381._24_4_ = iVar40;
              auVar381._28_4_ = iVar40;
              auVar160 = vpblendd_avx2(auVar160,auVar381,0x80);
              uVar34 = uVar38 >> 1;
              uVar32 = uVar34 & 0x1f;
              auVar382._0_8_ = CONCAT44(uVar34,uVar34) & 0x1f0000001f;
              auVar382._8_4_ = uVar32;
              auVar382._12_4_ = uVar32;
              auVar382._16_4_ = uVar32;
              auVar382._20_4_ = uVar32;
              auVar382._24_4_ = uVar32;
              auVar382._28_4_ = uVar32;
            }
            else {
              auVar400 = vpshufd_avx2(auVar281,0xd8);
              auVar135 = vpermq_avx2(auVar400,0xd8);
              auVar400 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)iVar40 + 8));
              auVar400 = vpshufd_avx2(auVar400,0xd8);
              auVar139 = vpermq_avx2(auVar400,0xd8);
              auVar196._4_4_ = iVar40;
              auVar196._0_4_ = iVar40;
              auVar196._8_4_ = iVar40;
              auVar196._12_4_ = iVar40;
              iVar39 = iVar40 + 10;
              iVar1 = iVar40 + 0xc;
              iVar40 = iVar40 + 0xe;
              auVar179 = vpaddd_avx(auVar196,auVar325);
              auVar400 = vpermq_avx2(ZEXT1632(auVar179),0xc4);
              auVar400 = vpblendd_avx2(auVar400,ZEXT1632(auVar196),1);
              auVar344._4_4_ = iVar39;
              auVar344._0_4_ = iVar39;
              auVar344._8_4_ = iVar39;
              auVar344._12_4_ = iVar39;
              auVar344._16_4_ = iVar39;
              auVar344._20_4_ = iVar39;
              auVar344._24_4_ = iVar39;
              auVar344._28_4_ = iVar39;
              auVar400 = vpblendd_avx2(auVar400,auVar344,0x20);
              auVar345._4_4_ = iVar1;
              auVar345._0_4_ = iVar1;
              auVar345._8_4_ = iVar1;
              auVar345._12_4_ = iVar1;
              auVar345._16_4_ = iVar1;
              auVar345._20_4_ = iVar1;
              auVar345._24_4_ = iVar1;
              auVar345._28_4_ = iVar1;
              auVar400 = vpblendd_avx2(auVar400,auVar345,0x40);
              auVar346._4_4_ = iVar40;
              auVar346._0_4_ = iVar40;
              auVar346._8_4_ = iVar40;
              auVar346._12_4_ = iVar40;
              auVar346._16_4_ = iVar40;
              auVar346._20_4_ = iVar40;
              auVar346._24_4_ = iVar40;
              auVar346._28_4_ = iVar40;
              auVar160 = vpblendd_avx2(auVar400,auVar346,0x80);
              auVar280._4_4_ = uVar38;
              auVar280._0_4_ = uVar38;
              auVar280._8_4_ = uVar38;
              auVar280._12_4_ = uVar38;
              auVar280._16_4_ = uVar38;
              auVar280._20_4_ = uVar38;
              auVar280._24_4_ = uVar38;
              auVar280._28_4_ = uVar38;
              auVar400 = vpslld_avx2(auVar280,ZEXT416((uint)upsample_left));
              auVar281._0_16_ = ZEXT116(0) * auVar139._0_16_ + ZEXT116(1) * auVar135._0_16_;
              auVar281._16_16_ = ZEXT116(0) * auVar135._16_16_ + ZEXT116(1) * auVar139._0_16_;
              auVar400 = vpsrld_avx2(auVar400,1);
              auVar382 = vpand_avx2(auVar400,auVar192);
              auVar400 = vperm2i128_avx2(auVar135,auVar139,0x31);
            }
            auVar160 = vpcmpgtd_avx2(auVar95,auVar160);
            auVar400 = vpsubd_avx2(auVar400,auVar281);
            auVar135 = vpmulld_avx2(auVar400,auVar382);
            auVar400 = vpslld_avx2(auVar281,5);
            auVar400 = vpaddd_avx2(auVar400,auVar124);
            auVar400 = vpaddd_avx2(auVar135,auVar400);
            auVar400 = vpsrld_avx2(auVar400,5);
            auVar329 = vpackusdw_avx(auVar400._0_16_,auVar400._16_16_);
            auVar179 = vpackssdw_avx(auVar160._0_16_,auVar160._16_16_);
            auVar400 = vpblendvb_avx2(auVar58,ZEXT1632(auVar329),ZEXT1632(auVar179));
            *(undefined1 (*) [16])(local_2460 + lVar30) = auVar400._0_16_;
            uVar38 = uVar38 + dy;
          }
        }
        goto LAB_002fbd14;
      case 1:
        uVar3 = left[0x17];
        auVar56._2_2_ = uVar3;
        auVar56._0_2_ = uVar3;
        auVar56._4_2_ = uVar3;
        auVar56._6_2_ = uVar3;
        auVar56._8_2_ = uVar3;
        auVar56._10_2_ = uVar3;
        auVar56._12_2_ = uVar3;
        auVar56._14_2_ = uVar3;
        auVar67._16_2_ = uVar3;
        auVar67._0_16_ = auVar56;
        auVar67._18_2_ = uVar3;
        auVar67._20_2_ = uVar3;
        auVar67._22_2_ = uVar3;
        auVar67._24_2_ = uVar3;
        auVar67._26_2_ = uVar3;
        auVar67._28_2_ = uVar3;
        auVar67._30_2_ = uVar3;
        lVar30 = 0;
        if (bd < 0xc) {
          auVar89._8_2_ = 0x10;
          auVar89._0_8_ = 0x10001000100010;
          auVar89._10_2_ = 0x10;
          auVar89._12_2_ = 0x10;
          auVar89._14_2_ = 0x10;
          auVar89._16_2_ = 0x10;
          auVar89._18_2_ = 0x10;
          auVar89._20_2_ = 0x10;
          auVar89._22_2_ = 0x10;
          auVar89._24_2_ = 0x10;
          auVar89._26_2_ = 0x10;
          auVar89._28_2_ = 0x10;
          auVar89._30_2_ = 0x10;
          auVar291 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
          auVar118._8_2_ = 0x16;
          auVar118._0_8_ = 0x16001600160016;
          auVar118._10_2_ = 0x16;
          auVar118._12_2_ = 0x16;
          auVar118._14_2_ = 0x16;
          auVar118._16_2_ = 0x16;
          auVar118._18_2_ = 0x16;
          auVar118._20_2_ = 0x16;
          auVar118._22_2_ = 0x16;
          auVar118._24_2_ = 0x16;
          auVar118._26_2_ = 0x16;
          auVar118._28_2_ = 0x16;
          auVar118._30_2_ = 0x16;
          uVar38 = dy;
          for (; lVar30 != 0x100; lVar30 = lVar30 + 0x20) {
            uVar34 = (int)uVar38 >> 6;
            if (0x16 < (int)uVar34) goto LAB_002fa80d;
            uVar6 = (ushort)(uVar38 >> 1);
            uVar387 = uVar6 & 0x1f;
            auVar138._0_8_ =
                 CONCAT26(uVar6,CONCAT24(uVar6,CONCAT22(uVar6,uVar6))) & 0x1f001f001f001f;
            auVar138._8_2_ = uVar387;
            auVar138._10_2_ = uVar387;
            auVar138._12_2_ = uVar387;
            auVar138._14_2_ = uVar387;
            auVar138._16_2_ = uVar387;
            auVar138._18_2_ = uVar387;
            auVar138._20_2_ = uVar387;
            auVar138._22_2_ = uVar387;
            auVar138._24_2_ = uVar387;
            auVar138._26_2_ = uVar387;
            auVar138._28_2_ = uVar387;
            auVar138._30_2_ = uVar387;
            auVar400 = vpsubw_avx2(*(undefined1 (*) [32])(left + (long)(int)uVar34 + 1),
                                   *(undefined1 (*) [32])(left + (int)uVar34));
            auVar160 = vpmullw_avx2(auVar400,auVar138);
            auVar400 = vpsllw_avx2(*(undefined1 (*) [32])(left + (int)uVar34),5);
            auVar400 = vpaddw_avx2(auVar400,auVar89);
            auVar400 = vpaddw_avx2(auVar160,auVar400);
            auVar160 = vpsrlw_avx2(auVar400,5);
            auVar152._0_2_ = (undefined2)uVar34;
            auVar152._2_2_ = auVar152._0_2_;
            auVar152._4_2_ = auVar152._0_2_;
            auVar152._6_2_ = auVar152._0_2_;
            auVar152._8_2_ = auVar152._0_2_;
            auVar152._10_2_ = auVar152._0_2_;
            auVar152._12_2_ = auVar152._0_2_;
            auVar152._14_2_ = auVar152._0_2_;
            auVar325 = vpaddw_avx(auVar152,auVar291);
            auVar179 = vpslldq_avx(auVar325,2);
            auVar179 = vpblendw_avx(auVar179,ZEXT416(uVar34),1);
            auVar325 = vpsrldq_avx(auVar325,0xe);
            auVar168._0_16_ = ZEXT116(0) * auVar325 + ZEXT116(1) * auVar56;
            auVar168._16_16_ = ZEXT116(0) * auVar67._16_16_ + ZEXT116(1) * auVar325;
            auVar244._0_2_ = (undefined2)(uVar34 + 9);
            auVar244._2_2_ = auVar244._0_2_;
            auVar244._4_2_ = auVar244._0_2_;
            auVar244._6_2_ = auVar244._0_2_;
            auVar244._8_2_ = auVar244._0_2_;
            auVar244._10_2_ = auVar244._0_2_;
            auVar244._12_2_ = auVar244._0_2_;
            auVar244._14_2_ = auVar244._0_2_;
            auVar244._16_2_ = auVar244._0_2_;
            auVar244._18_2_ = auVar244._0_2_;
            auVar244._20_2_ = auVar244._0_2_;
            auVar244._22_2_ = auVar244._0_2_;
            auVar244._24_2_ = auVar244._0_2_;
            auVar244._26_2_ = auVar244._0_2_;
            auVar244._28_2_ = auVar244._0_2_;
            auVar244._30_2_ = auVar244._0_2_;
            auVar400 = vpblendw_avx2(auVar168,auVar244,2);
            auVar245._0_2_ = (undefined2)(uVar34 + 10);
            auVar245._2_2_ = auVar245._0_2_;
            auVar245._4_2_ = auVar245._0_2_;
            auVar245._6_2_ = auVar245._0_2_;
            auVar245._8_2_ = auVar245._0_2_;
            auVar245._10_2_ = auVar245._0_2_;
            auVar245._12_2_ = auVar245._0_2_;
            auVar245._14_2_ = auVar245._0_2_;
            auVar245._16_2_ = auVar245._0_2_;
            auVar245._18_2_ = auVar245._0_2_;
            auVar245._20_2_ = auVar245._0_2_;
            auVar245._22_2_ = auVar245._0_2_;
            auVar245._24_2_ = auVar245._0_2_;
            auVar245._26_2_ = auVar245._0_2_;
            auVar245._28_2_ = auVar245._0_2_;
            auVar245._30_2_ = auVar245._0_2_;
            auVar400 = vpblendw_avx2(auVar400,auVar245,4);
            auVar246._0_2_ = (undefined2)(uVar34 + 0xb);
            auVar246._2_2_ = auVar246._0_2_;
            auVar246._4_2_ = auVar246._0_2_;
            auVar246._6_2_ = auVar246._0_2_;
            auVar246._8_2_ = auVar246._0_2_;
            auVar246._10_2_ = auVar246._0_2_;
            auVar246._12_2_ = auVar246._0_2_;
            auVar246._14_2_ = auVar246._0_2_;
            auVar246._16_2_ = auVar246._0_2_;
            auVar246._18_2_ = auVar246._0_2_;
            auVar246._20_2_ = auVar246._0_2_;
            auVar246._22_2_ = auVar246._0_2_;
            auVar246._24_2_ = auVar246._0_2_;
            auVar246._26_2_ = auVar246._0_2_;
            auVar246._28_2_ = auVar246._0_2_;
            auVar246._30_2_ = auVar246._0_2_;
            auVar400 = vpblendw_avx2(auVar400,auVar246,8);
            auVar247._0_2_ = (undefined2)(uVar34 + 0xc);
            auVar247._2_2_ = auVar247._0_2_;
            auVar247._4_2_ = auVar247._0_2_;
            auVar247._6_2_ = auVar247._0_2_;
            auVar247._8_2_ = auVar247._0_2_;
            auVar247._10_2_ = auVar247._0_2_;
            auVar247._12_2_ = auVar247._0_2_;
            auVar247._14_2_ = auVar247._0_2_;
            auVar247._16_2_ = auVar247._0_2_;
            auVar247._18_2_ = auVar247._0_2_;
            auVar247._20_2_ = auVar247._0_2_;
            auVar247._22_2_ = auVar247._0_2_;
            auVar247._24_2_ = auVar247._0_2_;
            auVar247._26_2_ = auVar247._0_2_;
            auVar247._28_2_ = auVar247._0_2_;
            auVar247._30_2_ = auVar247._0_2_;
            auVar400 = vpblendw_avx2(auVar400,auVar247,0x10);
            auVar248._0_2_ = (undefined2)(uVar34 + 0xd);
            auVar248._2_2_ = auVar248._0_2_;
            auVar248._4_2_ = auVar248._0_2_;
            auVar248._6_2_ = auVar248._0_2_;
            auVar248._8_2_ = auVar248._0_2_;
            auVar248._10_2_ = auVar248._0_2_;
            auVar248._12_2_ = auVar248._0_2_;
            auVar248._14_2_ = auVar248._0_2_;
            auVar248._16_2_ = auVar248._0_2_;
            auVar248._18_2_ = auVar248._0_2_;
            auVar248._20_2_ = auVar248._0_2_;
            auVar248._22_2_ = auVar248._0_2_;
            auVar248._24_2_ = auVar248._0_2_;
            auVar248._26_2_ = auVar248._0_2_;
            auVar248._28_2_ = auVar248._0_2_;
            auVar248._30_2_ = auVar248._0_2_;
            auVar400 = vpblendw_avx2(auVar400,auVar248,0x20);
            auVar249._0_2_ = (undefined2)(uVar34 + 0xe);
            auVar249._2_2_ = auVar249._0_2_;
            auVar249._4_2_ = auVar249._0_2_;
            auVar249._6_2_ = auVar249._0_2_;
            auVar249._8_2_ = auVar249._0_2_;
            auVar249._10_2_ = auVar249._0_2_;
            auVar249._12_2_ = auVar249._0_2_;
            auVar249._14_2_ = auVar249._0_2_;
            auVar249._16_2_ = auVar249._0_2_;
            auVar249._18_2_ = auVar249._0_2_;
            auVar249._20_2_ = auVar249._0_2_;
            auVar249._22_2_ = auVar249._0_2_;
            auVar249._24_2_ = auVar249._0_2_;
            auVar249._26_2_ = auVar249._0_2_;
            auVar249._28_2_ = auVar249._0_2_;
            auVar249._30_2_ = auVar249._0_2_;
            auVar400 = vpblendw_avx2(auVar400,auVar249,0x40);
            auVar250._0_2_ = (undefined2)(uVar34 + 0xf);
            auVar250._2_2_ = auVar250._0_2_;
            auVar250._4_2_ = auVar250._0_2_;
            auVar250._6_2_ = auVar250._0_2_;
            auVar250._8_2_ = auVar250._0_2_;
            auVar250._10_2_ = auVar250._0_2_;
            auVar250._12_2_ = auVar250._0_2_;
            auVar250._14_2_ = auVar250._0_2_;
            auVar250._16_2_ = auVar250._0_2_;
            auVar250._18_2_ = auVar250._0_2_;
            auVar250._20_2_ = auVar250._0_2_;
            auVar250._22_2_ = auVar250._0_2_;
            auVar250._24_2_ = auVar250._0_2_;
            auVar250._26_2_ = auVar250._0_2_;
            auVar250._28_2_ = auVar250._0_2_;
            auVar250._30_2_ = auVar250._0_2_;
            auVar400 = vpblendw_avx2(auVar400,auVar250,0x80);
            auVar400 = vpblendd_avx2(ZEXT1632(auVar179),auVar400,0xf0);
            auVar400 = vpcmpgtw_avx2(auVar400,auVar118);
            auVar400 = vpblendvb_avx2(auVar160,auVar67,auVar400);
            *(undefined1 (*) [32])((long)local_2060 + lVar30) = auVar400;
            uVar38 = uVar38 + dy;
          }
        }
        else {
          auVar96._8_4_ = 0x10;
          auVar96._0_8_ = 0x1000000010;
          auVar96._12_4_ = 0x10;
          auVar96._16_4_ = 0x10;
          auVar96._20_4_ = 0x10;
          auVar96._24_4_ = 0x10;
          auVar96._28_4_ = 0x10;
          auVar291 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
          auVar125._8_2_ = 0x16;
          auVar125._0_8_ = 0x16001600160016;
          auVar125._10_2_ = 0x16;
          auVar125._12_2_ = 0x16;
          auVar125._14_2_ = 0x16;
          auVar125._16_2_ = 0x16;
          auVar125._18_2_ = 0x16;
          auVar125._20_2_ = 0x16;
          auVar125._22_2_ = 0x16;
          auVar125._24_2_ = 0x16;
          auVar125._26_2_ = 0x16;
          auVar125._28_2_ = 0x16;
          auVar125._30_2_ = 0x16;
          uVar38 = dy;
          for (; lVar30 != 0x100; lVar30 = lVar30 + 0x20) {
            uVar34 = (int)uVar38 >> 6;
            if (0x16 < (int)uVar34) goto LAB_002fc138;
            uVar32 = uVar38 >> 1;
            uVar29 = uVar32 & 0x1f;
            auVar146._0_8_ = CONCAT44(uVar32,uVar32) & 0x1f0000001f;
            auVar146._8_4_ = uVar29;
            auVar146._12_4_ = uVar29;
            auVar146._16_4_ = uVar29;
            auVar146._20_4_ = uVar29;
            auVar146._24_4_ = uVar29;
            auVar146._28_4_ = uVar29;
            auVar325 = auVar56;
            if (uVar34 - 0x18 < 0xfffffff7) {
              auVar400 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar34 + 8));
              auVar160 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar34 + 9));
              auVar160 = vpsubd_avx2(auVar160,auVar400);
              auVar400 = vpslld_avx2(auVar400,5);
              auVar160 = vpmulld_avx2(auVar160,auVar146);
              auVar400 = vpaddd_avx2(auVar400,auVar96);
              auVar400 = vpaddd_avx2(auVar160,auVar400);
              auVar400 = vpsrld_avx2(auVar400,5);
              auVar193._0_16_ = ZEXT116(0) * auVar56 + ZEXT116(1) * auVar400._16_16_;
              auVar193._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar56;
              auVar400 = vpackusdw_avx2(auVar400,auVar193);
              auVar325 = auVar400._0_16_;
            }
            auVar400 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (int)uVar34));
            auVar160 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar34 + 1));
            auVar160 = vpsubd_avx2(auVar160,auVar400);
            auVar400 = vpslld_avx2(auVar400,5);
            auVar160 = vpmulld_avx2(auVar160,auVar146);
            auVar400 = vpaddd_avx2(auVar400,auVar96);
            auVar400 = vpaddd_avx2(auVar160,auVar400);
            auVar400 = vpsrld_avx2(auVar400,5);
            auVar400 = vpackusdw_avx2(auVar400,ZEXT1632(auVar400._16_16_));
            auVar147._0_16_ = ZEXT116(0) * auVar325 + ZEXT116(1) * auVar400._0_16_;
            auVar147._16_16_ = ZEXT116(0) * auVar400._16_16_ + ZEXT116(1) * auVar325;
            auVar156._0_2_ = (undefined2)uVar34;
            auVar156._2_2_ = auVar156._0_2_;
            auVar156._4_2_ = auVar156._0_2_;
            auVar156._6_2_ = auVar156._0_2_;
            auVar156._8_2_ = auVar156._0_2_;
            auVar156._10_2_ = auVar156._0_2_;
            auVar156._12_2_ = auVar156._0_2_;
            auVar156._14_2_ = auVar156._0_2_;
            auVar325 = vpaddw_avx(auVar156,auVar291);
            auVar179 = vpslldq_avx(auVar325,2);
            auVar179 = vpblendw_avx(auVar179,ZEXT416(uVar34),1);
            auVar325 = vpsrldq_avx(auVar325,0xe);
            auVar177._0_16_ = ZEXT116(0) * auVar325 + ZEXT116(1) * auVar56;
            auVar177._16_16_ = ZEXT116(0) * auVar67._16_16_ + ZEXT116(1) * auVar325;
            auVar282._0_2_ = (undefined2)(uVar34 + 9);
            auVar282._2_2_ = auVar282._0_2_;
            auVar282._4_2_ = auVar282._0_2_;
            auVar282._6_2_ = auVar282._0_2_;
            auVar282._8_2_ = auVar282._0_2_;
            auVar282._10_2_ = auVar282._0_2_;
            auVar282._12_2_ = auVar282._0_2_;
            auVar282._14_2_ = auVar282._0_2_;
            auVar282._16_2_ = auVar282._0_2_;
            auVar282._18_2_ = auVar282._0_2_;
            auVar282._20_2_ = auVar282._0_2_;
            auVar282._22_2_ = auVar282._0_2_;
            auVar282._24_2_ = auVar282._0_2_;
            auVar282._26_2_ = auVar282._0_2_;
            auVar282._28_2_ = auVar282._0_2_;
            auVar282._30_2_ = auVar282._0_2_;
            auVar400 = vpblendw_avx2(auVar177,auVar282,2);
            auVar283._0_2_ = (undefined2)(uVar34 + 10);
            auVar283._2_2_ = auVar283._0_2_;
            auVar283._4_2_ = auVar283._0_2_;
            auVar283._6_2_ = auVar283._0_2_;
            auVar283._8_2_ = auVar283._0_2_;
            auVar283._10_2_ = auVar283._0_2_;
            auVar283._12_2_ = auVar283._0_2_;
            auVar283._14_2_ = auVar283._0_2_;
            auVar283._16_2_ = auVar283._0_2_;
            auVar283._18_2_ = auVar283._0_2_;
            auVar283._20_2_ = auVar283._0_2_;
            auVar283._22_2_ = auVar283._0_2_;
            auVar283._24_2_ = auVar283._0_2_;
            auVar283._26_2_ = auVar283._0_2_;
            auVar283._28_2_ = auVar283._0_2_;
            auVar283._30_2_ = auVar283._0_2_;
            auVar400 = vpblendw_avx2(auVar400,auVar283,4);
            auVar284._0_2_ = (undefined2)(uVar34 + 0xb);
            auVar284._2_2_ = auVar284._0_2_;
            auVar284._4_2_ = auVar284._0_2_;
            auVar284._6_2_ = auVar284._0_2_;
            auVar284._8_2_ = auVar284._0_2_;
            auVar284._10_2_ = auVar284._0_2_;
            auVar284._12_2_ = auVar284._0_2_;
            auVar284._14_2_ = auVar284._0_2_;
            auVar284._16_2_ = auVar284._0_2_;
            auVar284._18_2_ = auVar284._0_2_;
            auVar284._20_2_ = auVar284._0_2_;
            auVar284._22_2_ = auVar284._0_2_;
            auVar284._24_2_ = auVar284._0_2_;
            auVar284._26_2_ = auVar284._0_2_;
            auVar284._28_2_ = auVar284._0_2_;
            auVar284._30_2_ = auVar284._0_2_;
            auVar400 = vpblendw_avx2(auVar400,auVar284,8);
            auVar285._0_2_ = (undefined2)(uVar34 + 0xc);
            auVar285._2_2_ = auVar285._0_2_;
            auVar285._4_2_ = auVar285._0_2_;
            auVar285._6_2_ = auVar285._0_2_;
            auVar285._8_2_ = auVar285._0_2_;
            auVar285._10_2_ = auVar285._0_2_;
            auVar285._12_2_ = auVar285._0_2_;
            auVar285._14_2_ = auVar285._0_2_;
            auVar285._16_2_ = auVar285._0_2_;
            auVar285._18_2_ = auVar285._0_2_;
            auVar285._20_2_ = auVar285._0_2_;
            auVar285._22_2_ = auVar285._0_2_;
            auVar285._24_2_ = auVar285._0_2_;
            auVar285._26_2_ = auVar285._0_2_;
            auVar285._28_2_ = auVar285._0_2_;
            auVar285._30_2_ = auVar285._0_2_;
            auVar400 = vpblendw_avx2(auVar400,auVar285,0x10);
            auVar286._0_2_ = (undefined2)(uVar34 + 0xd);
            auVar286._2_2_ = auVar286._0_2_;
            auVar286._4_2_ = auVar286._0_2_;
            auVar286._6_2_ = auVar286._0_2_;
            auVar286._8_2_ = auVar286._0_2_;
            auVar286._10_2_ = auVar286._0_2_;
            auVar286._12_2_ = auVar286._0_2_;
            auVar286._14_2_ = auVar286._0_2_;
            auVar286._16_2_ = auVar286._0_2_;
            auVar286._18_2_ = auVar286._0_2_;
            auVar286._20_2_ = auVar286._0_2_;
            auVar286._22_2_ = auVar286._0_2_;
            auVar286._24_2_ = auVar286._0_2_;
            auVar286._26_2_ = auVar286._0_2_;
            auVar286._28_2_ = auVar286._0_2_;
            auVar286._30_2_ = auVar286._0_2_;
            auVar400 = vpblendw_avx2(auVar400,auVar286,0x20);
            auVar287._0_2_ = (undefined2)(uVar34 + 0xe);
            auVar287._2_2_ = auVar287._0_2_;
            auVar287._4_2_ = auVar287._0_2_;
            auVar287._6_2_ = auVar287._0_2_;
            auVar287._8_2_ = auVar287._0_2_;
            auVar287._10_2_ = auVar287._0_2_;
            auVar287._12_2_ = auVar287._0_2_;
            auVar287._14_2_ = auVar287._0_2_;
            auVar287._16_2_ = auVar287._0_2_;
            auVar287._18_2_ = auVar287._0_2_;
            auVar287._20_2_ = auVar287._0_2_;
            auVar287._22_2_ = auVar287._0_2_;
            auVar287._24_2_ = auVar287._0_2_;
            auVar287._26_2_ = auVar287._0_2_;
            auVar287._28_2_ = auVar287._0_2_;
            auVar287._30_2_ = auVar287._0_2_;
            auVar400 = vpblendw_avx2(auVar400,auVar287,0x40);
            auVar288._0_2_ = (undefined2)(uVar34 + 0xf);
            auVar288._2_2_ = auVar288._0_2_;
            auVar288._4_2_ = auVar288._0_2_;
            auVar288._6_2_ = auVar288._0_2_;
            auVar288._8_2_ = auVar288._0_2_;
            auVar288._10_2_ = auVar288._0_2_;
            auVar288._12_2_ = auVar288._0_2_;
            auVar288._14_2_ = auVar288._0_2_;
            auVar288._16_2_ = auVar288._0_2_;
            auVar288._18_2_ = auVar288._0_2_;
            auVar288._20_2_ = auVar288._0_2_;
            auVar288._22_2_ = auVar288._0_2_;
            auVar288._24_2_ = auVar288._0_2_;
            auVar288._26_2_ = auVar288._0_2_;
            auVar288._28_2_ = auVar288._0_2_;
            auVar288._30_2_ = auVar288._0_2_;
            auVar400 = vpblendw_avx2(auVar400,auVar288,0x80);
            auVar400 = vpblendd_avx2(ZEXT1632(auVar179),auVar400,0xf0);
            auVar400 = vpcmpgtw_avx2(auVar400,auVar125);
            auVar400 = vpblendvb_avx2(auVar147,auVar67,auVar400);
            *(undefined1 (*) [32])((long)local_2060 + lVar30) = auVar400;
            uVar38 = uVar38 + dy;
          }
        }
        goto LAB_002fc140;
      default:
        return;
      case 3:
        uVar3 = left[0x2f];
        auVar54._2_2_ = uVar3;
        auVar54._0_2_ = uVar3;
        auVar54._4_2_ = uVar3;
        auVar54._6_2_ = uVar3;
        auVar54._8_2_ = uVar3;
        auVar54._10_2_ = uVar3;
        auVar54._12_2_ = uVar3;
        auVar54._14_2_ = uVar3;
        auVar65._16_2_ = uVar3;
        auVar65._0_16_ = auVar54;
        auVar65._18_2_ = uVar3;
        auVar65._20_2_ = uVar3;
        auVar65._22_2_ = uVar3;
        auVar65._24_2_ = uVar3;
        auVar65._26_2_ = uVar3;
        auVar65._28_2_ = uVar3;
        auVar65._30_2_ = uVar3;
        lVar30 = -0x200;
        uVar27 = 0;
        if (bd < 0xc) {
          auVar87._8_2_ = 0x10;
          auVar87._0_8_ = 0x10001000100010;
          auVar87._10_2_ = 0x10;
          auVar87._12_2_ = 0x10;
          auVar87._14_2_ = 0x10;
          auVar87._16_2_ = 0x10;
          auVar87._18_2_ = 0x10;
          auVar87._20_2_ = 0x10;
          auVar87._22_2_ = 0x10;
          auVar87._24_2_ = 0x10;
          auVar87._26_2_ = 0x10;
          auVar87._28_2_ = 0x10;
          auVar87._30_2_ = 0x10;
          auVar291 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
          auVar116._8_2_ = 0x2e;
          auVar116._0_8_ = 0x2e002e002e002e;
          auVar116._10_2_ = 0x2e;
          auVar116._12_2_ = 0x2e;
          auVar116._14_2_ = 0x2e;
          auVar116._16_2_ = 0x2e;
          auVar116._18_2_ = 0x2e;
          auVar116._20_2_ = 0x2e;
          auVar116._22_2_ = 0x2e;
          auVar116._24_2_ = 0x2e;
          auVar116._26_2_ = 0x2e;
          auVar116._28_2_ = 0x2e;
          auVar116._30_2_ = 0x2e;
          do {
            if (uVar27 == 0x10) break;
            iVar28 = (int)uVar43 >> 6;
            lVar33 = lVar30;
            if (iVar28 < 0x2f) {
              uVar6 = (ushort)(uVar43 >> 1);
              uVar387 = uVar6 & 0x1f;
              auVar136._0_8_ =
                   CONCAT26(uVar6,CONCAT24(uVar6,CONCAT22(uVar6,uVar6))) & 0x1f001f001f001f;
              auVar136._8_2_ = uVar387;
              auVar136._10_2_ = uVar387;
              auVar136._12_2_ = uVar387;
              auVar136._14_2_ = uVar387;
              auVar136._16_2_ = uVar387;
              auVar136._18_2_ = uVar387;
              auVar136._20_2_ = uVar387;
              auVar136._22_2_ = uVar387;
              auVar136._24_2_ = uVar387;
              auVar136._26_2_ = uVar387;
              auVar136._28_2_ = uVar387;
              auVar136._30_2_ = uVar387;
              lVar33 = (long)iVar28;
              for (uVar41 = 0; uVar41 < 0x20; uVar41 = uVar41 + 0x10) {
                auVar400 = auVar65;
                if ((long)(lVar33 + uVar41) < 0x2f) {
                  auVar400 = vpsubw_avx2(*(undefined1 (*) [32])(left + lVar33 + uVar41 + 1),
                                         *(undefined1 (*) [32])(left + lVar33 + uVar41));
                  auVar160 = vpmullw_avx2(auVar400,auVar136);
                  auVar400 = vpsllw_avx2(*(undefined1 (*) [32])(left + lVar33 + uVar41),5);
                  auVar400 = vpaddw_avx2(auVar400,auVar87);
                  auVar400 = vpaddw_avx2(auVar160,auVar400);
                  auVar160 = vpsrlw_avx2(auVar400,5);
                  iVar40 = (int)uVar41;
                  auVar181._0_2_ = (undefined2)(iVar28 + iVar40);
                  auVar181._2_2_ = auVar181._0_2_;
                  auVar181._4_2_ = auVar181._0_2_;
                  auVar181._6_2_ = auVar181._0_2_;
                  auVar181._8_2_ = auVar181._0_2_;
                  auVar181._10_2_ = auVar181._0_2_;
                  auVar181._12_2_ = auVar181._0_2_;
                  auVar181._14_2_ = auVar181._0_2_;
                  auVar325 = vpaddw_avx(auVar181,auVar291);
                  auVar179 = vpslldq_avx(auVar325,2);
                  auVar179 = vpblendw_avx(auVar179,ZEXT416((uint)(iVar28 + iVar40)),1);
                  auVar325 = vpsrldq_avx(auVar325,0xe);
                  auVar236._0_16_ = ZEXT116(0) * auVar325 + ZEXT116(1) * auVar54;
                  auVar236._16_16_ = ZEXT116(0) * auVar65._16_16_ + ZEXT116(1) * auVar325;
                  auVar314._0_2_ = (undefined2)(iVar28 + 9 + iVar40);
                  auVar314._2_2_ = auVar314._0_2_;
                  auVar314._4_2_ = auVar314._0_2_;
                  auVar314._6_2_ = auVar314._0_2_;
                  auVar314._8_2_ = auVar314._0_2_;
                  auVar314._10_2_ = auVar314._0_2_;
                  auVar314._12_2_ = auVar314._0_2_;
                  auVar314._14_2_ = auVar314._0_2_;
                  auVar314._16_2_ = auVar314._0_2_;
                  auVar314._18_2_ = auVar314._0_2_;
                  auVar314._20_2_ = auVar314._0_2_;
                  auVar314._22_2_ = auVar314._0_2_;
                  auVar314._24_2_ = auVar314._0_2_;
                  auVar314._26_2_ = auVar314._0_2_;
                  auVar314._28_2_ = auVar314._0_2_;
                  auVar314._30_2_ = auVar314._0_2_;
                  auVar400 = vpblendw_avx2(auVar236,auVar314,2);
                  auVar315._0_2_ = (undefined2)(iVar28 + 10 + iVar40);
                  auVar315._2_2_ = auVar315._0_2_;
                  auVar315._4_2_ = auVar315._0_2_;
                  auVar315._6_2_ = auVar315._0_2_;
                  auVar315._8_2_ = auVar315._0_2_;
                  auVar315._10_2_ = auVar315._0_2_;
                  auVar315._12_2_ = auVar315._0_2_;
                  auVar315._14_2_ = auVar315._0_2_;
                  auVar315._16_2_ = auVar315._0_2_;
                  auVar315._18_2_ = auVar315._0_2_;
                  auVar315._20_2_ = auVar315._0_2_;
                  auVar315._22_2_ = auVar315._0_2_;
                  auVar315._24_2_ = auVar315._0_2_;
                  auVar315._26_2_ = auVar315._0_2_;
                  auVar315._28_2_ = auVar315._0_2_;
                  auVar315._30_2_ = auVar315._0_2_;
                  auVar400 = vpblendw_avx2(auVar400,auVar315,4);
                  auVar316._0_2_ = (undefined2)(iVar28 + 0xb + iVar40);
                  auVar316._2_2_ = auVar316._0_2_;
                  auVar316._4_2_ = auVar316._0_2_;
                  auVar316._6_2_ = auVar316._0_2_;
                  auVar316._8_2_ = auVar316._0_2_;
                  auVar316._10_2_ = auVar316._0_2_;
                  auVar316._12_2_ = auVar316._0_2_;
                  auVar316._14_2_ = auVar316._0_2_;
                  auVar316._16_2_ = auVar316._0_2_;
                  auVar316._18_2_ = auVar316._0_2_;
                  auVar316._20_2_ = auVar316._0_2_;
                  auVar316._22_2_ = auVar316._0_2_;
                  auVar316._24_2_ = auVar316._0_2_;
                  auVar316._26_2_ = auVar316._0_2_;
                  auVar316._28_2_ = auVar316._0_2_;
                  auVar316._30_2_ = auVar316._0_2_;
                  auVar400 = vpblendw_avx2(auVar400,auVar316,8);
                  auVar317._0_2_ = (undefined2)(iVar28 + 0xc + iVar40);
                  auVar317._2_2_ = auVar317._0_2_;
                  auVar317._4_2_ = auVar317._0_2_;
                  auVar317._6_2_ = auVar317._0_2_;
                  auVar317._8_2_ = auVar317._0_2_;
                  auVar317._10_2_ = auVar317._0_2_;
                  auVar317._12_2_ = auVar317._0_2_;
                  auVar317._14_2_ = auVar317._0_2_;
                  auVar317._16_2_ = auVar317._0_2_;
                  auVar317._18_2_ = auVar317._0_2_;
                  auVar317._20_2_ = auVar317._0_2_;
                  auVar317._22_2_ = auVar317._0_2_;
                  auVar317._24_2_ = auVar317._0_2_;
                  auVar317._26_2_ = auVar317._0_2_;
                  auVar317._28_2_ = auVar317._0_2_;
                  auVar317._30_2_ = auVar317._0_2_;
                  auVar400 = vpblendw_avx2(auVar400,auVar317,0x10);
                  auVar318._0_2_ = (undefined2)(iVar28 + 0xd + iVar40);
                  auVar318._2_2_ = auVar318._0_2_;
                  auVar318._4_2_ = auVar318._0_2_;
                  auVar318._6_2_ = auVar318._0_2_;
                  auVar318._8_2_ = auVar318._0_2_;
                  auVar318._10_2_ = auVar318._0_2_;
                  auVar318._12_2_ = auVar318._0_2_;
                  auVar318._14_2_ = auVar318._0_2_;
                  auVar318._16_2_ = auVar318._0_2_;
                  auVar318._18_2_ = auVar318._0_2_;
                  auVar318._20_2_ = auVar318._0_2_;
                  auVar318._22_2_ = auVar318._0_2_;
                  auVar318._24_2_ = auVar318._0_2_;
                  auVar318._26_2_ = auVar318._0_2_;
                  auVar318._28_2_ = auVar318._0_2_;
                  auVar318._30_2_ = auVar318._0_2_;
                  auVar400 = vpblendw_avx2(auVar400,auVar318,0x20);
                  auVar319._0_2_ = (undefined2)(iVar28 + 0xe + iVar40);
                  auVar319._2_2_ = auVar319._0_2_;
                  auVar319._4_2_ = auVar319._0_2_;
                  auVar319._6_2_ = auVar319._0_2_;
                  auVar319._8_2_ = auVar319._0_2_;
                  auVar319._10_2_ = auVar319._0_2_;
                  auVar319._12_2_ = auVar319._0_2_;
                  auVar319._14_2_ = auVar319._0_2_;
                  auVar319._16_2_ = auVar319._0_2_;
                  auVar319._18_2_ = auVar319._0_2_;
                  auVar319._20_2_ = auVar319._0_2_;
                  auVar319._22_2_ = auVar319._0_2_;
                  auVar319._24_2_ = auVar319._0_2_;
                  auVar319._26_2_ = auVar319._0_2_;
                  auVar319._28_2_ = auVar319._0_2_;
                  auVar319._30_2_ = auVar319._0_2_;
                  auVar400 = vpblendw_avx2(auVar400,auVar319,0x40);
                  auVar320._0_2_ = (undefined2)(iVar28 + 0xf + iVar40);
                  auVar320._2_2_ = auVar320._0_2_;
                  auVar320._4_2_ = auVar320._0_2_;
                  auVar320._6_2_ = auVar320._0_2_;
                  auVar320._8_2_ = auVar320._0_2_;
                  auVar320._10_2_ = auVar320._0_2_;
                  auVar320._12_2_ = auVar320._0_2_;
                  auVar320._14_2_ = auVar320._0_2_;
                  auVar320._16_2_ = auVar320._0_2_;
                  auVar320._18_2_ = auVar320._0_2_;
                  auVar320._20_2_ = auVar320._0_2_;
                  auVar320._22_2_ = auVar320._0_2_;
                  auVar320._24_2_ = auVar320._0_2_;
                  auVar320._26_2_ = auVar320._0_2_;
                  auVar320._28_2_ = auVar320._0_2_;
                  auVar320._30_2_ = auVar320._0_2_;
                  auVar400 = vpblendw_avx2(auVar400,auVar320,0x80);
                  auVar400 = vpblendd_avx2(ZEXT1632(auVar179),auVar400,0xf0);
                  auVar400 = vpcmpgtw_avx2(auVar400,auVar116);
                  auVar400 = vpblendvb_avx2(auVar160,auVar65,auVar400);
                }
                uVar35 = uVar27 | 0x10;
                if (uVar41 == 0) {
                  uVar35 = uVar27;
                }
                *(undefined1 (*) [32])(local_2060 + uVar35 * 4) = auVar400;
              }
              uVar43 = (ulong)(uint)((int)uVar43 + dy);
            }
            else {
              for (; lVar33 != 0; lVar33 = lVar33 + 0x20) {
                *(undefined1 (*) [32])((long)local_1e60 + lVar33) = auVar65;
                *(undefined1 (*) [32])((long)local_1c60 + lVar33) = auVar65;
              }
            }
            uVar27 = uVar27 + 1;
            lVar30 = lVar30 + 0x20;
          } while (iVar28 < 0x2f);
        }
        else {
          auVar93._8_4_ = 0x10;
          auVar93._0_8_ = 0x1000000010;
          auVar93._12_4_ = 0x10;
          auVar93._16_4_ = 0x10;
          auVar93._20_4_ = 0x10;
          auVar93._24_4_ = 0x10;
          auVar93._28_4_ = 0x10;
          auVar291 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
          auVar122._8_2_ = 0x2e;
          auVar122._0_8_ = 0x2e002e002e002e;
          auVar122._10_2_ = 0x2e;
          auVar122._12_2_ = 0x2e;
          auVar122._14_2_ = 0x2e;
          auVar122._16_2_ = 0x2e;
          auVar122._18_2_ = 0x2e;
          auVar122._20_2_ = 0x2e;
          auVar122._22_2_ = 0x2e;
          auVar122._24_2_ = 0x2e;
          auVar122._26_2_ = 0x2e;
          auVar122._28_2_ = 0x2e;
          auVar122._30_2_ = 0x2e;
          auVar400 = vpmovsxbw_avx2(_DAT_0046f570);
          do {
            if (uVar27 == 0x10) break;
            uVar38 = (int)uVar43 >> 6;
            lVar33 = lVar30;
            if ((int)uVar38 < 0x2f) {
              uVar34 = (uint)(uVar43 >> 1);
              uVar32 = uVar34 & 0x1f801f;
              auVar174._0_8_ = CONCAT44(uVar34,uVar34) & 0x1f801f001f801f;
              auVar174._8_4_ = uVar32;
              auVar174._12_4_ = uVar32;
              auVar174._16_4_ = uVar32;
              auVar174._20_4_ = uVar32;
              auVar174._24_4_ = uVar32;
              auVar174._28_4_ = uVar32;
              auVar325 = auVar54;
              if (uVar38 - 0x30 < 0xfffffff7) {
                auVar160 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar38 + 8));
                auVar135 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar38 + 9));
                auVar135 = vpsubd_avx2(auVar135,auVar160);
                auVar160 = vpslld_avx2(auVar160,5);
                auVar135 = vpmulld_avx2(auVar135,auVar174);
                auVar160 = vpaddd_avx2(auVar160,auVar93);
                auVar160 = vpaddd_avx2(auVar135,auVar160);
                auVar160 = vpsrld_avx2(auVar160,5);
                auVar270._0_16_ = ZEXT116(0) * auVar54 + ZEXT116(1) * auVar160._16_16_;
                auVar270._16_16_ =
                     ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar54;
                auVar160 = vpackusdw_avx2(auVar160,auVar270);
                auVar325 = auVar160._0_16_;
              }
              auVar160 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (int)uVar38));
              auVar135 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar38 + 1));
              auVar135 = vpsubd_avx2(auVar135,auVar160);
              auVar160 = vpslld_avx2(auVar160,5);
              auVar135 = vpmulld_avx2(auVar135,auVar174);
              auVar160 = vpaddd_avx2(auVar160,auVar93);
              auVar160 = vpaddd_avx2(auVar135,auVar160);
              auVar160 = vpsrld_avx2(auVar160,5);
              auVar160 = vpackusdw_avx2(auVar160,ZEXT1632(auVar160._16_16_));
              auVar296._0_2_ = (undefined2)uVar38;
              auVar296._2_2_ = auVar296._0_2_;
              auVar296._4_2_ = auVar296._0_2_;
              auVar296._6_2_ = auVar296._0_2_;
              auVar296._8_2_ = auVar296._0_2_;
              auVar296._10_2_ = auVar296._0_2_;
              auVar296._12_2_ = auVar296._0_2_;
              auVar296._14_2_ = auVar296._0_2_;
              auVar179 = vpaddw_avx(auVar296,auVar291);
              auVar329 = vpslldq_avx(auVar179,2);
              auVar329 = vpblendw_avx(auVar329,ZEXT416(uVar38),1);
              auVar179 = vpsrldq_avx(auVar179,0xe);
              auVar323._0_16_ = ZEXT116(0) * auVar179 + ZEXT116(1) * auVar54;
              auVar323._16_16_ = ZEXT116(0) * auVar65._16_16_ + ZEXT116(1) * auVar179;
              auVar372._0_2_ = (undefined2)(uVar38 + 9);
              auVar372._2_2_ = auVar372._0_2_;
              auVar372._4_2_ = auVar372._0_2_;
              auVar372._6_2_ = auVar372._0_2_;
              auVar372._8_2_ = auVar372._0_2_;
              auVar372._10_2_ = auVar372._0_2_;
              auVar372._12_2_ = auVar372._0_2_;
              auVar372._14_2_ = auVar372._0_2_;
              auVar372._16_2_ = auVar372._0_2_;
              auVar372._18_2_ = auVar372._0_2_;
              auVar372._20_2_ = auVar372._0_2_;
              auVar372._22_2_ = auVar372._0_2_;
              auVar372._24_2_ = auVar372._0_2_;
              auVar372._26_2_ = auVar372._0_2_;
              auVar372._28_2_ = auVar372._0_2_;
              auVar372._30_2_ = auVar372._0_2_;
              auVar135 = vpblendw_avx2(auVar323,auVar372,2);
              auVar373._0_2_ = (undefined2)(uVar38 + 10);
              auVar373._2_2_ = auVar373._0_2_;
              auVar373._4_2_ = auVar373._0_2_;
              auVar373._6_2_ = auVar373._0_2_;
              auVar373._8_2_ = auVar373._0_2_;
              auVar373._10_2_ = auVar373._0_2_;
              auVar373._12_2_ = auVar373._0_2_;
              auVar373._14_2_ = auVar373._0_2_;
              auVar373._16_2_ = auVar373._0_2_;
              auVar373._18_2_ = auVar373._0_2_;
              auVar373._20_2_ = auVar373._0_2_;
              auVar373._22_2_ = auVar373._0_2_;
              auVar373._24_2_ = auVar373._0_2_;
              auVar373._26_2_ = auVar373._0_2_;
              auVar373._28_2_ = auVar373._0_2_;
              auVar373._30_2_ = auVar373._0_2_;
              auVar135 = vpblendw_avx2(auVar135,auVar373,4);
              auVar374._0_2_ = (undefined2)(uVar38 + 0xb);
              auVar374._2_2_ = auVar374._0_2_;
              auVar374._4_2_ = auVar374._0_2_;
              auVar374._6_2_ = auVar374._0_2_;
              auVar374._8_2_ = auVar374._0_2_;
              auVar374._10_2_ = auVar374._0_2_;
              auVar374._12_2_ = auVar374._0_2_;
              auVar374._14_2_ = auVar374._0_2_;
              auVar374._16_2_ = auVar374._0_2_;
              auVar374._18_2_ = auVar374._0_2_;
              auVar374._20_2_ = auVar374._0_2_;
              auVar374._22_2_ = auVar374._0_2_;
              auVar374._24_2_ = auVar374._0_2_;
              auVar374._26_2_ = auVar374._0_2_;
              auVar374._28_2_ = auVar374._0_2_;
              auVar374._30_2_ = auVar374._0_2_;
              auVar135 = vpblendw_avx2(auVar135,auVar374,8);
              auVar375._0_2_ = (undefined2)(uVar38 + 0xc);
              auVar375._2_2_ = auVar375._0_2_;
              auVar375._4_2_ = auVar375._0_2_;
              auVar375._6_2_ = auVar375._0_2_;
              auVar375._8_2_ = auVar375._0_2_;
              auVar375._10_2_ = auVar375._0_2_;
              auVar375._12_2_ = auVar375._0_2_;
              auVar375._14_2_ = auVar375._0_2_;
              auVar375._16_2_ = auVar375._0_2_;
              auVar375._18_2_ = auVar375._0_2_;
              auVar375._20_2_ = auVar375._0_2_;
              auVar375._22_2_ = auVar375._0_2_;
              auVar375._24_2_ = auVar375._0_2_;
              auVar375._26_2_ = auVar375._0_2_;
              auVar375._28_2_ = auVar375._0_2_;
              auVar375._30_2_ = auVar375._0_2_;
              auVar135 = vpblendw_avx2(auVar135,auVar375,0x10);
              auVar376._0_2_ = (undefined2)(uVar38 + 0xd);
              auVar376._2_2_ = auVar376._0_2_;
              auVar376._4_2_ = auVar376._0_2_;
              auVar376._6_2_ = auVar376._0_2_;
              auVar376._8_2_ = auVar376._0_2_;
              auVar376._10_2_ = auVar376._0_2_;
              auVar376._12_2_ = auVar376._0_2_;
              auVar376._14_2_ = auVar376._0_2_;
              auVar376._16_2_ = auVar376._0_2_;
              auVar376._18_2_ = auVar376._0_2_;
              auVar376._20_2_ = auVar376._0_2_;
              auVar376._22_2_ = auVar376._0_2_;
              auVar376._24_2_ = auVar376._0_2_;
              auVar376._26_2_ = auVar376._0_2_;
              auVar376._28_2_ = auVar376._0_2_;
              auVar376._30_2_ = auVar376._0_2_;
              auVar135 = vpblendw_avx2(auVar135,auVar376,0x20);
              auVar377._0_2_ = (undefined2)(uVar38 + 0xe);
              auVar377._2_2_ = auVar377._0_2_;
              auVar377._4_2_ = auVar377._0_2_;
              auVar377._6_2_ = auVar377._0_2_;
              auVar377._8_2_ = auVar377._0_2_;
              auVar377._10_2_ = auVar377._0_2_;
              auVar377._12_2_ = auVar377._0_2_;
              auVar377._14_2_ = auVar377._0_2_;
              auVar377._16_2_ = auVar377._0_2_;
              auVar377._18_2_ = auVar377._0_2_;
              auVar377._20_2_ = auVar377._0_2_;
              auVar377._22_2_ = auVar377._0_2_;
              auVar377._24_2_ = auVar377._0_2_;
              auVar377._26_2_ = auVar377._0_2_;
              auVar377._28_2_ = auVar377._0_2_;
              auVar377._30_2_ = auVar377._0_2_;
              auVar135 = vpblendw_avx2(auVar135,auVar377,0x40);
              auVar378._0_2_ = (undefined2)(uVar38 + 0xf);
              auVar378._2_2_ = auVar378._0_2_;
              auVar378._4_2_ = auVar378._0_2_;
              auVar378._6_2_ = auVar378._0_2_;
              auVar378._8_2_ = auVar378._0_2_;
              auVar378._10_2_ = auVar378._0_2_;
              auVar378._12_2_ = auVar378._0_2_;
              auVar378._14_2_ = auVar378._0_2_;
              auVar378._16_2_ = auVar378._0_2_;
              auVar378._18_2_ = auVar378._0_2_;
              auVar378._20_2_ = auVar378._0_2_;
              auVar378._22_2_ = auVar378._0_2_;
              auVar378._24_2_ = auVar378._0_2_;
              auVar378._26_2_ = auVar378._0_2_;
              auVar378._28_2_ = auVar378._0_2_;
              auVar378._30_2_ = auVar378._0_2_;
              auVar135 = vpblendw_avx2(auVar135,auVar378,0x80);
              auVar135 = vpblendd_avx2(ZEXT1632(auVar329),auVar135,0xf0);
              auVar135 = vpcmpgtw_avx2(auVar135,auVar122);
              auVar190._0_16_ = ZEXT116(0) * auVar325 + ZEXT116(1) * auVar160._0_16_;
              auVar190._16_16_ = ZEXT116(0) * auVar160._16_16_ + ZEXT116(1) * auVar325;
              auVar160 = vpblendvb_avx2(auVar190,auVar65,auVar135);
              *(undefined1 (*) [32])(local_2060 + uVar27 * 4) = auVar160;
              auVar160 = auVar65;
              if ((int)uVar38 < 0x1f) {
                auVar325 = auVar54;
                if (uVar38 - 0x20 < 0xfffffff7) {
                  auVar160 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar38 + 0x18))
                  ;
                  auVar135 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar38 + 0x19))
                  ;
                  auVar135 = vpsubd_avx2(auVar135,auVar160);
                  auVar160 = vpslld_avx2(auVar160,5);
                  auVar135 = vpmulld_avx2(auVar135,auVar174);
                  auVar160 = vpaddd_avx2(auVar160,auVar93);
                  auVar160 = vpaddd_avx2(auVar135,auVar160);
                  auVar160 = vpsrld_avx2(auVar160,5);
                  auVar271._0_16_ = ZEXT116(0) * auVar54 + ZEXT116(1) * auVar160._16_16_;
                  auVar271._16_16_ =
                       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar54;
                  auVar160 = vpackusdw_avx2(auVar160,auVar271);
                  auVar325 = auVar160._0_16_;
                }
                auVar160 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar38 + 0x10));
                auVar135 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar38 + 0x11));
                auVar135 = vpsubd_avx2(auVar135,auVar160);
                auVar160 = vpslld_avx2(auVar160,5);
                auVar135 = vpmulld_avx2(auVar135,auVar174);
                auVar160 = vpaddd_avx2(auVar160,auVar93);
                auVar160 = vpaddd_avx2(auVar135,auVar160);
                auVar160 = vpsrld_avx2(auVar160,5);
                auVar160 = vpackusdw_avx2(auVar160,ZEXT1632(auVar160._16_16_));
                auVar272._2_2_ = auVar296._0_2_;
                auVar272._0_2_ = auVar296._0_2_;
                auVar272._4_2_ = auVar296._0_2_;
                auVar272._6_2_ = auVar296._0_2_;
                auVar272._8_2_ = auVar296._0_2_;
                auVar272._10_2_ = auVar296._0_2_;
                auVar272._12_2_ = auVar296._0_2_;
                auVar272._14_2_ = auVar296._0_2_;
                auVar272._16_2_ = auVar296._0_2_;
                auVar272._18_2_ = auVar296._0_2_;
                auVar272._20_2_ = auVar296._0_2_;
                auVar272._22_2_ = auVar296._0_2_;
                auVar272._24_2_ = auVar296._0_2_;
                auVar272._26_2_ = auVar296._0_2_;
                auVar272._28_2_ = auVar296._0_2_;
                auVar272._30_2_ = auVar296._0_2_;
                auVar135 = vpaddw_avx2(auVar272,auVar400);
                auVar135 = vpcmpgtw_avx2(auVar135,auVar122);
                auVar175._0_16_ = ZEXT116(0) * auVar325 + ZEXT116(1) * auVar160._0_16_;
                auVar175._16_16_ = ZEXT116(0) * auVar160._16_16_ + ZEXT116(1) * auVar325;
                auVar160 = vpblendvb_avx2(auVar175,auVar65,auVar135);
              }
              *(undefined1 (*) [32])(local_1e60 + uVar27 * 4) = auVar160;
              uVar43 = (ulong)(uint)((int)uVar43 + dy);
            }
            else {
              for (; lVar33 != 0; lVar33 = lVar33 + 0x20) {
                *(undefined1 (*) [32])((long)local_1e60 + lVar33) = auVar65;
                *(undefined1 (*) [32])((long)local_1c60 + lVar33) = auVar65;
              }
            }
            uVar27 = uVar27 + 1;
            lVar30 = lVar30 + 0x20;
          } while ((int)uVar38 < 0x2f);
        }
        palVar44 = (__m256i *)local_2460;
        palVar42 = (__m256i *)local_2060;
        for (uVar43 = 0; uVar43 < 0x20; uVar43 = uVar43 + 8) {
          highbd_transpose8x16_16x8_avx2(palVar42,palVar44);
          palVar44 = palVar44 + 8;
          palVar42 = palVar42 + 8;
        }
        pauVar24 = (undefined1 (*) [16])(dst + 8);
        pauVar25 = (undefined1 (*) [32])(dst + stride * 8);
        puVar31 = local_2460;
        for (uVar43 = 0; uVar43 < 0x20; uVar43 = uVar43 + 0x10) {
          pauVar36 = (undefined1 (*) [16])dst;
          for (lVar30 = 0; lVar30 != 0x100; lVar30 = lVar30 + 0x20) {
            *pauVar36 = SUB3216(*(undefined1 (*) [32])(puVar31 + lVar30),0);
            pauVar36 = (undefined1 (*) [16])((long)*pauVar36 + stride * 2);
          }
          pauVar36 = pauVar24;
          for (lVar30 = 0x100; lVar30 != 0x200; lVar30 = lVar30 + 0x20) {
            *pauVar36 = SUB3216(*(undefined1 (*) [32])(puVar31 + lVar30),0);
            pauVar36 = (undefined1 (*) [16])((long)*pauVar36 + stride * 2);
          }
          pauVar37 = pauVar25;
          for (lVar30 = 0x100; lVar30 != 0x200; lVar30 = lVar30 + 0x20) {
            auVar400 = vpblendd_avx2(ZEXT1632(*(undefined1 (*) [16])(puVar31 + lVar30 + -0xf0)),
                                     *(undefined1 (*) [32])(puVar31 + lVar30),0xf0);
            *pauVar37 = auVar400;
            pauVar37 = (undefined1 (*) [32])(*pauVar37 + stride * 2);
          }
          puVar31 = puVar31 + 0x200;
          dst = (uint16_t *)((long)dst + stride * 2 * 0x10);
          pauVar24 = pauVar24 + stride * 2;
          pauVar25 = pauVar25 + stride;
        }
        return;
      case 7:
        if (bd < 0xc) {
          highbd_dr_prediction_z1_64xN_avx2(0x20,(uint16_t *)local_2060,0x40,left,dy,iVar28);
        }
        else {
          highbd_dr_prediction_32bit_z1_64xN_avx2(0x20,(uint16_t *)local_2060,0x40,left,dy,iVar28);
        }
        iVar40 = 0x20;
      }
    }
    else {
      if (bw != 0x10) {
        if (bw == 8) {
          uVar3 = left[0x27];
          auVar53._2_2_ = uVar3;
          auVar53._0_2_ = uVar3;
          auVar53._4_2_ = uVar3;
          auVar53._6_2_ = uVar3;
          auVar53._8_2_ = uVar3;
          auVar53._10_2_ = uVar3;
          auVar53._12_2_ = uVar3;
          auVar53._14_2_ = uVar3;
          auVar63._16_2_ = uVar3;
          auVar63._0_16_ = auVar53;
          auVar63._18_2_ = uVar3;
          auVar63._20_2_ = uVar3;
          auVar63._22_2_ = uVar3;
          auVar63._24_2_ = uVar3;
          auVar63._26_2_ = uVar3;
          auVar63._28_2_ = uVar3;
          auVar63._30_2_ = uVar3;
          lVar30 = -0x100;
          uVar27 = 0;
          if (bd < 0xc) {
            auVar85._8_2_ = 0x10;
            auVar85._0_8_ = 0x10001000100010;
            auVar85._10_2_ = 0x10;
            auVar85._12_2_ = 0x10;
            auVar85._14_2_ = 0x10;
            auVar85._16_2_ = 0x10;
            auVar85._18_2_ = 0x10;
            auVar85._20_2_ = 0x10;
            auVar85._22_2_ = 0x10;
            auVar85._24_2_ = 0x10;
            auVar85._26_2_ = 0x10;
            auVar85._28_2_ = 0x10;
            auVar85._30_2_ = 0x10;
            auVar291 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
            auVar114._8_2_ = 0x26;
            auVar114._0_8_ = 0x26002600260026;
            auVar114._10_2_ = 0x26;
            auVar114._12_2_ = 0x26;
            auVar114._14_2_ = 0x26;
            auVar114._16_2_ = 0x26;
            auVar114._18_2_ = 0x26;
            auVar114._20_2_ = 0x26;
            auVar114._22_2_ = 0x26;
            auVar114._24_2_ = 0x26;
            auVar114._26_2_ = 0x26;
            auVar114._28_2_ = 0x26;
            auVar114._30_2_ = 0x26;
            do {
              if (uVar27 == 8) break;
              iVar28 = (int)uVar43 >> 6;
              lVar33 = lVar30;
              if (iVar28 < 0x27) {
                uVar6 = (ushort)(uVar43 >> 1);
                uVar387 = uVar6 & 0x1f;
                auVar133._0_8_ =
                     CONCAT26(uVar6,CONCAT24(uVar6,CONCAT22(uVar6,uVar6))) & 0x1f001f001f001f;
                auVar133._8_2_ = uVar387;
                auVar133._10_2_ = uVar387;
                auVar133._12_2_ = uVar387;
                auVar133._14_2_ = uVar387;
                auVar133._16_2_ = uVar387;
                auVar133._18_2_ = uVar387;
                auVar133._20_2_ = uVar387;
                auVar133._22_2_ = uVar387;
                auVar133._24_2_ = uVar387;
                auVar133._26_2_ = uVar387;
                auVar133._28_2_ = uVar387;
                auVar133._30_2_ = uVar387;
                lVar33 = (long)iVar28;
                for (uVar41 = 0; uVar41 < 0x20; uVar41 = uVar41 + 0x10) {
                  auVar400 = auVar63;
                  if ((long)(lVar33 + uVar41) < 0x27) {
                    auVar400 = vpsubw_avx2(*(undefined1 (*) [32])(left + lVar33 + uVar41 + 1),
                                           *(undefined1 (*) [32])(left + lVar33 + uVar41));
                    auVar160 = vpmullw_avx2(auVar400,auVar133);
                    auVar400 = vpsllw_avx2(*(undefined1 (*) [32])(left + lVar33 + uVar41),5);
                    auVar400 = vpaddw_avx2(auVar400,auVar85);
                    auVar400 = vpaddw_avx2(auVar160,auVar400);
                    auVar160 = vpsrlw_avx2(auVar400,5);
                    iVar40 = (int)uVar41;
                    auVar180._0_2_ = (undefined2)(iVar28 + iVar40);
                    auVar180._2_2_ = auVar180._0_2_;
                    auVar180._4_2_ = auVar180._0_2_;
                    auVar180._6_2_ = auVar180._0_2_;
                    auVar180._8_2_ = auVar180._0_2_;
                    auVar180._10_2_ = auVar180._0_2_;
                    auVar180._12_2_ = auVar180._0_2_;
                    auVar180._14_2_ = auVar180._0_2_;
                    auVar325 = vpaddw_avx(auVar180,auVar291);
                    auVar179 = vpslldq_avx(auVar325,2);
                    auVar179 = vpblendw_avx(auVar179,ZEXT416((uint)(iVar28 + iVar40)),1);
                    auVar325 = vpsrldq_avx(auVar325,0xe);
                    auVar228._0_16_ = ZEXT116(0) * auVar325 + ZEXT116(1) * auVar53;
                    auVar228._16_16_ = ZEXT116(0) * auVar63._16_16_ + ZEXT116(1) * auVar325;
                    auVar307._0_2_ = (undefined2)(iVar28 + 9 + iVar40);
                    auVar307._2_2_ = auVar307._0_2_;
                    auVar307._4_2_ = auVar307._0_2_;
                    auVar307._6_2_ = auVar307._0_2_;
                    auVar307._8_2_ = auVar307._0_2_;
                    auVar307._10_2_ = auVar307._0_2_;
                    auVar307._12_2_ = auVar307._0_2_;
                    auVar307._14_2_ = auVar307._0_2_;
                    auVar307._16_2_ = auVar307._0_2_;
                    auVar307._18_2_ = auVar307._0_2_;
                    auVar307._20_2_ = auVar307._0_2_;
                    auVar307._22_2_ = auVar307._0_2_;
                    auVar307._24_2_ = auVar307._0_2_;
                    auVar307._26_2_ = auVar307._0_2_;
                    auVar307._28_2_ = auVar307._0_2_;
                    auVar307._30_2_ = auVar307._0_2_;
                    auVar400 = vpblendw_avx2(auVar228,auVar307,2);
                    auVar308._0_2_ = (undefined2)(iVar28 + 10 + iVar40);
                    auVar308._2_2_ = auVar308._0_2_;
                    auVar308._4_2_ = auVar308._0_2_;
                    auVar308._6_2_ = auVar308._0_2_;
                    auVar308._8_2_ = auVar308._0_2_;
                    auVar308._10_2_ = auVar308._0_2_;
                    auVar308._12_2_ = auVar308._0_2_;
                    auVar308._14_2_ = auVar308._0_2_;
                    auVar308._16_2_ = auVar308._0_2_;
                    auVar308._18_2_ = auVar308._0_2_;
                    auVar308._20_2_ = auVar308._0_2_;
                    auVar308._22_2_ = auVar308._0_2_;
                    auVar308._24_2_ = auVar308._0_2_;
                    auVar308._26_2_ = auVar308._0_2_;
                    auVar308._28_2_ = auVar308._0_2_;
                    auVar308._30_2_ = auVar308._0_2_;
                    auVar400 = vpblendw_avx2(auVar400,auVar308,4);
                    auVar309._0_2_ = (undefined2)(iVar28 + 0xb + iVar40);
                    auVar309._2_2_ = auVar309._0_2_;
                    auVar309._4_2_ = auVar309._0_2_;
                    auVar309._6_2_ = auVar309._0_2_;
                    auVar309._8_2_ = auVar309._0_2_;
                    auVar309._10_2_ = auVar309._0_2_;
                    auVar309._12_2_ = auVar309._0_2_;
                    auVar309._14_2_ = auVar309._0_2_;
                    auVar309._16_2_ = auVar309._0_2_;
                    auVar309._18_2_ = auVar309._0_2_;
                    auVar309._20_2_ = auVar309._0_2_;
                    auVar309._22_2_ = auVar309._0_2_;
                    auVar309._24_2_ = auVar309._0_2_;
                    auVar309._26_2_ = auVar309._0_2_;
                    auVar309._28_2_ = auVar309._0_2_;
                    auVar309._30_2_ = auVar309._0_2_;
                    auVar400 = vpblendw_avx2(auVar400,auVar309,8);
                    auVar310._0_2_ = (undefined2)(iVar28 + 0xc + iVar40);
                    auVar310._2_2_ = auVar310._0_2_;
                    auVar310._4_2_ = auVar310._0_2_;
                    auVar310._6_2_ = auVar310._0_2_;
                    auVar310._8_2_ = auVar310._0_2_;
                    auVar310._10_2_ = auVar310._0_2_;
                    auVar310._12_2_ = auVar310._0_2_;
                    auVar310._14_2_ = auVar310._0_2_;
                    auVar310._16_2_ = auVar310._0_2_;
                    auVar310._18_2_ = auVar310._0_2_;
                    auVar310._20_2_ = auVar310._0_2_;
                    auVar310._22_2_ = auVar310._0_2_;
                    auVar310._24_2_ = auVar310._0_2_;
                    auVar310._26_2_ = auVar310._0_2_;
                    auVar310._28_2_ = auVar310._0_2_;
                    auVar310._30_2_ = auVar310._0_2_;
                    auVar400 = vpblendw_avx2(auVar400,auVar310,0x10);
                    auVar311._0_2_ = (undefined2)(iVar28 + 0xd + iVar40);
                    auVar311._2_2_ = auVar311._0_2_;
                    auVar311._4_2_ = auVar311._0_2_;
                    auVar311._6_2_ = auVar311._0_2_;
                    auVar311._8_2_ = auVar311._0_2_;
                    auVar311._10_2_ = auVar311._0_2_;
                    auVar311._12_2_ = auVar311._0_2_;
                    auVar311._14_2_ = auVar311._0_2_;
                    auVar311._16_2_ = auVar311._0_2_;
                    auVar311._18_2_ = auVar311._0_2_;
                    auVar311._20_2_ = auVar311._0_2_;
                    auVar311._22_2_ = auVar311._0_2_;
                    auVar311._24_2_ = auVar311._0_2_;
                    auVar311._26_2_ = auVar311._0_2_;
                    auVar311._28_2_ = auVar311._0_2_;
                    auVar311._30_2_ = auVar311._0_2_;
                    auVar400 = vpblendw_avx2(auVar400,auVar311,0x20);
                    auVar312._0_2_ = (undefined2)(iVar28 + 0xe + iVar40);
                    auVar312._2_2_ = auVar312._0_2_;
                    auVar312._4_2_ = auVar312._0_2_;
                    auVar312._6_2_ = auVar312._0_2_;
                    auVar312._8_2_ = auVar312._0_2_;
                    auVar312._10_2_ = auVar312._0_2_;
                    auVar312._12_2_ = auVar312._0_2_;
                    auVar312._14_2_ = auVar312._0_2_;
                    auVar312._16_2_ = auVar312._0_2_;
                    auVar312._18_2_ = auVar312._0_2_;
                    auVar312._20_2_ = auVar312._0_2_;
                    auVar312._22_2_ = auVar312._0_2_;
                    auVar312._24_2_ = auVar312._0_2_;
                    auVar312._26_2_ = auVar312._0_2_;
                    auVar312._28_2_ = auVar312._0_2_;
                    auVar312._30_2_ = auVar312._0_2_;
                    auVar400 = vpblendw_avx2(auVar400,auVar312,0x40);
                    auVar313._0_2_ = (undefined2)(iVar28 + 0xf + iVar40);
                    auVar313._2_2_ = auVar313._0_2_;
                    auVar313._4_2_ = auVar313._0_2_;
                    auVar313._6_2_ = auVar313._0_2_;
                    auVar313._8_2_ = auVar313._0_2_;
                    auVar313._10_2_ = auVar313._0_2_;
                    auVar313._12_2_ = auVar313._0_2_;
                    auVar313._14_2_ = auVar313._0_2_;
                    auVar313._16_2_ = auVar313._0_2_;
                    auVar313._18_2_ = auVar313._0_2_;
                    auVar313._20_2_ = auVar313._0_2_;
                    auVar313._22_2_ = auVar313._0_2_;
                    auVar313._24_2_ = auVar313._0_2_;
                    auVar313._26_2_ = auVar313._0_2_;
                    auVar313._28_2_ = auVar313._0_2_;
                    auVar313._30_2_ = auVar313._0_2_;
                    auVar400 = vpblendw_avx2(auVar400,auVar313,0x80);
                    auVar400 = vpblendd_avx2(ZEXT1632(auVar179),auVar400,0xf0);
                    auVar400 = vpcmpgtw_avx2(auVar400,auVar114);
                    auVar400 = vpblendvb_avx2(auVar160,auVar63,auVar400);
                  }
                  uVar35 = uVar27 | 8;
                  if (uVar41 == 0) {
                    uVar35 = uVar27;
                  }
                  *(undefined1 (*) [32])(local_2060 + uVar35 * 4) = auVar400;
                }
                uVar43 = (ulong)(uint)((int)uVar43 + dy);
              }
              else {
                for (; lVar33 != 0; lVar33 = lVar33 + 0x20) {
                  *(undefined1 (*) [32])(local_1f60 + lVar33) = auVar63;
                  *(undefined1 (*) [32])((long)local_1e60 + lVar33) = auVar63;
                }
              }
              uVar27 = uVar27 + 1;
              lVar30 = lVar30 + 0x20;
            } while (iVar28 < 0x27);
          }
          else {
            auVar90._8_4_ = 0x10;
            auVar90._0_8_ = 0x1000000010;
            auVar90._12_4_ = 0x10;
            auVar90._16_4_ = 0x10;
            auVar90._20_4_ = 0x10;
            auVar90._24_4_ = 0x10;
            auVar90._28_4_ = 0x10;
            auVar291 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
            auVar119._8_2_ = 0x26;
            auVar119._0_8_ = 0x26002600260026;
            auVar119._10_2_ = 0x26;
            auVar119._12_2_ = 0x26;
            auVar119._14_2_ = 0x26;
            auVar119._16_2_ = 0x26;
            auVar119._18_2_ = 0x26;
            auVar119._20_2_ = 0x26;
            auVar119._22_2_ = 0x26;
            auVar119._24_2_ = 0x26;
            auVar119._26_2_ = 0x26;
            auVar119._28_2_ = 0x26;
            auVar119._30_2_ = 0x26;
            auVar400 = vpmovsxbw_avx2(_DAT_0046f570);
            do {
              if (uVar27 == 8) break;
              uVar38 = (int)uVar43 >> 6;
              lVar33 = lVar30;
              if ((int)uVar38 < 0x27) {
                uVar34 = (uint)(uVar43 >> 1);
                uVar32 = uVar34 & 0x1f801f;
                auVar170._0_8_ = CONCAT44(uVar34,uVar34) & 0x1f801f001f801f;
                auVar170._8_4_ = uVar32;
                auVar170._12_4_ = uVar32;
                auVar170._16_4_ = uVar32;
                auVar170._20_4_ = uVar32;
                auVar170._24_4_ = uVar32;
                auVar170._28_4_ = uVar32;
                auVar325 = auVar53;
                if (uVar38 - 0x28 < 0xfffffff7) {
                  auVar160 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar38 + 8));
                  auVar135 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar38 + 9));
                  auVar135 = vpsubd_avx2(auVar135,auVar160);
                  auVar160 = vpslld_avx2(auVar160,5);
                  auVar135 = vpmulld_avx2(auVar135,auVar170);
                  auVar160 = vpaddd_avx2(auVar160,auVar90);
                  auVar160 = vpaddd_avx2(auVar135,auVar160);
                  auVar160 = vpsrld_avx2(auVar160,5);
                  auVar251._0_16_ = ZEXT116(0) * auVar53 + ZEXT116(1) * auVar160._16_16_;
                  auVar251._16_16_ =
                       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar53;
                  auVar160 = vpackusdw_avx2(auVar160,auVar251);
                  auVar325 = auVar160._0_16_;
                }
                auVar160 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (int)uVar38));
                auVar135 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar38 + 1));
                auVar135 = vpsubd_avx2(auVar135,auVar160);
                auVar160 = vpslld_avx2(auVar160,5);
                auVar135 = vpmulld_avx2(auVar135,auVar170);
                auVar160 = vpaddd_avx2(auVar160,auVar90);
                auVar160 = vpaddd_avx2(auVar135,auVar160);
                auVar160 = vpsrld_avx2(auVar160,5);
                auVar160 = vpackusdw_avx2(auVar160,ZEXT1632(auVar160._16_16_));
                auVar294._0_2_ = (undefined2)uVar38;
                auVar294._2_2_ = auVar294._0_2_;
                auVar294._4_2_ = auVar294._0_2_;
                auVar294._6_2_ = auVar294._0_2_;
                auVar294._8_2_ = auVar294._0_2_;
                auVar294._10_2_ = auVar294._0_2_;
                auVar294._12_2_ = auVar294._0_2_;
                auVar294._14_2_ = auVar294._0_2_;
                auVar179 = vpaddw_avx(auVar294,auVar291);
                auVar329 = vpslldq_avx(auVar179,2);
                auVar329 = vpblendw_avx(auVar329,ZEXT416(uVar38),1);
                auVar179 = vpsrldq_avx(auVar179,0xe);
                auVar321._0_16_ = ZEXT116(0) * auVar179 + ZEXT116(1) * auVar53;
                auVar321._16_16_ = ZEXT116(0) * auVar63._16_16_ + ZEXT116(1) * auVar179;
                auVar361._0_2_ = (undefined2)(uVar38 + 9);
                auVar361._2_2_ = auVar361._0_2_;
                auVar361._4_2_ = auVar361._0_2_;
                auVar361._6_2_ = auVar361._0_2_;
                auVar361._8_2_ = auVar361._0_2_;
                auVar361._10_2_ = auVar361._0_2_;
                auVar361._12_2_ = auVar361._0_2_;
                auVar361._14_2_ = auVar361._0_2_;
                auVar361._16_2_ = auVar361._0_2_;
                auVar361._18_2_ = auVar361._0_2_;
                auVar361._20_2_ = auVar361._0_2_;
                auVar361._22_2_ = auVar361._0_2_;
                auVar361._24_2_ = auVar361._0_2_;
                auVar361._26_2_ = auVar361._0_2_;
                auVar361._28_2_ = auVar361._0_2_;
                auVar361._30_2_ = auVar361._0_2_;
                auVar135 = vpblendw_avx2(auVar321,auVar361,2);
                auVar362._0_2_ = (undefined2)(uVar38 + 10);
                auVar362._2_2_ = auVar362._0_2_;
                auVar362._4_2_ = auVar362._0_2_;
                auVar362._6_2_ = auVar362._0_2_;
                auVar362._8_2_ = auVar362._0_2_;
                auVar362._10_2_ = auVar362._0_2_;
                auVar362._12_2_ = auVar362._0_2_;
                auVar362._14_2_ = auVar362._0_2_;
                auVar362._16_2_ = auVar362._0_2_;
                auVar362._18_2_ = auVar362._0_2_;
                auVar362._20_2_ = auVar362._0_2_;
                auVar362._22_2_ = auVar362._0_2_;
                auVar362._24_2_ = auVar362._0_2_;
                auVar362._26_2_ = auVar362._0_2_;
                auVar362._28_2_ = auVar362._0_2_;
                auVar362._30_2_ = auVar362._0_2_;
                auVar135 = vpblendw_avx2(auVar135,auVar362,4);
                auVar363._0_2_ = (undefined2)(uVar38 + 0xb);
                auVar363._2_2_ = auVar363._0_2_;
                auVar363._4_2_ = auVar363._0_2_;
                auVar363._6_2_ = auVar363._0_2_;
                auVar363._8_2_ = auVar363._0_2_;
                auVar363._10_2_ = auVar363._0_2_;
                auVar363._12_2_ = auVar363._0_2_;
                auVar363._14_2_ = auVar363._0_2_;
                auVar363._16_2_ = auVar363._0_2_;
                auVar363._18_2_ = auVar363._0_2_;
                auVar363._20_2_ = auVar363._0_2_;
                auVar363._22_2_ = auVar363._0_2_;
                auVar363._24_2_ = auVar363._0_2_;
                auVar363._26_2_ = auVar363._0_2_;
                auVar363._28_2_ = auVar363._0_2_;
                auVar363._30_2_ = auVar363._0_2_;
                auVar135 = vpblendw_avx2(auVar135,auVar363,8);
                auVar364._0_2_ = (undefined2)(uVar38 + 0xc);
                auVar364._2_2_ = auVar364._0_2_;
                auVar364._4_2_ = auVar364._0_2_;
                auVar364._6_2_ = auVar364._0_2_;
                auVar364._8_2_ = auVar364._0_2_;
                auVar364._10_2_ = auVar364._0_2_;
                auVar364._12_2_ = auVar364._0_2_;
                auVar364._14_2_ = auVar364._0_2_;
                auVar364._16_2_ = auVar364._0_2_;
                auVar364._18_2_ = auVar364._0_2_;
                auVar364._20_2_ = auVar364._0_2_;
                auVar364._22_2_ = auVar364._0_2_;
                auVar364._24_2_ = auVar364._0_2_;
                auVar364._26_2_ = auVar364._0_2_;
                auVar364._28_2_ = auVar364._0_2_;
                auVar364._30_2_ = auVar364._0_2_;
                auVar135 = vpblendw_avx2(auVar135,auVar364,0x10);
                auVar365._0_2_ = (undefined2)(uVar38 + 0xd);
                auVar365._2_2_ = auVar365._0_2_;
                auVar365._4_2_ = auVar365._0_2_;
                auVar365._6_2_ = auVar365._0_2_;
                auVar365._8_2_ = auVar365._0_2_;
                auVar365._10_2_ = auVar365._0_2_;
                auVar365._12_2_ = auVar365._0_2_;
                auVar365._14_2_ = auVar365._0_2_;
                auVar365._16_2_ = auVar365._0_2_;
                auVar365._18_2_ = auVar365._0_2_;
                auVar365._20_2_ = auVar365._0_2_;
                auVar365._22_2_ = auVar365._0_2_;
                auVar365._24_2_ = auVar365._0_2_;
                auVar365._26_2_ = auVar365._0_2_;
                auVar365._28_2_ = auVar365._0_2_;
                auVar365._30_2_ = auVar365._0_2_;
                auVar135 = vpblendw_avx2(auVar135,auVar365,0x20);
                auVar366._0_2_ = (undefined2)(uVar38 + 0xe);
                auVar366._2_2_ = auVar366._0_2_;
                auVar366._4_2_ = auVar366._0_2_;
                auVar366._6_2_ = auVar366._0_2_;
                auVar366._8_2_ = auVar366._0_2_;
                auVar366._10_2_ = auVar366._0_2_;
                auVar366._12_2_ = auVar366._0_2_;
                auVar366._14_2_ = auVar366._0_2_;
                auVar366._16_2_ = auVar366._0_2_;
                auVar366._18_2_ = auVar366._0_2_;
                auVar366._20_2_ = auVar366._0_2_;
                auVar366._22_2_ = auVar366._0_2_;
                auVar366._24_2_ = auVar366._0_2_;
                auVar366._26_2_ = auVar366._0_2_;
                auVar366._28_2_ = auVar366._0_2_;
                auVar366._30_2_ = auVar366._0_2_;
                auVar135 = vpblendw_avx2(auVar135,auVar366,0x40);
                auVar367._0_2_ = (undefined2)(uVar38 + 0xf);
                auVar367._2_2_ = auVar367._0_2_;
                auVar367._4_2_ = auVar367._0_2_;
                auVar367._6_2_ = auVar367._0_2_;
                auVar367._8_2_ = auVar367._0_2_;
                auVar367._10_2_ = auVar367._0_2_;
                auVar367._12_2_ = auVar367._0_2_;
                auVar367._14_2_ = auVar367._0_2_;
                auVar367._16_2_ = auVar367._0_2_;
                auVar367._18_2_ = auVar367._0_2_;
                auVar367._20_2_ = auVar367._0_2_;
                auVar367._22_2_ = auVar367._0_2_;
                auVar367._24_2_ = auVar367._0_2_;
                auVar367._26_2_ = auVar367._0_2_;
                auVar367._28_2_ = auVar367._0_2_;
                auVar367._30_2_ = auVar367._0_2_;
                auVar135 = vpblendw_avx2(auVar135,auVar367,0x80);
                auVar135 = vpblendd_avx2(ZEXT1632(auVar329),auVar135,0xf0);
                auVar135 = vpcmpgtw_avx2(auVar135,auVar119);
                auVar185._0_16_ = ZEXT116(0) * auVar325 + ZEXT116(1) * auVar160._0_16_;
                auVar185._16_16_ = ZEXT116(0) * auVar160._16_16_ + ZEXT116(1) * auVar325;
                auVar160 = vpblendvb_avx2(auVar185,auVar63,auVar135);
                *(undefined1 (*) [32])(local_2060 + uVar27 * 4) = auVar160;
                auVar160 = auVar63;
                if ((int)uVar38 < 0x17) {
                  auVar325 = auVar53;
                  if (uVar38 - 0x18 < 0xfffffff7) {
                    auVar160 = vpmovzxwd_avx2(*(undefined1 (*) [16])
                                               (left + (long)(int)uVar38 + 0x18));
                    auVar135 = vpmovzxwd_avx2(*(undefined1 (*) [16])
                                               (left + (long)(int)uVar38 + 0x19));
                    auVar135 = vpsubd_avx2(auVar135,auVar160);
                    auVar160 = vpslld_avx2(auVar160,5);
                    auVar135 = vpmulld_avx2(auVar135,auVar170);
                    auVar160 = vpaddd_avx2(auVar160,auVar90);
                    auVar160 = vpaddd_avx2(auVar135,auVar160);
                    auVar160 = vpsrld_avx2(auVar160,5);
                    auVar252._0_16_ = ZEXT116(0) * auVar53 + ZEXT116(1) * auVar160._16_16_;
                    auVar252._16_16_ =
                         ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar53;
                    auVar160 = vpackusdw_avx2(auVar160,auVar252);
                    auVar325 = auVar160._0_16_;
                  }
                  auVar160 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar38 + 0x10))
                  ;
                  auVar135 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar38 + 0x11))
                  ;
                  auVar135 = vpsubd_avx2(auVar135,auVar160);
                  auVar160 = vpslld_avx2(auVar160,5);
                  auVar135 = vpmulld_avx2(auVar135,auVar170);
                  auVar160 = vpaddd_avx2(auVar160,auVar90);
                  auVar160 = vpaddd_avx2(auVar135,auVar160);
                  auVar160 = vpsrld_avx2(auVar160,5);
                  auVar160 = vpackusdw_avx2(auVar160,ZEXT1632(auVar160._16_16_));
                  auVar253._2_2_ = auVar294._0_2_;
                  auVar253._0_2_ = auVar294._0_2_;
                  auVar253._4_2_ = auVar294._0_2_;
                  auVar253._6_2_ = auVar294._0_2_;
                  auVar253._8_2_ = auVar294._0_2_;
                  auVar253._10_2_ = auVar294._0_2_;
                  auVar253._12_2_ = auVar294._0_2_;
                  auVar253._14_2_ = auVar294._0_2_;
                  auVar253._16_2_ = auVar294._0_2_;
                  auVar253._18_2_ = auVar294._0_2_;
                  auVar253._20_2_ = auVar294._0_2_;
                  auVar253._22_2_ = auVar294._0_2_;
                  auVar253._24_2_ = auVar294._0_2_;
                  auVar253._26_2_ = auVar294._0_2_;
                  auVar253._28_2_ = auVar294._0_2_;
                  auVar253._30_2_ = auVar294._0_2_;
                  auVar135 = vpaddw_avx2(auVar253,auVar400);
                  auVar135 = vpcmpgtw_avx2(auVar135,auVar119);
                  auVar171._0_16_ = ZEXT116(0) * auVar325 + ZEXT116(1) * auVar160._0_16_;
                  auVar171._16_16_ = ZEXT116(0) * auVar160._16_16_ + ZEXT116(1) * auVar325;
                  auVar160 = vpblendvb_avx2(auVar171,auVar63,auVar135);
                }
                *(undefined1 (*) [32])(local_1f60 + uVar27 * 0x20) = auVar160;
                uVar43 = (ulong)(uint)((int)uVar43 + dy);
              }
              else {
                for (; lVar33 != 0; lVar33 = lVar33 + 0x20) {
                  *(undefined1 (*) [32])(local_1f60 + lVar33) = auVar63;
                  *(undefined1 (*) [32])((long)local_1e60 + lVar33) = auVar63;
                }
              }
              uVar27 = uVar27 + 1;
              lVar30 = lVar30 + 0x20;
            } while ((int)uVar38 < 0x27);
          }
          palVar44 = (__m256i *)local_2460;
          palVar42 = (__m256i *)local_2060;
          for (uVar43 = 0; uVar43 < 0x10; uVar43 = uVar43 + 8) {
            highbd_transpose8x16_16x8_avx2(palVar42,palVar44);
            palVar44 = palVar44 + 8;
            palVar42 = palVar42 + 8;
          }
          puVar23 = dst;
          for (lVar30 = 0; lVar30 != 0x100; lVar30 = lVar30 + 0x20) {
            uVar4 = *(undefined8 *)(local_2460 + lVar30 + 8);
            *(undefined8 *)puVar23 = *(undefined8 *)(local_2460 + lVar30);
            *(undefined8 *)(puVar23 + 4) = uVar4;
            puVar23 = puVar23 + stride;
          }
          puVar23 = dst + stride * 8;
          for (lVar30 = 0; lVar30 != 0x100; lVar30 = lVar30 + 0x20) {
            uVar4 = *(undefined8 *)(local_2440 + lVar30 + -8);
            *(undefined8 *)(puVar23 + 8) = *(undefined8 *)(local_2460 + lVar30 + 0x10);
            *(undefined8 *)(puVar23 + 0xc) = uVar4;
            puVar23 = puVar23 + stride;
          }
          puVar23 = dst + stride * 0x10;
          for (lVar30 = 0x100; lVar30 != 0x200; lVar30 = lVar30 + 0x20) {
            uVar4 = *(undefined8 *)(local_2460 + lVar30 + 8);
            *(undefined8 *)puVar23 = *(undefined8 *)(local_2460 + lVar30);
            *(undefined8 *)(puVar23 + 4) = uVar4;
            puVar23 = puVar23 + stride;
          }
          puVar23 = dst + stride * 0x18;
          for (lVar30 = 0x100; lVar30 != 0x200; lVar30 = lVar30 + 0x20) {
            uVar4 = *(undefined8 *)(local_2440 + lVar30 + -8);
            *(undefined8 *)(puVar23 + 8) = *(undefined8 *)(local_2460 + lVar30 + 0x10);
            *(undefined8 *)(puVar23 + 0xc) = uVar4;
            puVar23 = puVar23 + stride;
          }
          return;
        }
        if (bw != 4) {
          return;
        }
        uVar3 = left[0x13];
        auVar48._2_2_ = uVar3;
        auVar48._0_2_ = uVar3;
        auVar48._4_2_ = uVar3;
        auVar48._6_2_ = uVar3;
        auVar48._8_2_ = uVar3;
        auVar48._10_2_ = uVar3;
        auVar48._12_2_ = uVar3;
        auVar48._14_2_ = uVar3;
        auVar59._16_2_ = uVar3;
        auVar59._0_16_ = auVar48;
        auVar59._18_2_ = uVar3;
        auVar59._20_2_ = uVar3;
        auVar59._22_2_ = uVar3;
        auVar59._24_2_ = uVar3;
        auVar59._26_2_ = uVar3;
        auVar59._28_2_ = uVar3;
        auVar59._30_2_ = uVar3;
        lVar30 = 0;
        if (bd < 0xc) {
          auVar79._8_2_ = 0x10;
          auVar79._0_8_ = 0x10001000100010;
          auVar79._10_2_ = 0x10;
          auVar79._12_2_ = 0x10;
          auVar79._14_2_ = 0x10;
          auVar79._16_2_ = 0x10;
          auVar79._18_2_ = 0x10;
          auVar79._20_2_ = 0x10;
          auVar79._22_2_ = 0x10;
          auVar79._24_2_ = 0x10;
          auVar79._26_2_ = 0x10;
          auVar79._28_2_ = 0x10;
          auVar79._30_2_ = 0x10;
          auVar291 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
          auVar108._8_2_ = 0x12;
          auVar108._0_8_ = 0x12001200120012;
          auVar108._10_2_ = 0x12;
          auVar108._12_2_ = 0x12;
          auVar108._14_2_ = 0x12;
          auVar108._16_2_ = 0x12;
          auVar108._18_2_ = 0x12;
          auVar108._20_2_ = 0x12;
          auVar108._22_2_ = 0x12;
          auVar108._24_2_ = 0x12;
          auVar108._26_2_ = 0x12;
          auVar108._28_2_ = 0x12;
          auVar108._30_2_ = 0x12;
          for (; lVar30 != 0x80; lVar30 = lVar30 + 0x20) {
            uVar38 = (int)uVar43 >> 6;
            if (0x12 < (int)uVar38) goto LAB_002f8bc2;
            uVar6 = (ushort)(uVar43 >> 1);
            uVar387 = uVar6 & 0x1f;
            auVar127._0_8_ =
                 CONCAT26(uVar6,CONCAT24(uVar6,CONCAT22(uVar6,uVar6))) & 0x1f001f001f001f;
            auVar127._8_2_ = uVar387;
            auVar127._10_2_ = uVar387;
            auVar127._12_2_ = uVar387;
            auVar127._14_2_ = uVar387;
            auVar127._16_2_ = uVar387;
            auVar127._18_2_ = uVar387;
            auVar127._20_2_ = uVar387;
            auVar127._22_2_ = uVar387;
            auVar127._24_2_ = uVar387;
            auVar127._26_2_ = uVar387;
            auVar127._28_2_ = uVar387;
            auVar127._30_2_ = uVar387;
            auVar400 = vpsubw_avx2(*(undefined1 (*) [32])(left + (long)(int)uVar38 + 1),
                                   *(undefined1 (*) [32])(left + (int)uVar38));
            auVar160 = vpmullw_avx2(auVar400,auVar127);
            auVar400 = vpsllw_avx2(*(undefined1 (*) [32])(left + (int)uVar38),5);
            auVar400 = vpaddw_avx2(auVar400,auVar79);
            auVar400 = vpaddw_avx2(auVar160,auVar400);
            auVar160 = vpsrlw_avx2(auVar400,5);
            auVar148._0_2_ = (undefined2)uVar38;
            auVar148._2_2_ = auVar148._0_2_;
            auVar148._4_2_ = auVar148._0_2_;
            auVar148._6_2_ = auVar148._0_2_;
            auVar148._8_2_ = auVar148._0_2_;
            auVar148._10_2_ = auVar148._0_2_;
            auVar148._12_2_ = auVar148._0_2_;
            auVar148._14_2_ = auVar148._0_2_;
            auVar325 = vpaddw_avx(auVar148,auVar291);
            auVar179 = vpslldq_avx(auVar325,2);
            auVar179 = vpblendw_avx(auVar179,ZEXT416(uVar38),1);
            auVar325 = vpsrldq_avx(auVar325,0xe);
            auVar158._0_16_ = ZEXT116(0) * auVar325 + ZEXT116(1) * auVar48;
            auVar158._16_16_ = ZEXT116(0) * auVar59._16_16_ + ZEXT116(1) * auVar325;
            auVar200._0_2_ = (undefined2)(uVar38 + 9);
            auVar200._2_2_ = auVar200._0_2_;
            auVar200._4_2_ = auVar200._0_2_;
            auVar200._6_2_ = auVar200._0_2_;
            auVar200._8_2_ = auVar200._0_2_;
            auVar200._10_2_ = auVar200._0_2_;
            auVar200._12_2_ = auVar200._0_2_;
            auVar200._14_2_ = auVar200._0_2_;
            auVar200._16_2_ = auVar200._0_2_;
            auVar200._18_2_ = auVar200._0_2_;
            auVar200._20_2_ = auVar200._0_2_;
            auVar200._22_2_ = auVar200._0_2_;
            auVar200._24_2_ = auVar200._0_2_;
            auVar200._26_2_ = auVar200._0_2_;
            auVar200._28_2_ = auVar200._0_2_;
            auVar200._30_2_ = auVar200._0_2_;
            auVar400 = vpblendw_avx2(auVar158,auVar200,2);
            auVar201._0_2_ = (undefined2)(uVar38 + 10);
            auVar201._2_2_ = auVar201._0_2_;
            auVar201._4_2_ = auVar201._0_2_;
            auVar201._6_2_ = auVar201._0_2_;
            auVar201._8_2_ = auVar201._0_2_;
            auVar201._10_2_ = auVar201._0_2_;
            auVar201._12_2_ = auVar201._0_2_;
            auVar201._14_2_ = auVar201._0_2_;
            auVar201._16_2_ = auVar201._0_2_;
            auVar201._18_2_ = auVar201._0_2_;
            auVar201._20_2_ = auVar201._0_2_;
            auVar201._22_2_ = auVar201._0_2_;
            auVar201._24_2_ = auVar201._0_2_;
            auVar201._26_2_ = auVar201._0_2_;
            auVar201._28_2_ = auVar201._0_2_;
            auVar201._30_2_ = auVar201._0_2_;
            auVar400 = vpblendw_avx2(auVar400,auVar201,4);
            auVar202._0_2_ = (undefined2)(uVar38 + 0xb);
            auVar202._2_2_ = auVar202._0_2_;
            auVar202._4_2_ = auVar202._0_2_;
            auVar202._6_2_ = auVar202._0_2_;
            auVar202._8_2_ = auVar202._0_2_;
            auVar202._10_2_ = auVar202._0_2_;
            auVar202._12_2_ = auVar202._0_2_;
            auVar202._14_2_ = auVar202._0_2_;
            auVar202._16_2_ = auVar202._0_2_;
            auVar202._18_2_ = auVar202._0_2_;
            auVar202._20_2_ = auVar202._0_2_;
            auVar202._22_2_ = auVar202._0_2_;
            auVar202._24_2_ = auVar202._0_2_;
            auVar202._26_2_ = auVar202._0_2_;
            auVar202._28_2_ = auVar202._0_2_;
            auVar202._30_2_ = auVar202._0_2_;
            auVar400 = vpblendw_avx2(auVar400,auVar202,8);
            auVar203._0_2_ = (undefined2)(uVar38 + 0xc);
            auVar203._2_2_ = auVar203._0_2_;
            auVar203._4_2_ = auVar203._0_2_;
            auVar203._6_2_ = auVar203._0_2_;
            auVar203._8_2_ = auVar203._0_2_;
            auVar203._10_2_ = auVar203._0_2_;
            auVar203._12_2_ = auVar203._0_2_;
            auVar203._14_2_ = auVar203._0_2_;
            auVar203._16_2_ = auVar203._0_2_;
            auVar203._18_2_ = auVar203._0_2_;
            auVar203._20_2_ = auVar203._0_2_;
            auVar203._22_2_ = auVar203._0_2_;
            auVar203._24_2_ = auVar203._0_2_;
            auVar203._26_2_ = auVar203._0_2_;
            auVar203._28_2_ = auVar203._0_2_;
            auVar203._30_2_ = auVar203._0_2_;
            auVar400 = vpblendw_avx2(auVar400,auVar203,0x10);
            auVar204._0_2_ = (undefined2)(uVar38 + 0xd);
            auVar204._2_2_ = auVar204._0_2_;
            auVar204._4_2_ = auVar204._0_2_;
            auVar204._6_2_ = auVar204._0_2_;
            auVar204._8_2_ = auVar204._0_2_;
            auVar204._10_2_ = auVar204._0_2_;
            auVar204._12_2_ = auVar204._0_2_;
            auVar204._14_2_ = auVar204._0_2_;
            auVar204._16_2_ = auVar204._0_2_;
            auVar204._18_2_ = auVar204._0_2_;
            auVar204._20_2_ = auVar204._0_2_;
            auVar204._22_2_ = auVar204._0_2_;
            auVar204._24_2_ = auVar204._0_2_;
            auVar204._26_2_ = auVar204._0_2_;
            auVar204._28_2_ = auVar204._0_2_;
            auVar204._30_2_ = auVar204._0_2_;
            auVar400 = vpblendw_avx2(auVar400,auVar204,0x20);
            auVar205._0_2_ = (undefined2)(uVar38 + 0xe);
            auVar205._2_2_ = auVar205._0_2_;
            auVar205._4_2_ = auVar205._0_2_;
            auVar205._6_2_ = auVar205._0_2_;
            auVar205._8_2_ = auVar205._0_2_;
            auVar205._10_2_ = auVar205._0_2_;
            auVar205._12_2_ = auVar205._0_2_;
            auVar205._14_2_ = auVar205._0_2_;
            auVar205._16_2_ = auVar205._0_2_;
            auVar205._18_2_ = auVar205._0_2_;
            auVar205._20_2_ = auVar205._0_2_;
            auVar205._22_2_ = auVar205._0_2_;
            auVar205._24_2_ = auVar205._0_2_;
            auVar205._26_2_ = auVar205._0_2_;
            auVar205._28_2_ = auVar205._0_2_;
            auVar205._30_2_ = auVar205._0_2_;
            auVar400 = vpblendw_avx2(auVar400,auVar205,0x40);
            auVar206._0_2_ = (undefined2)(uVar38 + 0xf);
            auVar206._2_2_ = auVar206._0_2_;
            auVar206._4_2_ = auVar206._0_2_;
            auVar206._6_2_ = auVar206._0_2_;
            auVar206._8_2_ = auVar206._0_2_;
            auVar206._10_2_ = auVar206._0_2_;
            auVar206._12_2_ = auVar206._0_2_;
            auVar206._14_2_ = auVar206._0_2_;
            auVar206._16_2_ = auVar206._0_2_;
            auVar206._18_2_ = auVar206._0_2_;
            auVar206._20_2_ = auVar206._0_2_;
            auVar206._22_2_ = auVar206._0_2_;
            auVar206._24_2_ = auVar206._0_2_;
            auVar206._26_2_ = auVar206._0_2_;
            auVar206._28_2_ = auVar206._0_2_;
            auVar206._30_2_ = auVar206._0_2_;
            auVar400 = vpblendw_avx2(auVar400,auVar206,0x80);
            auVar400 = vpblendd_avx2(ZEXT1632(auVar179),auVar400,0xf0);
            auVar400 = vpcmpgtw_avx2(auVar400,auVar108);
            auVar400 = vpblendvb_avx2(auVar160,auVar59,auVar400);
            *(undefined1 (*) [32])((long)local_2060 + lVar30) = auVar400;
            uVar43 = (ulong)(uint)((int)uVar43 + dy);
          }
        }
        else {
          auVar92._8_4_ = 0x10;
          auVar92._0_8_ = 0x1000000010;
          auVar92._12_4_ = 0x10;
          auVar92._16_4_ = 0x10;
          auVar92._20_4_ = 0x10;
          auVar92._24_4_ = 0x10;
          auVar92._28_4_ = 0x10;
          auVar291 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
          auVar121._8_2_ = 0x12;
          auVar121._0_8_ = 0x12001200120012;
          auVar121._10_2_ = 0x12;
          auVar121._12_2_ = 0x12;
          auVar121._14_2_ = 0x12;
          auVar121._16_2_ = 0x12;
          auVar121._18_2_ = 0x12;
          auVar121._20_2_ = 0x12;
          auVar121._22_2_ = 0x12;
          auVar121._24_2_ = 0x12;
          auVar121._26_2_ = 0x12;
          auVar121._28_2_ = 0x12;
          auVar121._30_2_ = 0x12;
          for (; lVar30 != 0x80; lVar30 = lVar30 + 0x20) {
            uVar38 = (int)uVar43 >> 6;
            if (0x12 < (int)uVar38) goto LAB_002fb3a3;
            uVar34 = (uint)(uVar43 >> 1);
            uVar32 = uVar34 & 0x1f;
            auVar140._0_8_ = CONCAT44(uVar34,uVar34) & 0x1f0000001f;
            auVar140._8_4_ = uVar32;
            auVar140._12_4_ = uVar32;
            auVar140._16_4_ = uVar32;
            auVar140._20_4_ = uVar32;
            auVar140._24_4_ = uVar32;
            auVar140._28_4_ = uVar32;
            auVar325 = auVar48;
            if (uVar38 - 0x14 < 0xfffffff7) {
              auVar400 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar38 + 8));
              auVar160 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar38 + 9));
              auVar160 = vpsubd_avx2(auVar160,auVar400);
              auVar400 = vpslld_avx2(auVar400,5);
              auVar160 = vpmulld_avx2(auVar160,auVar140);
              auVar400 = vpaddd_avx2(auVar400,auVar92);
              auVar400 = vpaddd_avx2(auVar160,auVar400);
              auVar400 = vpsrld_avx2(auVar400,5);
              auVar189._0_16_ = ZEXT116(0) * auVar48 + ZEXT116(1) * auVar400._16_16_;
              auVar189._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar48;
              auVar400 = vpackusdw_avx2(auVar400,auVar189);
              auVar325 = auVar400._0_16_;
            }
            auVar400 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (int)uVar38));
            auVar160 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar38 + 1));
            auVar160 = vpsubd_avx2(auVar160,auVar400);
            auVar400 = vpslld_avx2(auVar400,5);
            auVar160 = vpmulld_avx2(auVar160,auVar140);
            auVar400 = vpaddd_avx2(auVar400,auVar92);
            auVar400 = vpaddd_avx2(auVar160,auVar400);
            auVar400 = vpsrld_avx2(auVar400,5);
            auVar400 = vpackusdw_avx2(auVar400,ZEXT1632(auVar400._16_16_));
            auVar141._0_16_ = ZEXT116(0) * auVar325 + ZEXT116(1) * auVar400._0_16_;
            auVar141._16_16_ = ZEXT116(0) * auVar400._16_16_ + ZEXT116(1) * auVar325;
            auVar153._0_2_ = (undefined2)uVar38;
            auVar153._2_2_ = auVar153._0_2_;
            auVar153._4_2_ = auVar153._0_2_;
            auVar153._6_2_ = auVar153._0_2_;
            auVar153._8_2_ = auVar153._0_2_;
            auVar153._10_2_ = auVar153._0_2_;
            auVar153._12_2_ = auVar153._0_2_;
            auVar153._14_2_ = auVar153._0_2_;
            auVar325 = vpaddw_avx(auVar153,auVar291);
            auVar179 = vpslldq_avx(auVar325,2);
            auVar179 = vpblendw_avx(auVar179,ZEXT416(uVar38),1);
            auVar325 = vpsrldq_avx(auVar325,0xe);
            auVar173._0_16_ = ZEXT116(0) * auVar325 + ZEXT116(1) * auVar48;
            auVar173._16_16_ = ZEXT116(0) * auVar59._16_16_ + ZEXT116(1) * auVar325;
            auVar263._0_2_ = (undefined2)(uVar38 + 9);
            auVar263._2_2_ = auVar263._0_2_;
            auVar263._4_2_ = auVar263._0_2_;
            auVar263._6_2_ = auVar263._0_2_;
            auVar263._8_2_ = auVar263._0_2_;
            auVar263._10_2_ = auVar263._0_2_;
            auVar263._12_2_ = auVar263._0_2_;
            auVar263._14_2_ = auVar263._0_2_;
            auVar263._16_2_ = auVar263._0_2_;
            auVar263._18_2_ = auVar263._0_2_;
            auVar263._20_2_ = auVar263._0_2_;
            auVar263._22_2_ = auVar263._0_2_;
            auVar263._24_2_ = auVar263._0_2_;
            auVar263._26_2_ = auVar263._0_2_;
            auVar263._28_2_ = auVar263._0_2_;
            auVar263._30_2_ = auVar263._0_2_;
            auVar400 = vpblendw_avx2(auVar173,auVar263,2);
            auVar264._0_2_ = (undefined2)(uVar38 + 10);
            auVar264._2_2_ = auVar264._0_2_;
            auVar264._4_2_ = auVar264._0_2_;
            auVar264._6_2_ = auVar264._0_2_;
            auVar264._8_2_ = auVar264._0_2_;
            auVar264._10_2_ = auVar264._0_2_;
            auVar264._12_2_ = auVar264._0_2_;
            auVar264._14_2_ = auVar264._0_2_;
            auVar264._16_2_ = auVar264._0_2_;
            auVar264._18_2_ = auVar264._0_2_;
            auVar264._20_2_ = auVar264._0_2_;
            auVar264._22_2_ = auVar264._0_2_;
            auVar264._24_2_ = auVar264._0_2_;
            auVar264._26_2_ = auVar264._0_2_;
            auVar264._28_2_ = auVar264._0_2_;
            auVar264._30_2_ = auVar264._0_2_;
            auVar400 = vpblendw_avx2(auVar400,auVar264,4);
            auVar265._0_2_ = (undefined2)(uVar38 + 0xb);
            auVar265._2_2_ = auVar265._0_2_;
            auVar265._4_2_ = auVar265._0_2_;
            auVar265._6_2_ = auVar265._0_2_;
            auVar265._8_2_ = auVar265._0_2_;
            auVar265._10_2_ = auVar265._0_2_;
            auVar265._12_2_ = auVar265._0_2_;
            auVar265._14_2_ = auVar265._0_2_;
            auVar265._16_2_ = auVar265._0_2_;
            auVar265._18_2_ = auVar265._0_2_;
            auVar265._20_2_ = auVar265._0_2_;
            auVar265._22_2_ = auVar265._0_2_;
            auVar265._24_2_ = auVar265._0_2_;
            auVar265._26_2_ = auVar265._0_2_;
            auVar265._28_2_ = auVar265._0_2_;
            auVar265._30_2_ = auVar265._0_2_;
            auVar400 = vpblendw_avx2(auVar400,auVar265,8);
            auVar266._0_2_ = (undefined2)(uVar38 + 0xc);
            auVar266._2_2_ = auVar266._0_2_;
            auVar266._4_2_ = auVar266._0_2_;
            auVar266._6_2_ = auVar266._0_2_;
            auVar266._8_2_ = auVar266._0_2_;
            auVar266._10_2_ = auVar266._0_2_;
            auVar266._12_2_ = auVar266._0_2_;
            auVar266._14_2_ = auVar266._0_2_;
            auVar266._16_2_ = auVar266._0_2_;
            auVar266._18_2_ = auVar266._0_2_;
            auVar266._20_2_ = auVar266._0_2_;
            auVar266._22_2_ = auVar266._0_2_;
            auVar266._24_2_ = auVar266._0_2_;
            auVar266._26_2_ = auVar266._0_2_;
            auVar266._28_2_ = auVar266._0_2_;
            auVar266._30_2_ = auVar266._0_2_;
            auVar400 = vpblendw_avx2(auVar400,auVar266,0x10);
            auVar267._0_2_ = (undefined2)(uVar38 + 0xd);
            auVar267._2_2_ = auVar267._0_2_;
            auVar267._4_2_ = auVar267._0_2_;
            auVar267._6_2_ = auVar267._0_2_;
            auVar267._8_2_ = auVar267._0_2_;
            auVar267._10_2_ = auVar267._0_2_;
            auVar267._12_2_ = auVar267._0_2_;
            auVar267._14_2_ = auVar267._0_2_;
            auVar267._16_2_ = auVar267._0_2_;
            auVar267._18_2_ = auVar267._0_2_;
            auVar267._20_2_ = auVar267._0_2_;
            auVar267._22_2_ = auVar267._0_2_;
            auVar267._24_2_ = auVar267._0_2_;
            auVar267._26_2_ = auVar267._0_2_;
            auVar267._28_2_ = auVar267._0_2_;
            auVar267._30_2_ = auVar267._0_2_;
            auVar400 = vpblendw_avx2(auVar400,auVar267,0x20);
            auVar268._0_2_ = (undefined2)(uVar38 + 0xe);
            auVar268._2_2_ = auVar268._0_2_;
            auVar268._4_2_ = auVar268._0_2_;
            auVar268._6_2_ = auVar268._0_2_;
            auVar268._8_2_ = auVar268._0_2_;
            auVar268._10_2_ = auVar268._0_2_;
            auVar268._12_2_ = auVar268._0_2_;
            auVar268._14_2_ = auVar268._0_2_;
            auVar268._16_2_ = auVar268._0_2_;
            auVar268._18_2_ = auVar268._0_2_;
            auVar268._20_2_ = auVar268._0_2_;
            auVar268._22_2_ = auVar268._0_2_;
            auVar268._24_2_ = auVar268._0_2_;
            auVar268._26_2_ = auVar268._0_2_;
            auVar268._28_2_ = auVar268._0_2_;
            auVar268._30_2_ = auVar268._0_2_;
            auVar400 = vpblendw_avx2(auVar400,auVar268,0x40);
            auVar269._0_2_ = (undefined2)(uVar38 + 0xf);
            auVar269._2_2_ = auVar269._0_2_;
            auVar269._4_2_ = auVar269._0_2_;
            auVar269._6_2_ = auVar269._0_2_;
            auVar269._8_2_ = auVar269._0_2_;
            auVar269._10_2_ = auVar269._0_2_;
            auVar269._12_2_ = auVar269._0_2_;
            auVar269._14_2_ = auVar269._0_2_;
            auVar269._16_2_ = auVar269._0_2_;
            auVar269._18_2_ = auVar269._0_2_;
            auVar269._20_2_ = auVar269._0_2_;
            auVar269._22_2_ = auVar269._0_2_;
            auVar269._24_2_ = auVar269._0_2_;
            auVar269._26_2_ = auVar269._0_2_;
            auVar269._28_2_ = auVar269._0_2_;
            auVar269._30_2_ = auVar269._0_2_;
            auVar400 = vpblendw_avx2(auVar400,auVar269,0x80);
            auVar400 = vpblendd_avx2(ZEXT1632(auVar179),auVar400,0xf0);
            auVar400 = vpcmpgtw_avx2(auVar400,auVar121);
            auVar400 = vpblendvb_avx2(auVar141,auVar59,auVar400);
            *(undefined1 (*) [32])((long)local_2060 + lVar30) = auVar400;
            uVar43 = (ulong)(uint)((int)uVar43 + dy);
          }
        }
        goto LAB_002fb3ab;
      }
      if (bd < 0xc) {
        highbd_dr_prediction_z1_64xN_avx2(0x10,(uint16_t *)local_2060,0x40,left,dy,iVar28);
      }
      else {
        highbd_dr_prediction_32bit_z1_64xN_avx2(0x10,(uint16_t *)local_2060,0x40,left,dy,iVar28);
      }
      iVar40 = 0x10;
    }
    pitchSrc = 0x40;
    iVar28 = 0x40;
  }
  else {
    if (bh * 2 != bw) {
      if (bh == 0x10) {
        uVar3 = left[0x4f];
        auVar291._2_2_ = uVar3;
        auVar291._0_2_ = uVar3;
        auVar291._4_2_ = uVar3;
        auVar291._6_2_ = uVar3;
        auVar291._8_2_ = uVar3;
        auVar291._10_2_ = uVar3;
        auVar291._12_2_ = uVar3;
        auVar291._14_2_ = uVar3;
        auVar400._16_2_ = uVar3;
        auVar400._0_16_ = auVar291;
        auVar400._18_2_ = uVar3;
        auVar400._20_2_ = uVar3;
        auVar400._22_2_ = uVar3;
        auVar400._24_2_ = uVar3;
        auVar400._26_2_ = uVar3;
        auVar400._28_2_ = uVar3;
        auVar400._30_2_ = uVar3;
        lVar30 = 0;
        if (bd < 0xc) {
          auVar86._8_2_ = 0x10;
          auVar86._0_8_ = 0x10001000100010;
          auVar86._10_2_ = 0x10;
          auVar86._12_2_ = 0x10;
          auVar86._14_2_ = 0x10;
          auVar86._16_2_ = 0x10;
          auVar86._18_2_ = 0x10;
          auVar86._20_2_ = 0x10;
          auVar86._22_2_ = 0x10;
          auVar86._24_2_ = 0x10;
          auVar86._26_2_ = 0x10;
          auVar86._28_2_ = 0x10;
          auVar86._30_2_ = 0x10;
          auVar325 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
          auVar115._8_2_ = 0x4e;
          auVar115._0_8_ = 0x4e004e004e004e;
          auVar115._10_2_ = 0x4e;
          auVar115._12_2_ = 0x4e;
          auVar115._14_2_ = 0x4e;
          auVar115._16_2_ = 0x4e;
          auVar115._18_2_ = 0x4e;
          auVar115._20_2_ = 0x4e;
          auVar115._22_2_ = 0x4e;
          auVar115._24_2_ = 0x4e;
          auVar115._26_2_ = 0x4e;
          auVar115._28_2_ = 0x4e;
          auVar115._30_2_ = 0x4e;
          for (; lVar30 != 0x800; lVar30 = lVar30 + 0x20) {
            uVar38 = (int)uVar43 >> 6;
            if (0x4e < (int)uVar38) goto LAB_002fa252;
            uVar6 = (ushort)(uVar43 >> 1);
            uVar387 = uVar6 & 0x1f;
            auVar134._0_8_ =
                 CONCAT26(uVar6,CONCAT24(uVar6,CONCAT22(uVar6,uVar6))) & 0x1f001f001f001f;
            auVar134._8_2_ = uVar387;
            auVar134._10_2_ = uVar387;
            auVar134._12_2_ = uVar387;
            auVar134._14_2_ = uVar387;
            auVar134._16_2_ = uVar387;
            auVar134._18_2_ = uVar387;
            auVar134._20_2_ = uVar387;
            auVar134._22_2_ = uVar387;
            auVar134._24_2_ = uVar387;
            auVar134._26_2_ = uVar387;
            auVar134._28_2_ = uVar387;
            auVar134._30_2_ = uVar387;
            auVar160 = vpsubw_avx2(*(undefined1 (*) [32])(left + (long)(int)uVar38 + 1),
                                   *(undefined1 (*) [32])(left + (int)uVar38));
            auVar135 = vpmullw_avx2(auVar160,auVar134);
            auVar160 = vpsllw_avx2(*(undefined1 (*) [32])(left + (int)uVar38),5);
            auVar160 = vpaddw_avx2(auVar160,auVar86);
            auVar160 = vpaddw_avx2(auVar135,auVar160);
            auVar135 = vpsrlw_avx2(auVar160,5);
            auVar329._0_2_ = (undefined2)uVar38;
            auVar329._2_2_ = auVar329._0_2_;
            auVar329._4_2_ = auVar329._0_2_;
            auVar329._6_2_ = auVar329._0_2_;
            auVar329._8_2_ = auVar329._0_2_;
            auVar329._10_2_ = auVar329._0_2_;
            auVar329._12_2_ = auVar329._0_2_;
            auVar329._14_2_ = auVar329._0_2_;
            auVar179 = vpaddw_avx(auVar329,auVar325);
            auVar329 = vpslldq_avx(auVar179,2);
            auVar329 = vpblendw_avx(auVar329,ZEXT416(uVar38),1);
            auVar179 = vpsrldq_avx(auVar179,0xe);
            auVar166._0_16_ = ZEXT116(0) * auVar179 + ZEXT116(1) * auVar291;
            auVar166._16_16_ = ZEXT116(0) * auVar400._16_16_ + ZEXT116(1) * auVar179;
            auVar229._0_2_ = (undefined2)(uVar38 + 9);
            auVar229._2_2_ = auVar229._0_2_;
            auVar229._4_2_ = auVar229._0_2_;
            auVar229._6_2_ = auVar229._0_2_;
            auVar229._8_2_ = auVar229._0_2_;
            auVar229._10_2_ = auVar229._0_2_;
            auVar229._12_2_ = auVar229._0_2_;
            auVar229._14_2_ = auVar229._0_2_;
            auVar229._16_2_ = auVar229._0_2_;
            auVar229._18_2_ = auVar229._0_2_;
            auVar229._20_2_ = auVar229._0_2_;
            auVar229._22_2_ = auVar229._0_2_;
            auVar229._24_2_ = auVar229._0_2_;
            auVar229._26_2_ = auVar229._0_2_;
            auVar229._28_2_ = auVar229._0_2_;
            auVar229._30_2_ = auVar229._0_2_;
            auVar160 = vpblendw_avx2(auVar166,auVar229,2);
            auVar230._0_2_ = (undefined2)(uVar38 + 10);
            auVar230._2_2_ = auVar230._0_2_;
            auVar230._4_2_ = auVar230._0_2_;
            auVar230._6_2_ = auVar230._0_2_;
            auVar230._8_2_ = auVar230._0_2_;
            auVar230._10_2_ = auVar230._0_2_;
            auVar230._12_2_ = auVar230._0_2_;
            auVar230._14_2_ = auVar230._0_2_;
            auVar230._16_2_ = auVar230._0_2_;
            auVar230._18_2_ = auVar230._0_2_;
            auVar230._20_2_ = auVar230._0_2_;
            auVar230._22_2_ = auVar230._0_2_;
            auVar230._24_2_ = auVar230._0_2_;
            auVar230._26_2_ = auVar230._0_2_;
            auVar230._28_2_ = auVar230._0_2_;
            auVar230._30_2_ = auVar230._0_2_;
            auVar160 = vpblendw_avx2(auVar160,auVar230,4);
            auVar231._0_2_ = (undefined2)(uVar38 + 0xb);
            auVar231._2_2_ = auVar231._0_2_;
            auVar231._4_2_ = auVar231._0_2_;
            auVar231._6_2_ = auVar231._0_2_;
            auVar231._8_2_ = auVar231._0_2_;
            auVar231._10_2_ = auVar231._0_2_;
            auVar231._12_2_ = auVar231._0_2_;
            auVar231._14_2_ = auVar231._0_2_;
            auVar231._16_2_ = auVar231._0_2_;
            auVar231._18_2_ = auVar231._0_2_;
            auVar231._20_2_ = auVar231._0_2_;
            auVar231._22_2_ = auVar231._0_2_;
            auVar231._24_2_ = auVar231._0_2_;
            auVar231._26_2_ = auVar231._0_2_;
            auVar231._28_2_ = auVar231._0_2_;
            auVar231._30_2_ = auVar231._0_2_;
            auVar160 = vpblendw_avx2(auVar160,auVar231,8);
            auVar232._0_2_ = (undefined2)(uVar38 + 0xc);
            auVar232._2_2_ = auVar232._0_2_;
            auVar232._4_2_ = auVar232._0_2_;
            auVar232._6_2_ = auVar232._0_2_;
            auVar232._8_2_ = auVar232._0_2_;
            auVar232._10_2_ = auVar232._0_2_;
            auVar232._12_2_ = auVar232._0_2_;
            auVar232._14_2_ = auVar232._0_2_;
            auVar232._16_2_ = auVar232._0_2_;
            auVar232._18_2_ = auVar232._0_2_;
            auVar232._20_2_ = auVar232._0_2_;
            auVar232._22_2_ = auVar232._0_2_;
            auVar232._24_2_ = auVar232._0_2_;
            auVar232._26_2_ = auVar232._0_2_;
            auVar232._28_2_ = auVar232._0_2_;
            auVar232._30_2_ = auVar232._0_2_;
            auVar160 = vpblendw_avx2(auVar160,auVar232,0x10);
            auVar233._0_2_ = (undefined2)(uVar38 + 0xd);
            auVar233._2_2_ = auVar233._0_2_;
            auVar233._4_2_ = auVar233._0_2_;
            auVar233._6_2_ = auVar233._0_2_;
            auVar233._8_2_ = auVar233._0_2_;
            auVar233._10_2_ = auVar233._0_2_;
            auVar233._12_2_ = auVar233._0_2_;
            auVar233._14_2_ = auVar233._0_2_;
            auVar233._16_2_ = auVar233._0_2_;
            auVar233._18_2_ = auVar233._0_2_;
            auVar233._20_2_ = auVar233._0_2_;
            auVar233._22_2_ = auVar233._0_2_;
            auVar233._24_2_ = auVar233._0_2_;
            auVar233._26_2_ = auVar233._0_2_;
            auVar233._28_2_ = auVar233._0_2_;
            auVar233._30_2_ = auVar233._0_2_;
            auVar160 = vpblendw_avx2(auVar160,auVar233,0x20);
            auVar234._0_2_ = (undefined2)(uVar38 + 0xe);
            auVar234._2_2_ = auVar234._0_2_;
            auVar234._4_2_ = auVar234._0_2_;
            auVar234._6_2_ = auVar234._0_2_;
            auVar234._8_2_ = auVar234._0_2_;
            auVar234._10_2_ = auVar234._0_2_;
            auVar234._12_2_ = auVar234._0_2_;
            auVar234._14_2_ = auVar234._0_2_;
            auVar234._16_2_ = auVar234._0_2_;
            auVar234._18_2_ = auVar234._0_2_;
            auVar234._20_2_ = auVar234._0_2_;
            auVar234._22_2_ = auVar234._0_2_;
            auVar234._24_2_ = auVar234._0_2_;
            auVar234._26_2_ = auVar234._0_2_;
            auVar234._28_2_ = auVar234._0_2_;
            auVar234._30_2_ = auVar234._0_2_;
            auVar160 = vpblendw_avx2(auVar160,auVar234,0x40);
            auVar235._0_2_ = (undefined2)(uVar38 + 0xf);
            auVar235._2_2_ = auVar235._0_2_;
            auVar235._4_2_ = auVar235._0_2_;
            auVar235._6_2_ = auVar235._0_2_;
            auVar235._8_2_ = auVar235._0_2_;
            auVar235._10_2_ = auVar235._0_2_;
            auVar235._12_2_ = auVar235._0_2_;
            auVar235._14_2_ = auVar235._0_2_;
            auVar235._16_2_ = auVar235._0_2_;
            auVar235._18_2_ = auVar235._0_2_;
            auVar235._20_2_ = auVar235._0_2_;
            auVar235._22_2_ = auVar235._0_2_;
            auVar235._24_2_ = auVar235._0_2_;
            auVar235._26_2_ = auVar235._0_2_;
            auVar235._28_2_ = auVar235._0_2_;
            auVar235._30_2_ = auVar235._0_2_;
            auVar160 = vpblendw_avx2(auVar160,auVar235,0x80);
            auVar160 = vpblendd_avx2(ZEXT1632(auVar329),auVar160,0xf0);
            auVar160 = vpcmpgtw_avx2(auVar160,auVar115);
            auVar160 = vpblendvb_avx2(auVar135,auVar400,auVar160);
            *(undefined1 (*) [32])((long)local_2060 + lVar30) = auVar160;
            uVar43 = (ulong)(uint)((int)uVar43 + dy);
          }
        }
        else {
          auVar160._8_4_ = 0x10;
          auVar160._0_8_ = 0x1000000010;
          auVar160._12_4_ = 0x10;
          auVar160._16_4_ = 0x10;
          auVar160._20_4_ = 0x10;
          auVar160._24_4_ = 0x10;
          auVar160._28_4_ = 0x10;
          auVar325 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
          auVar135._8_2_ = 0x4e;
          auVar135._0_8_ = 0x4e004e004e004e;
          auVar135._10_2_ = 0x4e;
          auVar135._12_2_ = 0x4e;
          auVar135._14_2_ = 0x4e;
          auVar135._16_2_ = 0x4e;
          auVar135._18_2_ = 0x4e;
          auVar135._20_2_ = 0x4e;
          auVar135._22_2_ = 0x4e;
          auVar135._24_2_ = 0x4e;
          auVar135._26_2_ = 0x4e;
          auVar135._28_2_ = 0x4e;
          auVar135._30_2_ = 0x4e;
          for (; lVar30 != 0x800; lVar30 = lVar30 + 0x20) {
            uVar38 = (int)uVar43 >> 6;
            if (0x4e < (int)uVar38) goto LAB_002fb195;
            uVar34 = (uint)(uVar43 >> 1);
            uVar32 = uVar34 & 0x1f;
            auVar139._0_8_ = CONCAT44(uVar34,uVar34) & 0x1f0000001f;
            auVar139._8_4_ = uVar32;
            auVar139._12_4_ = uVar32;
            auVar139._16_4_ = uVar32;
            auVar139._20_4_ = uVar32;
            auVar139._24_4_ = uVar32;
            auVar139._28_4_ = uVar32;
            auVar179 = auVar291;
            if (uVar38 - 0x50 < 0xfffffff7) {
              auVar172 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar38 + 8));
              auVar187 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar38 + 9));
              auVar187 = vpsubd_avx2(auVar187,auVar172);
              auVar172 = vpslld_avx2(auVar172,5);
              auVar187 = vpmulld_avx2(auVar187,auVar139);
              auVar172 = vpaddd_avx2(auVar172,auVar160);
              auVar172 = vpaddd_avx2(auVar187,auVar172);
              auVar172 = vpsrld_avx2(auVar172,5);
              auVar187._0_16_ = ZEXT116(0) * auVar291 + ZEXT116(1) * auVar172._16_16_;
              auVar187._16_16_ =
                   ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar291;
              auVar172 = vpackusdw_avx2(auVar172,auVar187);
              auVar179 = auVar172._0_16_;
            }
            auVar172 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (int)uVar38));
            auVar187 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar38 + 1));
            auVar187 = vpsubd_avx2(auVar187,auVar172);
            auVar188 = vpslld_avx2(auVar172,5);
            auVar172 = vpmulld_avx2(auVar187,auVar139);
            auVar139 = vpaddd_avx2(auVar188,auVar160);
            auVar139 = vpaddd_avx2(auVar172,auVar139);
            auVar139 = vpsrld_avx2(auVar139,5);
            auVar139 = vpackusdw_avx2(auVar139,ZEXT1632(auVar139._16_16_));
            auVar172._0_16_ = ZEXT116(0) * auVar179 + ZEXT116(1) * auVar139._0_16_;
            auVar172._16_16_ = ZEXT116(0) * auVar139._16_16_ + ZEXT116(1) * auVar179;
            auVar179._0_2_ = (undefined2)uVar38;
            auVar179._2_2_ = auVar179._0_2_;
            auVar179._4_2_ = auVar179._0_2_;
            auVar179._6_2_ = auVar179._0_2_;
            auVar179._8_2_ = auVar179._0_2_;
            auVar179._10_2_ = auVar179._0_2_;
            auVar179._12_2_ = auVar179._0_2_;
            auVar179._14_2_ = auVar179._0_2_;
            auVar179 = vpaddw_avx(auVar179,auVar325);
            auVar329 = vpslldq_avx(auVar179,2);
            auVar329 = vpblendw_avx(auVar329,ZEXT416(uVar38),1);
            auVar179 = vpsrldq_avx(auVar179,0xe);
            auVar188._0_16_ = ZEXT116(0) * auVar179 + ZEXT116(1) * auVar291;
            auVar188._16_16_ = ZEXT116(0) * auVar400._16_16_ + ZEXT116(1) * auVar179;
            auVar256._0_2_ = (undefined2)(uVar38 + 9);
            auVar256._2_2_ = auVar256._0_2_;
            auVar256._4_2_ = auVar256._0_2_;
            auVar256._6_2_ = auVar256._0_2_;
            auVar256._8_2_ = auVar256._0_2_;
            auVar256._10_2_ = auVar256._0_2_;
            auVar256._12_2_ = auVar256._0_2_;
            auVar256._14_2_ = auVar256._0_2_;
            auVar256._16_2_ = auVar256._0_2_;
            auVar256._18_2_ = auVar256._0_2_;
            auVar256._20_2_ = auVar256._0_2_;
            auVar256._22_2_ = auVar256._0_2_;
            auVar256._24_2_ = auVar256._0_2_;
            auVar256._26_2_ = auVar256._0_2_;
            auVar256._28_2_ = auVar256._0_2_;
            auVar256._30_2_ = auVar256._0_2_;
            auVar139 = vpblendw_avx2(auVar188,auVar256,2);
            auVar257._0_2_ = (undefined2)(uVar38 + 10);
            auVar257._2_2_ = auVar257._0_2_;
            auVar257._4_2_ = auVar257._0_2_;
            auVar257._6_2_ = auVar257._0_2_;
            auVar257._8_2_ = auVar257._0_2_;
            auVar257._10_2_ = auVar257._0_2_;
            auVar257._12_2_ = auVar257._0_2_;
            auVar257._14_2_ = auVar257._0_2_;
            auVar257._16_2_ = auVar257._0_2_;
            auVar257._18_2_ = auVar257._0_2_;
            auVar257._20_2_ = auVar257._0_2_;
            auVar257._22_2_ = auVar257._0_2_;
            auVar257._24_2_ = auVar257._0_2_;
            auVar257._26_2_ = auVar257._0_2_;
            auVar257._28_2_ = auVar257._0_2_;
            auVar257._30_2_ = auVar257._0_2_;
            auVar139 = vpblendw_avx2(auVar139,auVar257,4);
            auVar258._0_2_ = (undefined2)(uVar38 + 0xb);
            auVar258._2_2_ = auVar258._0_2_;
            auVar258._4_2_ = auVar258._0_2_;
            auVar258._6_2_ = auVar258._0_2_;
            auVar258._8_2_ = auVar258._0_2_;
            auVar258._10_2_ = auVar258._0_2_;
            auVar258._12_2_ = auVar258._0_2_;
            auVar258._14_2_ = auVar258._0_2_;
            auVar258._16_2_ = auVar258._0_2_;
            auVar258._18_2_ = auVar258._0_2_;
            auVar258._20_2_ = auVar258._0_2_;
            auVar258._22_2_ = auVar258._0_2_;
            auVar258._24_2_ = auVar258._0_2_;
            auVar258._26_2_ = auVar258._0_2_;
            auVar258._28_2_ = auVar258._0_2_;
            auVar258._30_2_ = auVar258._0_2_;
            auVar139 = vpblendw_avx2(auVar139,auVar258,8);
            auVar259._0_2_ = (undefined2)(uVar38 + 0xc);
            auVar259._2_2_ = auVar259._0_2_;
            auVar259._4_2_ = auVar259._0_2_;
            auVar259._6_2_ = auVar259._0_2_;
            auVar259._8_2_ = auVar259._0_2_;
            auVar259._10_2_ = auVar259._0_2_;
            auVar259._12_2_ = auVar259._0_2_;
            auVar259._14_2_ = auVar259._0_2_;
            auVar259._16_2_ = auVar259._0_2_;
            auVar259._18_2_ = auVar259._0_2_;
            auVar259._20_2_ = auVar259._0_2_;
            auVar259._22_2_ = auVar259._0_2_;
            auVar259._24_2_ = auVar259._0_2_;
            auVar259._26_2_ = auVar259._0_2_;
            auVar259._28_2_ = auVar259._0_2_;
            auVar259._30_2_ = auVar259._0_2_;
            auVar139 = vpblendw_avx2(auVar139,auVar259,0x10);
            auVar260._0_2_ = (undefined2)(uVar38 + 0xd);
            auVar260._2_2_ = auVar260._0_2_;
            auVar260._4_2_ = auVar260._0_2_;
            auVar260._6_2_ = auVar260._0_2_;
            auVar260._8_2_ = auVar260._0_2_;
            auVar260._10_2_ = auVar260._0_2_;
            auVar260._12_2_ = auVar260._0_2_;
            auVar260._14_2_ = auVar260._0_2_;
            auVar260._16_2_ = auVar260._0_2_;
            auVar260._18_2_ = auVar260._0_2_;
            auVar260._20_2_ = auVar260._0_2_;
            auVar260._22_2_ = auVar260._0_2_;
            auVar260._24_2_ = auVar260._0_2_;
            auVar260._26_2_ = auVar260._0_2_;
            auVar260._28_2_ = auVar260._0_2_;
            auVar260._30_2_ = auVar260._0_2_;
            auVar139 = vpblendw_avx2(auVar139,auVar260,0x20);
            auVar261._0_2_ = (undefined2)(uVar38 + 0xe);
            auVar261._2_2_ = auVar261._0_2_;
            auVar261._4_2_ = auVar261._0_2_;
            auVar261._6_2_ = auVar261._0_2_;
            auVar261._8_2_ = auVar261._0_2_;
            auVar261._10_2_ = auVar261._0_2_;
            auVar261._12_2_ = auVar261._0_2_;
            auVar261._14_2_ = auVar261._0_2_;
            auVar261._16_2_ = auVar261._0_2_;
            auVar261._18_2_ = auVar261._0_2_;
            auVar261._20_2_ = auVar261._0_2_;
            auVar261._22_2_ = auVar261._0_2_;
            auVar261._24_2_ = auVar261._0_2_;
            auVar261._26_2_ = auVar261._0_2_;
            auVar261._28_2_ = auVar261._0_2_;
            auVar261._30_2_ = auVar261._0_2_;
            auVar139 = vpblendw_avx2(auVar139,auVar261,0x40);
            auVar262._0_2_ = (undefined2)(uVar38 + 0xf);
            auVar262._2_2_ = auVar262._0_2_;
            auVar262._4_2_ = auVar262._0_2_;
            auVar262._6_2_ = auVar262._0_2_;
            auVar262._8_2_ = auVar262._0_2_;
            auVar262._10_2_ = auVar262._0_2_;
            auVar262._12_2_ = auVar262._0_2_;
            auVar262._14_2_ = auVar262._0_2_;
            auVar262._16_2_ = auVar262._0_2_;
            auVar262._18_2_ = auVar262._0_2_;
            auVar262._20_2_ = auVar262._0_2_;
            auVar262._22_2_ = auVar262._0_2_;
            auVar262._24_2_ = auVar262._0_2_;
            auVar262._26_2_ = auVar262._0_2_;
            auVar262._28_2_ = auVar262._0_2_;
            auVar262._30_2_ = auVar262._0_2_;
            auVar139 = vpblendw_avx2(auVar139,auVar262,0x80);
            auVar139 = vpblendd_avx2(ZEXT1632(auVar329),auVar139,0xf0);
            auVar139 = vpcmpgtw_avx2(auVar139,auVar135);
            auVar139 = vpblendvb_avx2(auVar172,auVar400,auVar139);
            *(undefined1 (*) [32])((long)local_2060 + lVar30) = auVar139;
            uVar43 = (ulong)(uint)((int)uVar43 + dy);
          }
        }
        goto LAB_002fb19d;
      }
      if (bh == 8) {
        iVar28 = 0x27 << (bVar26 & 0x1f);
        uVar3 = left[iVar28];
        auVar325._2_2_ = uVar3;
        auVar325._0_2_ = uVar3;
        auVar325._4_2_ = uVar3;
        auVar325._6_2_ = uVar3;
        auVar325._8_2_ = uVar3;
        auVar325._10_2_ = uVar3;
        auVar325._12_2_ = uVar3;
        auVar325._14_2_ = uVar3;
        auVar64._16_2_ = uVar3;
        auVar64._0_16_ = auVar325;
        auVar64._18_2_ = uVar3;
        auVar64._20_2_ = uVar3;
        auVar64._22_2_ = uVar3;
        auVar64._24_2_ = uVar3;
        auVar64._26_2_ = uVar3;
        auVar64._28_2_ = uVar3;
        auVar64._30_2_ = uVar3;
        if (bd < 0xc) {
          auVar75._0_2_ = (undefined2)iVar28;
          auVar75._2_2_ = auVar75._0_2_;
          auVar75._4_2_ = auVar75._0_2_;
          auVar75._6_2_ = auVar75._0_2_;
          auVar75._8_2_ = auVar75._0_2_;
          auVar75._10_2_ = auVar75._0_2_;
          auVar75._12_2_ = auVar75._0_2_;
          auVar75._14_2_ = auVar75._0_2_;
          auVar101._8_2_ = 0x10;
          auVar101._0_8_ = 0x10001000100010;
          auVar101._10_2_ = 0x10;
          auVar101._12_2_ = 0x10;
          auVar101._14_2_ = 0x10;
          auVar165._8_2_ = 0x1f;
          auVar165._0_8_ = 0x1f001f001f001f;
          auVar165._10_2_ = 0x1f;
          auVar165._12_2_ = 0x1f;
          auVar165._14_2_ = 0x1f;
          auVar165._16_2_ = 0x1f;
          auVar165._18_2_ = 0x1f;
          auVar165._20_2_ = 0x1f;
          auVar165._22_2_ = 0x1f;
          auVar165._24_2_ = 0x1f;
          auVar165._26_2_ = 0x1f;
          auVar165._28_2_ = 0x1f;
          auVar165._30_2_ = 0x1f;
          for (lVar30 = 0; lVar30 != 0x200; lVar30 = lVar30 + 0x10) {
            uVar38 = (int)uVar43 >> (6 - bVar26 & 0x1f);
            if (iVar28 <= (int)uVar38) goto LAB_002fa009;
            auVar291 = *(undefined1 (*) [16])(left + (int)uVar38);
            if (upsample_left == 0) {
              auVar179 = *(undefined1 (*) [16])(left + (long)(int)uVar38 + 1);
              auVar329 = vpinsrw_avx(ZEXT416(uVar38),uVar38 + 1,1);
              auVar329 = vpinsrw_avx(auVar329,uVar38 + 2,2);
              auVar329 = vpinsrw_avx(auVar329,uVar38 + 3,3);
              auVar329 = vpinsrw_avx(auVar329,uVar38 + 4,4);
              auVar329 = vpinsrw_avx(auVar329,uVar38 + 5,5);
              auVar329 = vpinsrw_avx(auVar329,uVar38 + 6,6);
              auVar329 = vpinsrw_avx(auVar329,uVar38 + 7,7);
              uVar6 = (ushort)(uVar43 >> 1);
              uVar387 = uVar6 & 0x1f;
              auVar330._0_8_ =
                   CONCAT26(uVar6,CONCAT24(uVar6,CONCAT22(uVar6,uVar6))) & 0x1f001f001f001f;
              auVar330._8_2_ = uVar387;
              auVar330._10_2_ = uVar387;
              auVar330._12_2_ = uVar387;
              auVar330._14_2_ = uVar387;
            }
            else {
              auVar179 = vpblendw_avx(auVar291,(undefined1  [16])0x0,0xaa);
              auVar329 = vpblendw_avx(*(undefined1 (*) [16])(left + (long)(int)uVar38 + 8),
                                      (undefined1  [16])0x0,0xaa);
              auVar398 = vpsrld_avx(auVar291,0x10);
              auVar291 = vpackusdw_avx(auVar179,auVar329);
              auVar397 = vpsrld_avx(*(undefined1 (*) [16])(left + (long)(int)uVar38 + 8),0x10);
              auVar179 = vpinsrw_avx(ZEXT416(uVar38),uVar38 + 2,1);
              auVar179 = vpinsrw_avx(auVar179,uVar38 + 4,2);
              auVar179 = vpinsrw_avx(auVar179,uVar38 + 6,3);
              auVar179 = vpinsrw_avx(auVar179,uVar38 + 8,4);
              auVar179 = vpinsrw_avx(auVar179,uVar38 + 10,5);
              auVar179 = vpinsrw_avx(auVar179,uVar38 + 0xc,6);
              auVar329 = vpinsrw_avx(auVar179,uVar38 + 0xe,7);
              auVar339._0_2_ = (undefined2)uVar43;
              auVar339._2_2_ = auVar339._0_2_;
              auVar339._4_2_ = auVar339._0_2_;
              auVar339._6_2_ = auVar339._0_2_;
              auVar339._8_2_ = auVar339._0_2_;
              auVar339._10_2_ = auVar339._0_2_;
              auVar339._12_2_ = auVar339._0_2_;
              auVar339._14_2_ = auVar339._0_2_;
              auVar339._16_2_ = auVar339._0_2_;
              auVar339._18_2_ = auVar339._0_2_;
              auVar339._20_2_ = auVar339._0_2_;
              auVar339._22_2_ = auVar339._0_2_;
              auVar339._24_2_ = auVar339._0_2_;
              auVar339._26_2_ = auVar339._0_2_;
              auVar339._28_2_ = auVar339._0_2_;
              auVar339._30_2_ = auVar339._0_2_;
              auVar400 = vpsllw_avx2(auVar339,ZEXT416((uint)upsample_left));
              auVar179 = vpackusdw_avx(auVar398,auVar397);
              auVar400 = vpsrlw_avx2(auVar400,1);
              auVar400 = vpand_avx2(auVar400,auVar165);
              auVar330 = auVar400._0_16_;
            }
            auVar397 = vpsllw_avx(auVar291,5);
            auVar397 = vpaddw_avx(auVar397,auVar101);
            auVar291 = vpsubw_avx(auVar179,auVar291);
            auVar291 = vpmullw_avx(auVar330,auVar291);
            auVar291 = vpaddw_avx(auVar397,auVar291);
            auVar179 = vpsrlw_avx(auVar291,5);
            auVar291 = vpcmpgtw_avx(auVar75,auVar329);
            auVar291 = vpblendvb_avx(auVar325,auVar179,auVar291);
            *(undefined1 (*) [16])((long)local_2060 + lVar30) = auVar291;
            uVar43 = (ulong)(uint)((int)uVar43 + dy);
          }
        }
        else {
          auVar91._4_4_ = iVar28;
          auVar91._0_4_ = iVar28;
          auVar91._8_4_ = iVar28;
          auVar91._12_4_ = iVar28;
          auVar91._16_4_ = iVar28;
          auVar91._20_4_ = iVar28;
          auVar91._24_4_ = iVar28;
          auVar91._28_4_ = iVar28;
          lVar30 = 0;
          auVar291 = vpmovsxbd_avx(ZEXT416(0x3020104));
          auVar120._8_4_ = 0x10;
          auVar120._0_8_ = 0x1000000010;
          auVar120._12_4_ = 0x10;
          auVar120._16_4_ = 0x10;
          auVar120._20_4_ = 0x10;
          auVar120._24_4_ = 0x10;
          auVar120._28_4_ = 0x10;
          auVar179 = vpmovsxbd_avx(ZEXT416(0x6040208));
          auVar186._8_4_ = 0x1f;
          auVar186._0_8_ = 0x1f0000001f;
          auVar186._12_4_ = 0x1f;
          auVar186._16_4_ = 0x1f;
          auVar186._20_4_ = 0x1f;
          auVar186._24_4_ = 0x1f;
          auVar186._28_4_ = 0x1f;
          for (; lVar30 != 0x200; lVar30 = lVar30 + 0x10) {
            iVar40 = (int)uVar43;
            iVar39 = iVar40 >> (6 - bVar26 & 0x1f);
            if (iVar28 <= iVar39) goto LAB_002fae9e;
            auVar255 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + iVar39));
            if (upsample_left == 0) {
              auVar400 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)iVar39 + 1));
              auVar397._4_4_ = iVar39;
              auVar397._0_4_ = iVar39;
              auVar397._8_4_ = iVar39;
              auVar397._12_4_ = iVar39;
              iVar1 = iVar39 + 5;
              iVar2 = iVar39 + 6;
              iVar39 = iVar39 + 7;
              auVar329 = vpaddd_avx(auVar397,auVar291);
              auVar160 = vpermq_avx2(ZEXT1632(auVar329),0xc4);
              auVar160 = vpblendd_avx2(auVar160,ZEXT1632(auVar397),1);
              auVar368._4_4_ = iVar1;
              auVar368._0_4_ = iVar1;
              auVar368._8_4_ = iVar1;
              auVar368._12_4_ = iVar1;
              auVar368._16_4_ = iVar1;
              auVar368._20_4_ = iVar1;
              auVar368._24_4_ = iVar1;
              auVar368._28_4_ = iVar1;
              auVar160 = vpblendd_avx2(auVar160,auVar368,0x20);
              auVar369._4_4_ = iVar2;
              auVar369._0_4_ = iVar2;
              auVar369._8_4_ = iVar2;
              auVar369._12_4_ = iVar2;
              auVar369._16_4_ = iVar2;
              auVar369._20_4_ = iVar2;
              auVar369._24_4_ = iVar2;
              auVar369._28_4_ = iVar2;
              auVar160 = vpblendd_avx2(auVar160,auVar369,0x40);
              auVar370._4_4_ = iVar39;
              auVar370._0_4_ = iVar39;
              auVar370._8_4_ = iVar39;
              auVar370._12_4_ = iVar39;
              auVar370._16_4_ = iVar39;
              auVar370._20_4_ = iVar39;
              auVar370._24_4_ = iVar39;
              auVar370._28_4_ = iVar39;
              auVar160 = vpblendd_avx2(auVar160,auVar370,0x80);
              uVar38 = (uint)(uVar43 >> 1);
              uVar34 = uVar38 & 0x1f;
              auVar371._0_8_ = CONCAT44(uVar38,uVar38) & 0x1f0000001f;
              auVar371._8_4_ = uVar34;
              auVar371._12_4_ = uVar34;
              auVar371._16_4_ = uVar34;
              auVar371._20_4_ = uVar34;
              auVar371._24_4_ = uVar34;
              auVar371._28_4_ = uVar34;
            }
            else {
              auVar400 = vpshufd_avx2(auVar255,0xd8);
              auVar135 = vpermq_avx2(auVar400,0xd8);
              auVar400 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)iVar39 + 8));
              auVar400 = vpshufd_avx2(auVar400,0xd8);
              auVar139 = vpermq_avx2(auVar400,0xd8);
              auVar398._4_4_ = iVar39;
              auVar398._0_4_ = iVar39;
              auVar398._8_4_ = iVar39;
              auVar398._12_4_ = iVar39;
              iVar1 = iVar39 + 10;
              iVar2 = iVar39 + 0xc;
              iVar39 = iVar39 + 0xe;
              auVar329 = vpaddd_avx(auVar398,auVar179);
              auVar400 = vpermq_avx2(ZEXT1632(auVar329),0xc4);
              auVar400 = vpblendd_avx2(auVar400,ZEXT1632(auVar398),1);
              auVar341._4_4_ = iVar1;
              auVar341._0_4_ = iVar1;
              auVar341._8_4_ = iVar1;
              auVar341._12_4_ = iVar1;
              auVar341._16_4_ = iVar1;
              auVar341._20_4_ = iVar1;
              auVar341._24_4_ = iVar1;
              auVar341._28_4_ = iVar1;
              auVar400 = vpblendd_avx2(auVar400,auVar341,0x20);
              auVar342._4_4_ = iVar2;
              auVar342._0_4_ = iVar2;
              auVar342._8_4_ = iVar2;
              auVar342._12_4_ = iVar2;
              auVar342._16_4_ = iVar2;
              auVar342._20_4_ = iVar2;
              auVar342._24_4_ = iVar2;
              auVar342._28_4_ = iVar2;
              auVar400 = vpblendd_avx2(auVar400,auVar342,0x40);
              auVar343._4_4_ = iVar39;
              auVar343._0_4_ = iVar39;
              auVar343._8_4_ = iVar39;
              auVar343._12_4_ = iVar39;
              auVar343._16_4_ = iVar39;
              auVar343._20_4_ = iVar39;
              auVar343._24_4_ = iVar39;
              auVar343._28_4_ = iVar39;
              auVar160 = vpblendd_avx2(auVar400,auVar343,0x80);
              auVar254._4_4_ = iVar40;
              auVar254._0_4_ = iVar40;
              auVar254._8_4_ = iVar40;
              auVar254._12_4_ = iVar40;
              auVar254._16_4_ = iVar40;
              auVar254._20_4_ = iVar40;
              auVar254._24_4_ = iVar40;
              auVar254._28_4_ = iVar40;
              auVar400 = vpslld_avx2(auVar254,ZEXT416((uint)upsample_left));
              auVar255._0_16_ = ZEXT116(0) * auVar139._0_16_ + ZEXT116(1) * auVar135._0_16_;
              auVar255._16_16_ = ZEXT116(0) * auVar135._16_16_ + ZEXT116(1) * auVar139._0_16_;
              auVar400 = vpsrld_avx2(auVar400,1);
              auVar371 = vpand_avx2(auVar400,auVar186);
              auVar400 = vperm2i128_avx2(auVar135,auVar139,0x31);
            }
            auVar160 = vpcmpgtd_avx2(auVar91,auVar160);
            auVar400 = vpsubd_avx2(auVar400,auVar255);
            auVar135 = vpmulld_avx2(auVar400,auVar371);
            auVar400 = vpslld_avx2(auVar255,5);
            auVar400 = vpaddd_avx2(auVar400,auVar120);
            auVar400 = vpaddd_avx2(auVar135,auVar400);
            auVar400 = vpsrld_avx2(auVar400,5);
            auVar397 = vpackusdw_avx(auVar400._0_16_,auVar400._16_16_);
            auVar329 = vpackssdw_avx(auVar160._0_16_,auVar160._16_16_);
            auVar400 = vpblendvb_avx2(auVar64,ZEXT1632(auVar397),ZEXT1632(auVar329));
            *(undefined1 (*) [16])((long)local_2060 + lVar30) = auVar400._0_16_;
            uVar43 = (ulong)(uint)(iVar40 + dy);
          }
        }
        goto LAB_002faea7;
      }
      if (bh != 4) {
        return;
      }
      iVar28 = 0x13 << (bVar26 & 0x1f);
      uVar3 = left[iVar28];
      auVar49._2_2_ = uVar3;
      auVar49._0_2_ = uVar3;
      auVar49._4_2_ = uVar3;
      auVar49._6_2_ = uVar3;
      auVar49._8_2_ = uVar3;
      auVar49._10_2_ = uVar3;
      auVar49._12_2_ = uVar3;
      auVar49._14_2_ = uVar3;
      if (bd < 0xc) {
        auVar72._0_2_ = (undefined2)iVar28;
        auVar72._2_2_ = auVar72._0_2_;
        auVar72._4_2_ = auVar72._0_2_;
        auVar72._6_2_ = auVar72._0_2_;
        auVar72._8_2_ = auVar72._0_2_;
        auVar72._10_2_ = auVar72._0_2_;
        auVar72._12_2_ = auVar72._0_2_;
        auVar72._14_2_ = auVar72._0_2_;
        auVar107._8_2_ = 0x10;
        auVar107._0_8_ = 0x10001000100010;
        auVar107._10_2_ = 0x10;
        auVar107._12_2_ = 0x10;
        auVar107._14_2_ = 0x10;
        auVar207._8_2_ = 0x1f;
        auVar207._0_8_ = 0x1f001f001f001f;
        auVar207._10_2_ = 0x1f;
        auVar207._12_2_ = 0x1f;
        auVar207._14_2_ = 0x1f;
        auVar207._16_2_ = 0x1f;
        auVar207._18_2_ = 0x1f;
        auVar207._20_2_ = 0x1f;
        auVar207._22_2_ = 0x1f;
        auVar207._24_2_ = 0x1f;
        auVar207._26_2_ = 0x1f;
        auVar207._28_2_ = 0x1f;
        auVar207._30_2_ = 0x1f;
        uVar38 = dy;
        for (lVar30 = 0; lVar30 != 0x100; lVar30 = lVar30 + 0x10) {
          uVar34 = (int)uVar38 >> (6 - bVar26 & 0x1f);
          if (iVar28 <= (int)uVar34) goto LAB_002f8d66;
          auVar291 = *(undefined1 (*) [16])(left + (int)uVar34);
          auVar394._0_2_ = (undefined2)uVar34;
          if (upsample_left == 0) {
            auVar325 = *(undefined1 (*) [16])(left + (long)(int)uVar34 + 1);
            auVar395._2_2_ = auVar394._0_2_;
            auVar395._0_2_ = auVar394._0_2_;
            auVar395._4_2_ = auVar394._0_2_;
            auVar395._6_2_ = auVar394._0_2_;
            auVar395._8_2_ = auVar394._0_2_;
            auVar395._10_2_ = auVar394._0_2_;
            auVar395._12_2_ = auVar394._0_2_;
            auVar395._14_2_ = auVar394._0_2_;
            auVar179 = vpaddw_avx(auVar395,ZEXT816(0x7000600050004));
            auVar329 = vpinsrw_avx(ZEXT416(uVar34),uVar34 + 1,1);
            auVar329 = vpinsrw_avx(auVar329,uVar34 + 2,2);
            auVar329 = vpinsrw_avx(auVar329,uVar34 + 3,3);
            auVar179 = vpunpcklqdq_avx(auVar329,auVar179);
            uVar6 = (ushort)(uVar38 >> 1);
            uVar387 = uVar6 & 0x1f;
            auVar396._0_8_ =
                 CONCAT26(uVar6,CONCAT24(uVar6,CONCAT22(uVar6,uVar6))) & 0x1f001f001f001f;
            auVar396._8_2_ = uVar387;
            auVar396._10_2_ = uVar387;
            auVar396._12_2_ = uVar387;
            auVar396._14_2_ = uVar387;
          }
          else {
            auVar291 = vpshufb_avx(auVar291,_DAT_0046f500);
            auVar325 = vpsrldq_avx(auVar291,8);
            auVar394._2_2_ = auVar394._0_2_;
            auVar394._4_2_ = auVar394._0_2_;
            auVar394._6_2_ = auVar394._0_2_;
            auVar394._8_2_ = auVar394._0_2_;
            auVar394._10_2_ = auVar394._0_2_;
            auVar394._12_2_ = auVar394._0_2_;
            auVar394._14_2_ = auVar394._0_2_;
            auVar179 = vpinsrw_avx(ZEXT416(uVar34),uVar34 + 2,1);
            auVar179 = vpinsrw_avx(auVar179,uVar34 + 4,2);
            auVar329 = vpinsrw_avx(auVar179,uVar34 + 6,3);
            auVar179 = vpaddw_avx(auVar394,ZEXT816(0xe000c000a0008));
            auVar179 = vpunpcklqdq_avx(auVar329,auVar179);
            auVar402._0_2_ = (undefined2)uVar38;
            auVar402._2_2_ = auVar402._0_2_;
            auVar402._4_2_ = auVar402._0_2_;
            auVar402._6_2_ = auVar402._0_2_;
            auVar402._8_2_ = auVar402._0_2_;
            auVar402._10_2_ = auVar402._0_2_;
            auVar402._12_2_ = auVar402._0_2_;
            auVar402._14_2_ = auVar402._0_2_;
            auVar402._16_2_ = auVar402._0_2_;
            auVar402._18_2_ = auVar402._0_2_;
            auVar402._20_2_ = auVar402._0_2_;
            auVar402._22_2_ = auVar402._0_2_;
            auVar402._24_2_ = auVar402._0_2_;
            auVar402._26_2_ = auVar402._0_2_;
            auVar402._28_2_ = auVar402._0_2_;
            auVar402._30_2_ = auVar402._0_2_;
            auVar400 = vpsllw_avx2(auVar402,ZEXT416((uint)upsample_left));
            auVar400 = vpsrlw_avx2(auVar400,1);
            auVar400 = vpand_avx2(auVar400,auVar207);
            auVar396 = auVar400._0_16_;
          }
          auVar179 = vpcmpgtw_avx(auVar72,auVar179);
          auVar325 = vpsubw_avx(auVar325,auVar291);
          auVar325 = vpmullw_avx(auVar325,auVar396);
          auVar291 = vpsllw_avx(auVar291,5);
          auVar291 = vpaddw_avx(auVar291,auVar107);
          auVar291 = vpaddw_avx(auVar325,auVar291);
          auVar291 = vpsrlw_avx(auVar291,5);
          auVar291 = vpblendvb_avx(auVar49,auVar291,auVar179);
          *(undefined1 (*) [16])((long)local_2060 + lVar30) = auVar291;
          uVar38 = uVar38 + dy;
        }
      }
      else {
        auVar77._4_4_ = iVar28;
        auVar77._0_4_ = iVar28;
        auVar77._8_4_ = iVar28;
        auVar77._12_4_ = iVar28;
        auVar103._8_4_ = 0x10;
        auVar103._0_8_ = 0x1000000010;
        auVar103._12_4_ = 0x10;
        auVar142._8_4_ = 0x1f;
        auVar142._0_8_ = 0x1f0000001f;
        auVar142._12_4_ = 0x1f;
        auVar142._16_4_ = 0x1f;
        auVar142._20_4_ = 0x1f;
        auVar142._24_4_ = 0x1f;
        auVar142._28_4_ = 0x1f;
        for (lVar30 = 0; lVar30 != 0x100; lVar30 = lVar30 + 0x10) {
          iVar40 = (int)uVar43;
          uVar38 = iVar40 >> (6 - bVar26 & 0x1f);
          if (iVar28 <= (int)uVar38) goto LAB_002fb58e;
          auVar400 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (int)uVar38));
          auVar291 = auVar400._0_16_;
          if (upsample_left == 0) {
            auVar400 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar38 + 1));
            auVar179 = auVar400._0_16_;
            auVar325 = vpinsrd_avx(ZEXT416(uVar38),uVar38 + 1,1);
            auVar325 = vpinsrd_avx(auVar325,uVar38 + 2,2);
            auVar325 = vpinsrd_avx(auVar325,uVar38 + 3,3);
            uVar38 = (uint)(uVar43 >> 1);
            auVar295._0_8_ = CONCAT44(uVar38,uVar38) & 0x1f0000001f;
            auVar295._8_4_ = uVar38 & 0x1f;
            auVar295._12_4_ = uVar38 & 0x1f;
          }
          else {
            auVar400 = vpshufd_avx2(auVar400,0xd8);
            auVar400 = vpermq_avx2(auVar400,0xd8);
            auVar291 = auVar400._0_16_;
            auVar179 = ZEXT116(0) * auVar49 + ZEXT116(1) * auVar400._16_16_;
            auVar325 = vpinsrd_avx(ZEXT416(uVar38),uVar38 + 2,1);
            auVar325 = vpinsrd_avx(auVar325,uVar38 + 4,2);
            auVar325 = vpinsrd_avx(auVar325,uVar38 + 6,3);
            auVar322._4_4_ = iVar40;
            auVar322._0_4_ = iVar40;
            auVar322._8_4_ = iVar40;
            auVar322._12_4_ = iVar40;
            auVar322._16_4_ = iVar40;
            auVar322._20_4_ = iVar40;
            auVar322._24_4_ = iVar40;
            auVar322._28_4_ = iVar40;
            auVar400 = vpslld_avx2(auVar322,ZEXT416((uint)upsample_left));
            auVar400 = vpsrld_avx2(auVar400,1);
            auVar400 = vpand_avx2(auVar400,auVar142);
            auVar295 = auVar400._0_16_;
          }
          auVar329 = vpcmpgtd_avx(auVar77,auVar325);
          auVar325 = vpsubd_avx(auVar179,auVar291);
          auVar325 = vpmulld_avx(auVar325,auVar295);
          auVar291 = vpslld_avx(auVar291,5);
          auVar291 = vpaddd_avx(auVar291,auVar103);
          auVar291 = vpaddd_avx(auVar325,auVar291);
          auVar291 = vpsrld_avx(auVar291,5);
          auVar325 = vpackusdw_avx(auVar291,auVar291);
          auVar291 = vpackssdw_avx(auVar329,auVar329);
          auVar291 = vpblendvb_avx(auVar49,auVar325,auVar291);
          *(undefined1 (*) [16])((long)local_2060 + lVar30) = auVar291;
          uVar43 = (ulong)(uint)(iVar40 + dy);
        }
      }
      goto LAB_002fb597;
    }
    switch(bh << 0x1e | bh - 4U >> 2) {
    case 0:
      iVar28 = 0xb << (bVar26 & 0x1f);
      uVar3 = left[iVar28];
      auVar47._2_2_ = uVar3;
      auVar47._0_2_ = uVar3;
      auVar47._4_2_ = uVar3;
      auVar47._6_2_ = uVar3;
      auVar47._8_2_ = uVar3;
      auVar47._10_2_ = uVar3;
      auVar47._12_2_ = uVar3;
      auVar47._14_2_ = uVar3;
      if (bd < 0xc) {
        auVar71._0_2_ = (undefined2)iVar28;
        auVar71._2_2_ = auVar71._0_2_;
        auVar71._4_2_ = auVar71._0_2_;
        auVar71._6_2_ = auVar71._0_2_;
        auVar71._8_2_ = auVar71._0_2_;
        auVar71._10_2_ = auVar71._0_2_;
        auVar71._12_2_ = auVar71._0_2_;
        auVar71._14_2_ = auVar71._0_2_;
        auVar106._8_2_ = 0x10;
        auVar106._0_8_ = 0x10001000100010;
        auVar106._10_2_ = 0x10;
        auVar106._12_2_ = 0x10;
        auVar106._14_2_ = 0x10;
        auVar199._8_2_ = 0x1f;
        auVar199._0_8_ = 0x1f001f001f001f;
        auVar199._10_2_ = 0x1f;
        auVar199._12_2_ = 0x1f;
        auVar199._14_2_ = 0x1f;
        auVar199._16_2_ = 0x1f;
        auVar199._18_2_ = 0x1f;
        auVar199._20_2_ = 0x1f;
        auVar199._22_2_ = 0x1f;
        auVar199._24_2_ = 0x1f;
        auVar199._26_2_ = 0x1f;
        auVar199._28_2_ = 0x1f;
        auVar199._30_2_ = 0x1f;
        uVar38 = dy;
        for (lVar30 = 0; lVar30 != 0x80; lVar30 = lVar30 + 0x10) {
          uVar34 = (int)uVar38 >> (6 - bVar26 & 0x1f);
          if (iVar28 <= (int)uVar34) goto LAB_002f8a36;
          auVar291 = *(undefined1 (*) [16])(left + (int)uVar34);
          auVar391._0_2_ = (undefined2)uVar34;
          if (upsample_left == 0) {
            auVar325 = *(undefined1 (*) [16])(left + (long)(int)uVar34 + 1);
            auVar392._2_2_ = auVar391._0_2_;
            auVar392._0_2_ = auVar391._0_2_;
            auVar392._4_2_ = auVar391._0_2_;
            auVar392._6_2_ = auVar391._0_2_;
            auVar392._8_2_ = auVar391._0_2_;
            auVar392._10_2_ = auVar391._0_2_;
            auVar392._12_2_ = auVar391._0_2_;
            auVar392._14_2_ = auVar391._0_2_;
            auVar179 = vpaddw_avx(auVar392,ZEXT816(0x7000600050004));
            auVar329 = vpinsrw_avx(ZEXT416(uVar34),uVar34 + 1,1);
            auVar329 = vpinsrw_avx(auVar329,uVar34 + 2,2);
            auVar329 = vpinsrw_avx(auVar329,uVar34 + 3,3);
            auVar179 = vpunpcklqdq_avx(auVar329,auVar179);
            uVar6 = (ushort)(uVar38 >> 1);
            uVar387 = uVar6 & 0x1f;
            auVar393._0_8_ =
                 CONCAT26(uVar6,CONCAT24(uVar6,CONCAT22(uVar6,uVar6))) & 0x1f001f001f001f;
            auVar393._8_2_ = uVar387;
            auVar393._10_2_ = uVar387;
            auVar393._12_2_ = uVar387;
            auVar393._14_2_ = uVar387;
          }
          else {
            auVar291 = vpshufb_avx(auVar291,_DAT_0046f500);
            auVar325 = vpsrldq_avx(auVar291,8);
            auVar391._2_2_ = auVar391._0_2_;
            auVar391._4_2_ = auVar391._0_2_;
            auVar391._6_2_ = auVar391._0_2_;
            auVar391._8_2_ = auVar391._0_2_;
            auVar391._10_2_ = auVar391._0_2_;
            auVar391._12_2_ = auVar391._0_2_;
            auVar391._14_2_ = auVar391._0_2_;
            auVar179 = vpinsrw_avx(ZEXT416(uVar34),uVar34 + 2,1);
            auVar179 = vpinsrw_avx(auVar179,uVar34 + 4,2);
            auVar329 = vpinsrw_avx(auVar179,uVar34 + 6,3);
            auVar179 = vpaddw_avx(auVar391,ZEXT816(0xe000c000a0008));
            auVar179 = vpunpcklqdq_avx(auVar329,auVar179);
            auVar401._0_2_ = (undefined2)uVar38;
            auVar401._2_2_ = auVar401._0_2_;
            auVar401._4_2_ = auVar401._0_2_;
            auVar401._6_2_ = auVar401._0_2_;
            auVar401._8_2_ = auVar401._0_2_;
            auVar401._10_2_ = auVar401._0_2_;
            auVar401._12_2_ = auVar401._0_2_;
            auVar401._14_2_ = auVar401._0_2_;
            auVar401._16_2_ = auVar401._0_2_;
            auVar401._18_2_ = auVar401._0_2_;
            auVar401._20_2_ = auVar401._0_2_;
            auVar401._22_2_ = auVar401._0_2_;
            auVar401._24_2_ = auVar401._0_2_;
            auVar401._26_2_ = auVar401._0_2_;
            auVar401._28_2_ = auVar401._0_2_;
            auVar401._30_2_ = auVar401._0_2_;
            auVar400 = vpsllw_avx2(auVar401,ZEXT416((uint)upsample_left));
            auVar400 = vpsrlw_avx2(auVar400,1);
            auVar400 = vpand_avx2(auVar400,auVar199);
            auVar393 = auVar400._0_16_;
          }
          auVar179 = vpcmpgtw_avx(auVar71,auVar179);
          auVar325 = vpsubw_avx(auVar325,auVar291);
          auVar325 = vpmullw_avx(auVar325,auVar393);
          auVar291 = vpsllw_avx(auVar291,5);
          auVar291 = vpaddw_avx(auVar291,auVar106);
          auVar291 = vpaddw_avx(auVar325,auVar291);
          auVar291 = vpsrlw_avx(auVar291,5);
          auVar291 = vpblendvb_avx(auVar47,auVar291,auVar179);
          *(undefined1 (*) [16])((long)local_2060 + lVar30) = auVar291;
          uVar38 = uVar38 + dy;
        }
      }
      else {
        auVar78._4_4_ = iVar28;
        auVar78._0_4_ = iVar28;
        auVar78._8_4_ = iVar28;
        auVar78._12_4_ = iVar28;
        auVar104._8_4_ = 0x10;
        auVar104._0_8_ = 0x1000000010;
        auVar104._12_4_ = 0x10;
        auVar145._8_4_ = 0x1f;
        auVar145._0_8_ = 0x1f0000001f;
        auVar145._12_4_ = 0x1f;
        auVar145._16_4_ = 0x1f;
        auVar145._20_4_ = 0x1f;
        auVar145._24_4_ = 0x1f;
        auVar145._28_4_ = 0x1f;
        uVar38 = dy;
        for (lVar30 = 0; lVar30 != 0x80; lVar30 = lVar30 + 0x10) {
          uVar34 = (int)uVar38 >> (6 - bVar26 & 0x1f);
          if (iVar28 <= (int)uVar34) goto LAB_002fbefe;
          auVar400 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (int)uVar34));
          auVar291 = auVar400._0_16_;
          if (upsample_left == 0) {
            auVar400 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar34 + 1));
            auVar179 = auVar400._0_16_;
            auVar325 = vpinsrd_avx(ZEXT416(uVar34),uVar34 + 1,1);
            auVar325 = vpinsrd_avx(auVar325,uVar34 + 2,2);
            auVar325 = vpinsrd_avx(auVar325,uVar34 + 3,3);
            uVar34 = uVar38 >> 1;
            auVar297._0_8_ = CONCAT44(uVar34,uVar34) & 0x1f0000001f;
            auVar297._8_4_ = uVar34 & 0x1f;
            auVar297._12_4_ = uVar34 & 0x1f;
          }
          else {
            auVar400 = vpshufd_avx2(auVar400,0xd8);
            auVar400 = vpermq_avx2(auVar400,0xd8);
            auVar291 = auVar400._0_16_;
            auVar179 = ZEXT116(0) * auVar47 + ZEXT116(1) * auVar400._16_16_;
            auVar325 = vpinsrd_avx(ZEXT416(uVar34),uVar34 + 2,1);
            auVar325 = vpinsrd_avx(auVar325,uVar34 + 4,2);
            auVar325 = vpinsrd_avx(auVar325,uVar34 + 6,3);
            auVar324._4_4_ = uVar38;
            auVar324._0_4_ = uVar38;
            auVar324._8_4_ = uVar38;
            auVar324._12_4_ = uVar38;
            auVar324._16_4_ = uVar38;
            auVar324._20_4_ = uVar38;
            auVar324._24_4_ = uVar38;
            auVar324._28_4_ = uVar38;
            auVar400 = vpslld_avx2(auVar324,ZEXT416((uint)upsample_left));
            auVar400 = vpsrld_avx2(auVar400,1);
            auVar400 = vpand_avx2(auVar400,auVar145);
            auVar297 = auVar400._0_16_;
          }
          auVar329 = vpcmpgtd_avx(auVar78,auVar325);
          auVar325 = vpsubd_avx(auVar179,auVar291);
          auVar325 = vpmulld_avx(auVar325,auVar297);
          auVar291 = vpslld_avx(auVar291,5);
          auVar291 = vpaddd_avx(auVar291,auVar104);
          auVar291 = vpaddd_avx(auVar325,auVar291);
          auVar291 = vpsrld_avx(auVar291,5);
          auVar325 = vpackusdw_avx(auVar291,auVar291);
          auVar291 = vpackssdw_avx(auVar329,auVar329);
          auVar291 = vpblendvb_avx(auVar47,auVar325,auVar291);
          *(undefined1 (*) [16])((long)local_2060 + lVar30) = auVar291;
          uVar38 = uVar38 + dy;
        }
      }
      goto LAB_002fbf07;
    case 1:
      iVar28 = 0x17 << (bVar26 & 0x1f);
      uVar3 = left[iVar28];
      auVar57._2_2_ = uVar3;
      auVar57._0_2_ = uVar3;
      auVar57._4_2_ = uVar3;
      auVar57._6_2_ = uVar3;
      auVar57._8_2_ = uVar3;
      auVar57._10_2_ = uVar3;
      auVar57._12_2_ = uVar3;
      auVar57._14_2_ = uVar3;
      auVar68._16_2_ = uVar3;
      auVar68._0_16_ = auVar57;
      auVar68._18_2_ = uVar3;
      auVar68._20_2_ = uVar3;
      auVar68._22_2_ = uVar3;
      auVar68._24_2_ = uVar3;
      auVar68._26_2_ = uVar3;
      auVar68._28_2_ = uVar3;
      auVar68._30_2_ = uVar3;
      if (bd < 0xc) {
        auVar76._0_2_ = (undefined2)iVar28;
        auVar76._2_2_ = auVar76._0_2_;
        auVar76._4_2_ = auVar76._0_2_;
        auVar76._6_2_ = auVar76._0_2_;
        auVar76._8_2_ = auVar76._0_2_;
        auVar76._10_2_ = auVar76._0_2_;
        auVar76._12_2_ = auVar76._0_2_;
        auVar76._14_2_ = auVar76._0_2_;
        auVar102._8_2_ = 0x10;
        auVar102._0_8_ = 0x10001000100010;
        auVar102._10_2_ = 0x10;
        auVar102._12_2_ = 0x10;
        auVar102._14_2_ = 0x10;
        auVar169._8_2_ = 0x1f;
        auVar169._0_8_ = 0x1f001f001f001f;
        auVar169._10_2_ = 0x1f;
        auVar169._12_2_ = 0x1f;
        auVar169._14_2_ = 0x1f;
        auVar169._16_2_ = 0x1f;
        auVar169._18_2_ = 0x1f;
        auVar169._20_2_ = 0x1f;
        auVar169._22_2_ = 0x1f;
        auVar169._24_2_ = 0x1f;
        auVar169._26_2_ = 0x1f;
        auVar169._28_2_ = 0x1f;
        auVar169._30_2_ = 0x1f;
        for (lVar30 = 0; lVar30 != 0x100; lVar30 = lVar30 + 0x10) {
          uVar38 = (int)uVar43 >> (6 - bVar26 & 0x1f);
          if (iVar28 <= (int)uVar38) goto LAB_002fa9c4;
          auVar291 = *(undefined1 (*) [16])(left + (int)uVar38);
          if (upsample_left == 0) {
            auVar325 = *(undefined1 (*) [16])(left + (long)(int)uVar38 + 1);
            auVar179 = vpinsrw_avx(ZEXT416(uVar38),uVar38 + 1,1);
            auVar179 = vpinsrw_avx(auVar179,uVar38 + 2,2);
            auVar179 = vpinsrw_avx(auVar179,uVar38 + 3,3);
            auVar179 = vpinsrw_avx(auVar179,uVar38 + 4,4);
            auVar179 = vpinsrw_avx(auVar179,uVar38 + 5,5);
            auVar179 = vpinsrw_avx(auVar179,uVar38 + 6,6);
            auVar179 = vpinsrw_avx(auVar179,uVar38 + 7,7);
            uVar6 = (ushort)(uVar43 >> 1);
            uVar387 = uVar6 & 0x1f;
            auVar331._0_8_ =
                 CONCAT26(uVar6,CONCAT24(uVar6,CONCAT22(uVar6,uVar6))) & 0x1f001f001f001f;
            auVar331._8_2_ = uVar387;
            auVar331._10_2_ = uVar387;
            auVar331._12_2_ = uVar387;
            auVar331._14_2_ = uVar387;
          }
          else {
            auVar325 = vpblendw_avx(auVar291,(undefined1  [16])0x0,0xaa);
            auVar179 = vpblendw_avx(*(undefined1 (*) [16])(left + (long)(int)uVar38 + 8),
                                    (undefined1  [16])0x0,0xaa);
            auVar397 = vpsrld_avx(auVar291,0x10);
            auVar291 = vpackusdw_avx(auVar325,auVar179);
            auVar329 = vpsrld_avx(*(undefined1 (*) [16])(left + (long)(int)uVar38 + 8),0x10);
            auVar325 = vpinsrw_avx(ZEXT416(uVar38),uVar38 + 2,1);
            auVar325 = vpinsrw_avx(auVar325,uVar38 + 4,2);
            auVar325 = vpinsrw_avx(auVar325,uVar38 + 6,3);
            auVar325 = vpinsrw_avx(auVar325,uVar38 + 8,4);
            auVar325 = vpinsrw_avx(auVar325,uVar38 + 10,5);
            auVar325 = vpinsrw_avx(auVar325,uVar38 + 0xc,6);
            auVar179 = vpinsrw_avx(auVar325,uVar38 + 0xe,7);
            auVar340._0_2_ = (undefined2)uVar43;
            auVar340._2_2_ = auVar340._0_2_;
            auVar340._4_2_ = auVar340._0_2_;
            auVar340._6_2_ = auVar340._0_2_;
            auVar340._8_2_ = auVar340._0_2_;
            auVar340._10_2_ = auVar340._0_2_;
            auVar340._12_2_ = auVar340._0_2_;
            auVar340._14_2_ = auVar340._0_2_;
            auVar340._16_2_ = auVar340._0_2_;
            auVar340._18_2_ = auVar340._0_2_;
            auVar340._20_2_ = auVar340._0_2_;
            auVar340._22_2_ = auVar340._0_2_;
            auVar340._24_2_ = auVar340._0_2_;
            auVar340._26_2_ = auVar340._0_2_;
            auVar340._28_2_ = auVar340._0_2_;
            auVar340._30_2_ = auVar340._0_2_;
            auVar400 = vpsllw_avx2(auVar340,ZEXT416((uint)upsample_left));
            auVar325 = vpackusdw_avx(auVar397,auVar329);
            auVar400 = vpsrlw_avx2(auVar400,1);
            auVar400 = vpand_avx2(auVar400,auVar169);
            auVar331 = auVar400._0_16_;
          }
          auVar329 = vpsllw_avx(auVar291,5);
          auVar329 = vpaddw_avx(auVar329,auVar102);
          auVar291 = vpsubw_avx(auVar325,auVar291);
          auVar291 = vpmullw_avx(auVar331,auVar291);
          auVar291 = vpaddw_avx(auVar329,auVar291);
          auVar325 = vpsrlw_avx(auVar291,5);
          auVar291 = vpcmpgtw_avx(auVar76,auVar179);
          auVar291 = vpblendvb_avx(auVar57,auVar325,auVar291);
          *(undefined1 (*) [16])((long)local_2060 + lVar30) = auVar291;
          uVar43 = (ulong)(uint)((int)uVar43 + dy);
        }
      }
      else {
        auVar97._4_4_ = iVar28;
        auVar97._0_4_ = iVar28;
        auVar97._8_4_ = iVar28;
        auVar97._12_4_ = iVar28;
        auVar97._16_4_ = iVar28;
        auVar97._20_4_ = iVar28;
        auVar97._24_4_ = iVar28;
        auVar97._28_4_ = iVar28;
        lVar30 = 0;
        auVar291 = vpmovsxbd_avx(ZEXT416(0x3020104));
        auVar126._8_4_ = 0x10;
        auVar126._0_8_ = 0x1000000010;
        auVar126._12_4_ = 0x10;
        auVar126._16_4_ = 0x10;
        auVar126._20_4_ = 0x10;
        auVar126._24_4_ = 0x10;
        auVar126._28_4_ = 0x10;
        auVar325 = vpmovsxbd_avx(ZEXT416(0x6040208));
        auVar194._8_4_ = 0x1f;
        auVar194._0_8_ = 0x1f0000001f;
        auVar194._12_4_ = 0x1f;
        auVar194._16_4_ = 0x1f;
        auVar194._20_4_ = 0x1f;
        auVar194._24_4_ = 0x1f;
        auVar194._28_4_ = 0x1f;
        for (; lVar30 != 0x100; lVar30 = lVar30 + 0x10) {
          iVar40 = (int)uVar43;
          iVar39 = iVar40 >> (6 - bVar26 & 0x1f);
          if (iVar28 <= iVar39) goto LAB_002fc36a;
          auVar290 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + iVar39));
          if (upsample_left == 0) {
            auVar400 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)iVar39 + 1));
            auVar333._4_4_ = iVar39;
            auVar333._0_4_ = iVar39;
            auVar333._8_4_ = iVar39;
            auVar333._12_4_ = iVar39;
            iVar1 = iVar39 + 5;
            iVar2 = iVar39 + 6;
            iVar39 = iVar39 + 7;
            auVar179 = vpaddd_avx(auVar333,auVar291);
            auVar160 = vpermq_avx2(ZEXT1632(auVar179),0xc4);
            auVar160 = vpblendd_avx2(auVar160,ZEXT1632(auVar333),1);
            auVar383._4_4_ = iVar1;
            auVar383._0_4_ = iVar1;
            auVar383._8_4_ = iVar1;
            auVar383._12_4_ = iVar1;
            auVar383._16_4_ = iVar1;
            auVar383._20_4_ = iVar1;
            auVar383._24_4_ = iVar1;
            auVar383._28_4_ = iVar1;
            auVar160 = vpblendd_avx2(auVar160,auVar383,0x20);
            auVar384._4_4_ = iVar2;
            auVar384._0_4_ = iVar2;
            auVar384._8_4_ = iVar2;
            auVar384._12_4_ = iVar2;
            auVar384._16_4_ = iVar2;
            auVar384._20_4_ = iVar2;
            auVar384._24_4_ = iVar2;
            auVar384._28_4_ = iVar2;
            auVar160 = vpblendd_avx2(auVar160,auVar384,0x40);
            auVar385._4_4_ = iVar39;
            auVar385._0_4_ = iVar39;
            auVar385._8_4_ = iVar39;
            auVar385._12_4_ = iVar39;
            auVar385._16_4_ = iVar39;
            auVar385._20_4_ = iVar39;
            auVar385._24_4_ = iVar39;
            auVar385._28_4_ = iVar39;
            auVar160 = vpblendd_avx2(auVar160,auVar385,0x80);
            uVar38 = (uint)(uVar43 >> 1);
            uVar34 = uVar38 & 0x1f;
            auVar386._0_8_ = CONCAT44(uVar38,uVar38) & 0x1f0000001f;
            auVar386._8_4_ = uVar34;
            auVar386._12_4_ = uVar34;
            auVar386._16_4_ = uVar34;
            auVar386._20_4_ = uVar34;
            auVar386._24_4_ = uVar34;
            auVar386._28_4_ = uVar34;
          }
          else {
            auVar400 = vpshufd_avx2(auVar290,0xd8);
            auVar135 = vpermq_avx2(auVar400,0xd8);
            auVar400 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)iVar39 + 8));
            auVar400 = vpshufd_avx2(auVar400,0xd8);
            auVar139 = vpermq_avx2(auVar400,0xd8);
            auVar197._4_4_ = iVar39;
            auVar197._0_4_ = iVar39;
            auVar197._8_4_ = iVar39;
            auVar197._12_4_ = iVar39;
            iVar1 = iVar39 + 10;
            iVar2 = iVar39 + 0xc;
            iVar39 = iVar39 + 0xe;
            auVar179 = vpaddd_avx(auVar197,auVar325);
            auVar400 = vpermq_avx2(ZEXT1632(auVar179),0xc4);
            auVar400 = vpblendd_avx2(auVar400,ZEXT1632(auVar197),1);
            auVar347._4_4_ = iVar1;
            auVar347._0_4_ = iVar1;
            auVar347._8_4_ = iVar1;
            auVar347._12_4_ = iVar1;
            auVar347._16_4_ = iVar1;
            auVar347._20_4_ = iVar1;
            auVar347._24_4_ = iVar1;
            auVar347._28_4_ = iVar1;
            auVar400 = vpblendd_avx2(auVar400,auVar347,0x20);
            auVar348._4_4_ = iVar2;
            auVar348._0_4_ = iVar2;
            auVar348._8_4_ = iVar2;
            auVar348._12_4_ = iVar2;
            auVar348._16_4_ = iVar2;
            auVar348._20_4_ = iVar2;
            auVar348._24_4_ = iVar2;
            auVar348._28_4_ = iVar2;
            auVar400 = vpblendd_avx2(auVar400,auVar348,0x40);
            auVar349._4_4_ = iVar39;
            auVar349._0_4_ = iVar39;
            auVar349._8_4_ = iVar39;
            auVar349._12_4_ = iVar39;
            auVar349._16_4_ = iVar39;
            auVar349._20_4_ = iVar39;
            auVar349._24_4_ = iVar39;
            auVar349._28_4_ = iVar39;
            auVar160 = vpblendd_avx2(auVar400,auVar349,0x80);
            auVar289._4_4_ = iVar40;
            auVar289._0_4_ = iVar40;
            auVar289._8_4_ = iVar40;
            auVar289._12_4_ = iVar40;
            auVar289._16_4_ = iVar40;
            auVar289._20_4_ = iVar40;
            auVar289._24_4_ = iVar40;
            auVar289._28_4_ = iVar40;
            auVar400 = vpslld_avx2(auVar289,ZEXT416((uint)upsample_left));
            auVar290._0_16_ = ZEXT116(0) * auVar139._0_16_ + ZEXT116(1) * auVar135._0_16_;
            auVar290._16_16_ = ZEXT116(0) * auVar135._16_16_ + ZEXT116(1) * auVar139._0_16_;
            auVar400 = vpsrld_avx2(auVar400,1);
            auVar386 = vpand_avx2(auVar400,auVar194);
            auVar400 = vperm2i128_avx2(auVar135,auVar139,0x31);
          }
          auVar160 = vpcmpgtd_avx2(auVar97,auVar160);
          auVar400 = vpsubd_avx2(auVar400,auVar290);
          auVar135 = vpmulld_avx2(auVar400,auVar386);
          auVar400 = vpslld_avx2(auVar290,5);
          auVar400 = vpaddd_avx2(auVar400,auVar126);
          auVar400 = vpaddd_avx2(auVar135,auVar400);
          auVar400 = vpsrld_avx2(auVar400,5);
          auVar329 = vpackusdw_avx(auVar400._0_16_,auVar400._16_16_);
          auVar179 = vpackssdw_avx(auVar160._0_16_,auVar160._16_16_);
          auVar400 = vpblendvb_avx2(auVar68,ZEXT1632(auVar329),ZEXT1632(auVar179));
          *(undefined1 (*) [16])((long)local_2060 + lVar30) = auVar400._0_16_;
          uVar43 = (ulong)(uint)(iVar40 + dy);
        }
      }
      goto LAB_002fc373;
    default:
      return;
    case 3:
      uVar3 = left[0x2f];
      auVar55._2_2_ = uVar3;
      auVar55._0_2_ = uVar3;
      auVar55._4_2_ = uVar3;
      auVar55._6_2_ = uVar3;
      auVar55._8_2_ = uVar3;
      auVar55._10_2_ = uVar3;
      auVar55._12_2_ = uVar3;
      auVar55._14_2_ = uVar3;
      auVar66._16_2_ = uVar3;
      auVar66._0_16_ = auVar55;
      auVar66._18_2_ = uVar3;
      auVar66._20_2_ = uVar3;
      auVar66._22_2_ = uVar3;
      auVar66._24_2_ = uVar3;
      auVar66._26_2_ = uVar3;
      auVar66._28_2_ = uVar3;
      auVar66._30_2_ = uVar3;
      lVar30 = 0;
      if (bd < 0xc) {
        auVar88._8_2_ = 0x10;
        auVar88._0_8_ = 0x10001000100010;
        auVar88._10_2_ = 0x10;
        auVar88._12_2_ = 0x10;
        auVar88._14_2_ = 0x10;
        auVar88._16_2_ = 0x10;
        auVar88._18_2_ = 0x10;
        auVar88._20_2_ = 0x10;
        auVar88._22_2_ = 0x10;
        auVar88._24_2_ = 0x10;
        auVar88._26_2_ = 0x10;
        auVar88._28_2_ = 0x10;
        auVar88._30_2_ = 0x10;
        auVar291 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
        auVar117._8_2_ = 0x2e;
        auVar117._0_8_ = 0x2e002e002e002e;
        auVar117._10_2_ = 0x2e;
        auVar117._12_2_ = 0x2e;
        auVar117._14_2_ = 0x2e;
        auVar117._16_2_ = 0x2e;
        auVar117._18_2_ = 0x2e;
        auVar117._20_2_ = 0x2e;
        auVar117._22_2_ = 0x2e;
        auVar117._24_2_ = 0x2e;
        auVar117._26_2_ = 0x2e;
        auVar117._28_2_ = 0x2e;
        auVar117._30_2_ = 0x2e;
        for (; lVar30 != 0x400; lVar30 = lVar30 + 0x20) {
          uVar38 = (int)uVar43 >> 6;
          if (0x2e < (int)uVar38) goto LAB_002fa5de;
          uVar6 = (ushort)(uVar43 >> 1);
          uVar387 = uVar6 & 0x1f;
          auVar137._0_8_ = CONCAT26(uVar6,CONCAT24(uVar6,CONCAT22(uVar6,uVar6))) & 0x1f001f001f001f;
          auVar137._8_2_ = uVar387;
          auVar137._10_2_ = uVar387;
          auVar137._12_2_ = uVar387;
          auVar137._14_2_ = uVar387;
          auVar137._16_2_ = uVar387;
          auVar137._18_2_ = uVar387;
          auVar137._20_2_ = uVar387;
          auVar137._22_2_ = uVar387;
          auVar137._24_2_ = uVar387;
          auVar137._26_2_ = uVar387;
          auVar137._28_2_ = uVar387;
          auVar137._30_2_ = uVar387;
          auVar400 = vpsubw_avx2(*(undefined1 (*) [32])(left + (long)(int)uVar38 + 1),
                                 *(undefined1 (*) [32])(left + (int)uVar38));
          auVar160 = vpmullw_avx2(auVar400,auVar137);
          auVar400 = vpsllw_avx2(*(undefined1 (*) [32])(left + (int)uVar38),5);
          auVar400 = vpaddw_avx2(auVar400,auVar88);
          auVar400 = vpaddw_avx2(auVar160,auVar400);
          auVar160 = vpsrlw_avx2(auVar400,5);
          auVar151._0_2_ = (undefined2)uVar38;
          auVar151._2_2_ = auVar151._0_2_;
          auVar151._4_2_ = auVar151._0_2_;
          auVar151._6_2_ = auVar151._0_2_;
          auVar151._8_2_ = auVar151._0_2_;
          auVar151._10_2_ = auVar151._0_2_;
          auVar151._12_2_ = auVar151._0_2_;
          auVar151._14_2_ = auVar151._0_2_;
          auVar325 = vpaddw_avx(auVar151,auVar291);
          auVar179 = vpslldq_avx(auVar325,2);
          auVar179 = vpblendw_avx(auVar179,ZEXT416(uVar38),1);
          auVar325 = vpsrldq_avx(auVar325,0xe);
          auVar167._0_16_ = ZEXT116(0) * auVar325 + ZEXT116(1) * auVar55;
          auVar167._16_16_ = ZEXT116(0) * auVar66._16_16_ + ZEXT116(1) * auVar325;
          auVar237._0_2_ = (undefined2)(uVar38 + 9);
          auVar237._2_2_ = auVar237._0_2_;
          auVar237._4_2_ = auVar237._0_2_;
          auVar237._6_2_ = auVar237._0_2_;
          auVar237._8_2_ = auVar237._0_2_;
          auVar237._10_2_ = auVar237._0_2_;
          auVar237._12_2_ = auVar237._0_2_;
          auVar237._14_2_ = auVar237._0_2_;
          auVar237._16_2_ = auVar237._0_2_;
          auVar237._18_2_ = auVar237._0_2_;
          auVar237._20_2_ = auVar237._0_2_;
          auVar237._22_2_ = auVar237._0_2_;
          auVar237._24_2_ = auVar237._0_2_;
          auVar237._26_2_ = auVar237._0_2_;
          auVar237._28_2_ = auVar237._0_2_;
          auVar237._30_2_ = auVar237._0_2_;
          auVar400 = vpblendw_avx2(auVar167,auVar237,2);
          auVar238._0_2_ = (undefined2)(uVar38 + 10);
          auVar238._2_2_ = auVar238._0_2_;
          auVar238._4_2_ = auVar238._0_2_;
          auVar238._6_2_ = auVar238._0_2_;
          auVar238._8_2_ = auVar238._0_2_;
          auVar238._10_2_ = auVar238._0_2_;
          auVar238._12_2_ = auVar238._0_2_;
          auVar238._14_2_ = auVar238._0_2_;
          auVar238._16_2_ = auVar238._0_2_;
          auVar238._18_2_ = auVar238._0_2_;
          auVar238._20_2_ = auVar238._0_2_;
          auVar238._22_2_ = auVar238._0_2_;
          auVar238._24_2_ = auVar238._0_2_;
          auVar238._26_2_ = auVar238._0_2_;
          auVar238._28_2_ = auVar238._0_2_;
          auVar238._30_2_ = auVar238._0_2_;
          auVar400 = vpblendw_avx2(auVar400,auVar238,4);
          auVar239._0_2_ = (undefined2)(uVar38 + 0xb);
          auVar239._2_2_ = auVar239._0_2_;
          auVar239._4_2_ = auVar239._0_2_;
          auVar239._6_2_ = auVar239._0_2_;
          auVar239._8_2_ = auVar239._0_2_;
          auVar239._10_2_ = auVar239._0_2_;
          auVar239._12_2_ = auVar239._0_2_;
          auVar239._14_2_ = auVar239._0_2_;
          auVar239._16_2_ = auVar239._0_2_;
          auVar239._18_2_ = auVar239._0_2_;
          auVar239._20_2_ = auVar239._0_2_;
          auVar239._22_2_ = auVar239._0_2_;
          auVar239._24_2_ = auVar239._0_2_;
          auVar239._26_2_ = auVar239._0_2_;
          auVar239._28_2_ = auVar239._0_2_;
          auVar239._30_2_ = auVar239._0_2_;
          auVar400 = vpblendw_avx2(auVar400,auVar239,8);
          auVar240._0_2_ = (undefined2)(uVar38 + 0xc);
          auVar240._2_2_ = auVar240._0_2_;
          auVar240._4_2_ = auVar240._0_2_;
          auVar240._6_2_ = auVar240._0_2_;
          auVar240._8_2_ = auVar240._0_2_;
          auVar240._10_2_ = auVar240._0_2_;
          auVar240._12_2_ = auVar240._0_2_;
          auVar240._14_2_ = auVar240._0_2_;
          auVar240._16_2_ = auVar240._0_2_;
          auVar240._18_2_ = auVar240._0_2_;
          auVar240._20_2_ = auVar240._0_2_;
          auVar240._22_2_ = auVar240._0_2_;
          auVar240._24_2_ = auVar240._0_2_;
          auVar240._26_2_ = auVar240._0_2_;
          auVar240._28_2_ = auVar240._0_2_;
          auVar240._30_2_ = auVar240._0_2_;
          auVar400 = vpblendw_avx2(auVar400,auVar240,0x10);
          auVar241._0_2_ = (undefined2)(uVar38 + 0xd);
          auVar241._2_2_ = auVar241._0_2_;
          auVar241._4_2_ = auVar241._0_2_;
          auVar241._6_2_ = auVar241._0_2_;
          auVar241._8_2_ = auVar241._0_2_;
          auVar241._10_2_ = auVar241._0_2_;
          auVar241._12_2_ = auVar241._0_2_;
          auVar241._14_2_ = auVar241._0_2_;
          auVar241._16_2_ = auVar241._0_2_;
          auVar241._18_2_ = auVar241._0_2_;
          auVar241._20_2_ = auVar241._0_2_;
          auVar241._22_2_ = auVar241._0_2_;
          auVar241._24_2_ = auVar241._0_2_;
          auVar241._26_2_ = auVar241._0_2_;
          auVar241._28_2_ = auVar241._0_2_;
          auVar241._30_2_ = auVar241._0_2_;
          auVar400 = vpblendw_avx2(auVar400,auVar241,0x20);
          auVar242._0_2_ = (undefined2)(uVar38 + 0xe);
          auVar242._2_2_ = auVar242._0_2_;
          auVar242._4_2_ = auVar242._0_2_;
          auVar242._6_2_ = auVar242._0_2_;
          auVar242._8_2_ = auVar242._0_2_;
          auVar242._10_2_ = auVar242._0_2_;
          auVar242._12_2_ = auVar242._0_2_;
          auVar242._14_2_ = auVar242._0_2_;
          auVar242._16_2_ = auVar242._0_2_;
          auVar242._18_2_ = auVar242._0_2_;
          auVar242._20_2_ = auVar242._0_2_;
          auVar242._22_2_ = auVar242._0_2_;
          auVar242._24_2_ = auVar242._0_2_;
          auVar242._26_2_ = auVar242._0_2_;
          auVar242._28_2_ = auVar242._0_2_;
          auVar242._30_2_ = auVar242._0_2_;
          auVar400 = vpblendw_avx2(auVar400,auVar242,0x40);
          auVar243._0_2_ = (undefined2)(uVar38 + 0xf);
          auVar243._2_2_ = auVar243._0_2_;
          auVar243._4_2_ = auVar243._0_2_;
          auVar243._6_2_ = auVar243._0_2_;
          auVar243._8_2_ = auVar243._0_2_;
          auVar243._10_2_ = auVar243._0_2_;
          auVar243._12_2_ = auVar243._0_2_;
          auVar243._14_2_ = auVar243._0_2_;
          auVar243._16_2_ = auVar243._0_2_;
          auVar243._18_2_ = auVar243._0_2_;
          auVar243._20_2_ = auVar243._0_2_;
          auVar243._22_2_ = auVar243._0_2_;
          auVar243._24_2_ = auVar243._0_2_;
          auVar243._26_2_ = auVar243._0_2_;
          auVar243._28_2_ = auVar243._0_2_;
          auVar243._30_2_ = auVar243._0_2_;
          auVar400 = vpblendw_avx2(auVar400,auVar243,0x80);
          auVar400 = vpblendd_avx2(ZEXT1632(auVar179),auVar400,0xf0);
          auVar400 = vpcmpgtw_avx2(auVar400,auVar117);
          auVar400 = vpblendvb_avx2(auVar160,auVar66,auVar400);
          *(undefined1 (*) [32])((long)local_2060 + lVar30) = auVar400;
          uVar43 = (ulong)(uint)((int)uVar43 + dy);
        }
      }
      else {
        auVar94._8_4_ = 0x10;
        auVar94._0_8_ = 0x1000000010;
        auVar94._12_4_ = 0x10;
        auVar94._16_4_ = 0x10;
        auVar94._20_4_ = 0x10;
        auVar94._24_4_ = 0x10;
        auVar94._28_4_ = 0x10;
        auVar291 = vpmovsxbw_avx(ZEXT816(0x807060504030201));
        auVar123._8_2_ = 0x2e;
        auVar123._0_8_ = 0x2e002e002e002e;
        auVar123._10_2_ = 0x2e;
        auVar123._12_2_ = 0x2e;
        auVar123._14_2_ = 0x2e;
        auVar123._16_2_ = 0x2e;
        auVar123._18_2_ = 0x2e;
        auVar123._20_2_ = 0x2e;
        auVar123._22_2_ = 0x2e;
        auVar123._24_2_ = 0x2e;
        auVar123._26_2_ = 0x2e;
        auVar123._28_2_ = 0x2e;
        auVar123._30_2_ = 0x2e;
        for (; lVar30 != 0x400; lVar30 = lVar30 + 0x20) {
          uVar38 = (int)uVar43 >> 6;
          if (0x2e < (int)uVar38) goto LAB_002fbaf1;
          uVar34 = (uint)(uVar43 >> 1);
          uVar32 = uVar34 & 0x1f;
          auVar143._0_8_ = CONCAT44(uVar34,uVar34) & 0x1f0000001f;
          auVar143._8_4_ = uVar32;
          auVar143._12_4_ = uVar32;
          auVar143._16_4_ = uVar32;
          auVar143._20_4_ = uVar32;
          auVar143._24_4_ = uVar32;
          auVar143._28_4_ = uVar32;
          auVar325 = auVar55;
          if (uVar38 - 0x30 < 0xfffffff7) {
            auVar400 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar38 + 8));
            auVar160 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar38 + 9));
            auVar160 = vpsubd_avx2(auVar160,auVar400);
            auVar400 = vpslld_avx2(auVar400,5);
            auVar160 = vpmulld_avx2(auVar160,auVar143);
            auVar400 = vpaddd_avx2(auVar400,auVar94);
            auVar400 = vpaddd_avx2(auVar160,auVar400);
            auVar400 = vpsrld_avx2(auVar400,5);
            auVar191._0_16_ = ZEXT116(0) * auVar55 + ZEXT116(1) * auVar400._16_16_;
            auVar191._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar55;
            auVar400 = vpackusdw_avx2(auVar400,auVar191);
            auVar325 = auVar400._0_16_;
          }
          auVar400 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (int)uVar38));
          auVar160 = vpmovzxwd_avx2(*(undefined1 (*) [16])(left + (long)(int)uVar38 + 1));
          auVar160 = vpsubd_avx2(auVar160,auVar400);
          auVar400 = vpslld_avx2(auVar400,5);
          auVar160 = vpmulld_avx2(auVar160,auVar143);
          auVar400 = vpaddd_avx2(auVar400,auVar94);
          auVar400 = vpaddd_avx2(auVar160,auVar400);
          auVar400 = vpsrld_avx2(auVar400,5);
          auVar400 = vpackusdw_avx2(auVar400,ZEXT1632(auVar400._16_16_));
          auVar144._0_16_ = ZEXT116(0) * auVar325 + ZEXT116(1) * auVar400._0_16_;
          auVar144._16_16_ = ZEXT116(0) * auVar400._16_16_ + ZEXT116(1) * auVar325;
          auVar154._0_2_ = (undefined2)uVar38;
          auVar154._2_2_ = auVar154._0_2_;
          auVar154._4_2_ = auVar154._0_2_;
          auVar154._6_2_ = auVar154._0_2_;
          auVar154._8_2_ = auVar154._0_2_;
          auVar154._10_2_ = auVar154._0_2_;
          auVar154._12_2_ = auVar154._0_2_;
          auVar154._14_2_ = auVar154._0_2_;
          auVar325 = vpaddw_avx(auVar154,auVar291);
          auVar179 = vpslldq_avx(auVar325,2);
          auVar179 = vpblendw_avx(auVar179,ZEXT416(uVar38),1);
          auVar325 = vpsrldq_avx(auVar325,0xe);
          auVar176._0_16_ = ZEXT116(0) * auVar325 + ZEXT116(1) * auVar55;
          auVar176._16_16_ = ZEXT116(0) * auVar66._16_16_ + ZEXT116(1) * auVar325;
          auVar273._0_2_ = (undefined2)(uVar38 + 9);
          auVar273._2_2_ = auVar273._0_2_;
          auVar273._4_2_ = auVar273._0_2_;
          auVar273._6_2_ = auVar273._0_2_;
          auVar273._8_2_ = auVar273._0_2_;
          auVar273._10_2_ = auVar273._0_2_;
          auVar273._12_2_ = auVar273._0_2_;
          auVar273._14_2_ = auVar273._0_2_;
          auVar273._16_2_ = auVar273._0_2_;
          auVar273._18_2_ = auVar273._0_2_;
          auVar273._20_2_ = auVar273._0_2_;
          auVar273._22_2_ = auVar273._0_2_;
          auVar273._24_2_ = auVar273._0_2_;
          auVar273._26_2_ = auVar273._0_2_;
          auVar273._28_2_ = auVar273._0_2_;
          auVar273._30_2_ = auVar273._0_2_;
          auVar400 = vpblendw_avx2(auVar176,auVar273,2);
          auVar274._0_2_ = (undefined2)(uVar38 + 10);
          auVar274._2_2_ = auVar274._0_2_;
          auVar274._4_2_ = auVar274._0_2_;
          auVar274._6_2_ = auVar274._0_2_;
          auVar274._8_2_ = auVar274._0_2_;
          auVar274._10_2_ = auVar274._0_2_;
          auVar274._12_2_ = auVar274._0_2_;
          auVar274._14_2_ = auVar274._0_2_;
          auVar274._16_2_ = auVar274._0_2_;
          auVar274._18_2_ = auVar274._0_2_;
          auVar274._20_2_ = auVar274._0_2_;
          auVar274._22_2_ = auVar274._0_2_;
          auVar274._24_2_ = auVar274._0_2_;
          auVar274._26_2_ = auVar274._0_2_;
          auVar274._28_2_ = auVar274._0_2_;
          auVar274._30_2_ = auVar274._0_2_;
          auVar400 = vpblendw_avx2(auVar400,auVar274,4);
          auVar275._0_2_ = (undefined2)(uVar38 + 0xb);
          auVar275._2_2_ = auVar275._0_2_;
          auVar275._4_2_ = auVar275._0_2_;
          auVar275._6_2_ = auVar275._0_2_;
          auVar275._8_2_ = auVar275._0_2_;
          auVar275._10_2_ = auVar275._0_2_;
          auVar275._12_2_ = auVar275._0_2_;
          auVar275._14_2_ = auVar275._0_2_;
          auVar275._16_2_ = auVar275._0_2_;
          auVar275._18_2_ = auVar275._0_2_;
          auVar275._20_2_ = auVar275._0_2_;
          auVar275._22_2_ = auVar275._0_2_;
          auVar275._24_2_ = auVar275._0_2_;
          auVar275._26_2_ = auVar275._0_2_;
          auVar275._28_2_ = auVar275._0_2_;
          auVar275._30_2_ = auVar275._0_2_;
          auVar400 = vpblendw_avx2(auVar400,auVar275,8);
          auVar276._0_2_ = (undefined2)(uVar38 + 0xc);
          auVar276._2_2_ = auVar276._0_2_;
          auVar276._4_2_ = auVar276._0_2_;
          auVar276._6_2_ = auVar276._0_2_;
          auVar276._8_2_ = auVar276._0_2_;
          auVar276._10_2_ = auVar276._0_2_;
          auVar276._12_2_ = auVar276._0_2_;
          auVar276._14_2_ = auVar276._0_2_;
          auVar276._16_2_ = auVar276._0_2_;
          auVar276._18_2_ = auVar276._0_2_;
          auVar276._20_2_ = auVar276._0_2_;
          auVar276._22_2_ = auVar276._0_2_;
          auVar276._24_2_ = auVar276._0_2_;
          auVar276._26_2_ = auVar276._0_2_;
          auVar276._28_2_ = auVar276._0_2_;
          auVar276._30_2_ = auVar276._0_2_;
          auVar400 = vpblendw_avx2(auVar400,auVar276,0x10);
          auVar277._0_2_ = (undefined2)(uVar38 + 0xd);
          auVar277._2_2_ = auVar277._0_2_;
          auVar277._4_2_ = auVar277._0_2_;
          auVar277._6_2_ = auVar277._0_2_;
          auVar277._8_2_ = auVar277._0_2_;
          auVar277._10_2_ = auVar277._0_2_;
          auVar277._12_2_ = auVar277._0_2_;
          auVar277._14_2_ = auVar277._0_2_;
          auVar277._16_2_ = auVar277._0_2_;
          auVar277._18_2_ = auVar277._0_2_;
          auVar277._20_2_ = auVar277._0_2_;
          auVar277._22_2_ = auVar277._0_2_;
          auVar277._24_2_ = auVar277._0_2_;
          auVar277._26_2_ = auVar277._0_2_;
          auVar277._28_2_ = auVar277._0_2_;
          auVar277._30_2_ = auVar277._0_2_;
          auVar400 = vpblendw_avx2(auVar400,auVar277,0x20);
          auVar278._0_2_ = (undefined2)(uVar38 + 0xe);
          auVar278._2_2_ = auVar278._0_2_;
          auVar278._4_2_ = auVar278._0_2_;
          auVar278._6_2_ = auVar278._0_2_;
          auVar278._8_2_ = auVar278._0_2_;
          auVar278._10_2_ = auVar278._0_2_;
          auVar278._12_2_ = auVar278._0_2_;
          auVar278._14_2_ = auVar278._0_2_;
          auVar278._16_2_ = auVar278._0_2_;
          auVar278._18_2_ = auVar278._0_2_;
          auVar278._20_2_ = auVar278._0_2_;
          auVar278._22_2_ = auVar278._0_2_;
          auVar278._24_2_ = auVar278._0_2_;
          auVar278._26_2_ = auVar278._0_2_;
          auVar278._28_2_ = auVar278._0_2_;
          auVar278._30_2_ = auVar278._0_2_;
          auVar400 = vpblendw_avx2(auVar400,auVar278,0x40);
          auVar279._0_2_ = (undefined2)(uVar38 + 0xf);
          auVar279._2_2_ = auVar279._0_2_;
          auVar279._4_2_ = auVar279._0_2_;
          auVar279._6_2_ = auVar279._0_2_;
          auVar279._8_2_ = auVar279._0_2_;
          auVar279._10_2_ = auVar279._0_2_;
          auVar279._12_2_ = auVar279._0_2_;
          auVar279._14_2_ = auVar279._0_2_;
          auVar279._16_2_ = auVar279._0_2_;
          auVar279._18_2_ = auVar279._0_2_;
          auVar279._20_2_ = auVar279._0_2_;
          auVar279._22_2_ = auVar279._0_2_;
          auVar279._24_2_ = auVar279._0_2_;
          auVar279._26_2_ = auVar279._0_2_;
          auVar279._28_2_ = auVar279._0_2_;
          auVar279._30_2_ = auVar279._0_2_;
          auVar400 = vpblendw_avx2(auVar400,auVar279,0x80);
          auVar400 = vpblendd_avx2(ZEXT1632(auVar179),auVar400,0xf0);
          auVar400 = vpcmpgtw_avx2(auVar400,auVar123);
          auVar400 = vpblendvb_avx2(auVar144,auVar66,auVar400);
          *(undefined1 (*) [32])((long)local_2060 + lVar30) = auVar400;
          uVar43 = (ulong)(uint)((int)uVar43 + dy);
        }
      }
      goto LAB_002fbaf9;
    case 7:
      pitchSrc = 0x20;
      iVar40 = 0x40;
      highbd_dr_prediction_z1_32xN_avx2
                (0x40,(uint16_t *)local_2060,0x20,left,dy,bd,in_stack_ffffffffffffdb60);
      iVar28 = 0x20;
    }
  }
  highbd_transpose((uint16_t *)local_2060,pitchSrc,dst,stride,iVar40,iVar28);
  return;
LAB_002fb195:
  for (; lVar30 != 0x800; lVar30 = lVar30 + 0x20) {
    *(undefined1 (*) [32])((long)local_2060 + lVar30) = auVar400;
  }
  goto LAB_002fb19d;
LAB_002fae9e:
  for (; lVar30 != 0x200; lVar30 = lVar30 + 0x10) {
    *(undefined1 (*) [16])((long)local_2060 + lVar30) = auVar325;
  }
  goto LAB_002faea7;
LAB_002fb58e:
  for (; lVar30 != 0x100; lVar30 = lVar30 + 0x10) {
    *(undefined1 (*) [16])((long)local_2060 + lVar30) = auVar49;
  }
  goto LAB_002fb597;
LAB_002fbaf1:
  for (; lVar30 != 0x400; lVar30 = lVar30 + 0x20) {
    *(undefined1 (*) [32])((long)local_2060 + lVar30) = auVar66;
  }
  goto LAB_002fbaf9;
LAB_002fc36a:
  for (; lVar30 != 0x100; lVar30 = lVar30 + 0x10) {
    *(undefined1 (*) [16])((long)local_2060 + lVar30) = auVar57;
  }
  goto LAB_002fc373;
LAB_002fbefe:
  for (; lVar30 != 0x80; lVar30 = lVar30 + 0x10) {
    *(undefined1 (*) [16])((long)local_2060 + lVar30) = auVar47;
  }
  goto LAB_002fbf07;
LAB_002fc138:
  for (; lVar30 != 0x100; lVar30 = lVar30 + 0x20) {
    *(undefined1 (*) [32])((long)local_2060 + lVar30) = auVar67;
  }
  goto LAB_002fc140;
LAB_002fbd0e:
  for (; lVar30 != 0x40; lVar30 = lVar30 + 0x10) {
    *(undefined1 (*) [16])(local_2460 + lVar30) = auVar46;
  }
  goto LAB_002fbd14;
LAB_002fb3a3:
  for (; lVar30 != 0x80; lVar30 = lVar30 + 0x20) {
    *(undefined1 (*) [32])((long)local_2060 + lVar30) = auVar59;
  }
  goto LAB_002fb3ab;
LAB_002f9554:
  for (; lVar30 != 0x80; lVar30 = lVar30 + 0x10) {
    *(undefined1 (*) [16])((long)local_2060 + lVar30) = auVar50;
  }
  goto LAB_002f955d;
LAB_002f9a68:
  for (; lVar30 != 0x200; lVar30 = lVar30 + 0x20) {
    *(undefined1 (*) [32])((long)local_2060 + lVar30) = auVar62;
  }
  goto LAB_002f9a70;
LAB_002f9bc8:
  for (; lVar30 != 0x40; lVar30 = lVar30 + 0x10) {
    *(undefined1 (*) [16])((long)local_2060 + lVar30) = auVar45;
  }
  goto LAB_002f9bce;
LAB_002f8f1e:
  for (; lVar30 != 0x80; lVar30 = lVar30 + 0x10) {
    *(undefined1 (*) [16])((long)local_2060 + lVar30) = auVar50;
  }
LAB_002f955d:
  highbd_transpose8x8_sse2
            (&local_2060,&alStack_2050,&local_2040,&alStack_2030,&local_2020,&alStack_2010,
             &local_2000,&alStack_1ff0,(__m128i *)local_2460,(__m128i *)(local_2460 + 0x10),
             (__m128i *)local_2440,(__m128i *)(local_2440 + 0x10),(__m128i *)local_2420,
             (__m128i *)(local_2420 + 0x10),(__m128i *)local_2400,(__m128i *)(local_2400 + 0x10));
  for (lVar30 = 0; lVar30 != 0x80; lVar30 = lVar30 + 0x10) {
    uVar4 = *(undefined8 *)(local_2460 + lVar30 + 8);
    *(undefined8 *)dst = *(undefined8 *)(local_2460 + lVar30);
    *(undefined8 *)(dst + 4) = uVar4;
    dst = dst + stride;
  }
  return;
LAB_002f935e:
  for (; lVar30 != 0x200; lVar30 = lVar30 + 0x20) {
    *(undefined1 (*) [32])((long)local_2060 + lVar30) = auVar62;
  }
LAB_002f9a70:
  highbd_transpose16x16_avx2((__m256i *)local_2060,(__m256i *)local_2460);
  for (lVar30 = 0; lVar30 != 0x200; lVar30 = lVar30 + 0x20) {
    uVar4 = *(undefined8 *)(local_2460 + lVar30 + 8);
    uVar7 = *(undefined8 *)(local_2460 + lVar30 + 0x10);
    uVar8 = *(undefined8 *)(local_2440 + lVar30 + -8);
    *(undefined8 *)dst = *(undefined8 *)(local_2460 + lVar30);
    *(undefined8 *)(dst + 4) = uVar4;
    *(undefined8 *)(dst + 8) = uVar7;
    *(undefined8 *)(dst + 0xc) = uVar8;
    dst = dst + stride;
  }
  return;
LAB_002f8bc2:
  for (; lVar30 != 0x80; lVar30 = lVar30 + 0x20) {
    *(undefined1 (*) [32])((long)local_2060 + lVar30) = auVar59;
  }
LAB_002fb3ab:
  auVar12._8_8_ = local_2060[1];
  auVar12._0_8_ = local_2060[0];
  auVar12._16_8_ = alStack_2050[0];
  auVar12._24_8_ = alStack_2050[1];
  auVar16._8_8_ = local_2040[1];
  auVar16._0_8_ = local_2040[0];
  auVar16._16_8_ = alStack_2030[0];
  auVar16._24_8_ = alStack_2030[1];
  auVar19._8_8_ = local_2020[1];
  auVar19._0_8_ = local_2020[0];
  auVar19._16_8_ = alStack_2010[0];
  auVar19._24_8_ = alStack_2010[1];
  auVar22._8_8_ = local_2000[1];
  auVar22._0_8_ = local_2000[0];
  auVar22._16_8_ = alStack_1ff0[0];
  auVar22._24_8_ = alStack_1ff0[1];
  auVar135 = vpunpcklwd_avx2(auVar12,auVar16);
  auVar139 = vpunpcklwd_avx2(auVar19,auVar22);
  auVar400 = vpunpckhwd_avx2(auVar12,auVar16);
  auVar160 = vpunpckhwd_avx2(auVar19,auVar22);
  auVar172 = vpunpckldq_avx2(auVar135,auVar139);
  auVar187 = vpunpckldq_avx2(auVar400,auVar160);
  alVar5 = (__m256i)vpunpcklqdq_avx2(auVar172,auVar187);
  local_2460._0_8_ = alVar5[0];
  local_2460._8_8_ = alVar5[1];
  auStack_2450._0_8_ = alVar5[2];
  auStack_2450._8_8_ = alVar5[3];
  local_2440 = vpunpckhqdq_avx2(auVar172,auVar187);
  auVar135 = vpunpckhdq_avx2(auVar135,auVar139);
  auVar400 = vpunpckhdq_avx2(auVar400,auVar160);
  local_2420 = vpunpcklqdq_avx2(auVar135,auVar400);
  local_2400 = vpunpckhqdq_avx2(auVar135,auVar400);
  for (lVar30 = 0; lVar30 != 0x80; lVar30 = lVar30 + 0x20) {
    auVar291 = *(undefined1 (*) [16])(local_2460 + lVar30);
    auVar325 = *(undefined1 (*) [16])(local_2460 + lVar30 + 0x10);
    *(long *)dst = auVar291._0_8_;
    uVar4 = vpextrq_avx(auVar291,1);
    *(undefined8 *)(dst + stride * 4) = uVar4;
    *(long *)(dst + stride * 8) = auVar325._0_8_;
    uVar4 = vpextrq_avx(auVar325,1);
    *(undefined8 *)(dst + stride * 0xc) = uVar4;
    dst = dst + stride;
  }
  return;
LAB_002f86a4:
  for (; lVar30 != 0x40; lVar30 = lVar30 + 0x10) {
    *(undefined1 (*) [16])((long)local_2060 + lVar30) = auVar45;
  }
LAB_002f9bce:
  auVar9._8_8_ = local_2060[1];
  auVar9._0_8_ = local_2060[0];
  auVar13._8_8_ = local_2040[1];
  auVar13._0_8_ = local_2040[0];
  auVar291 = vpunpcklwd_avx(auVar9,(undefined1  [16])alStack_2050);
  auVar325 = vpunpcklwd_avx(auVar13,(undefined1  [16])alStack_2030);
  auVar179 = vpunpckldq_avx(auVar291,auVar325);
  *(long *)dst = auVar179._0_8_;
  uVar4 = vpextrq_avx(auVar179,1);
  *(undefined8 *)(dst + stride) = uVar4;
  auVar291 = vpunpckhdq_avx(auVar291,auVar325);
  *(long *)(dst + stride * 2) = auVar291._0_8_;
  uVar4 = vpextrq_avx(auVar291,1);
  *(undefined8 *)(dst + stride * 3) = uVar4;
  return;
LAB_002f8a1e:
  for (; lVar30 != 0x40; lVar30 = lVar30 + 0x10) {
    *(undefined1 (*) [16])(local_2460 + lVar30) = auVar46;
  }
LAB_002fbd14:
  auVar291 = vpunpcklwd_avx(local_2460,auStack_2450);
  auVar325 = vpunpcklwd_avx(local_2440._0_16_,local_2440._16_16_);
  auVar179 = vpunpckldq_avx(auVar291,auVar325);
  auVar291 = vpunpckhdq_avx(auVar291,auVar325);
  local_2060[0] = auVar179._0_8_;
  local_2060[1] = 0;
  alVar155 = (__m128i)vpsrldq_avx(auVar179,8);
  alStack_2050[0] = alVar155[0];
  alStack_2050[1] = alVar155[1];
  local_2040[0] = auVar291._0_8_;
  local_2040[1] = 0;
  alVar155 = (__m128i)vpsrldq_avx(auVar291,8);
  alStack_2030[0] = alVar155[0];
  alStack_2030[1] = alVar155[1];
  auVar291 = vpunpckhwd_avx(local_2460,auStack_2450);
  auVar325 = vpunpckhwd_avx(local_2440._0_16_,local_2440._16_16_);
  auVar179 = vpunpckldq_avx(auVar291,auVar325);
  auVar291 = vpunpckhdq_avx(auVar291,auVar325);
  local_2020[0] = auVar179._0_8_;
  local_2020[1] = 0;
  alVar155 = (__m128i)vpsrldq_avx(auVar179,8);
  alStack_2010[0] = alVar155[0];
  alStack_2010[1] = alVar155[1];
  local_2000[0] = auVar291._0_8_;
  local_2000[1] = 0;
  alVar155 = (__m128i)vpsrldq_avx(auVar291,8);
  alStack_1ff0[0] = alVar155[0];
  alStack_1ff0[1] = alVar155[1];
  for (lVar30 = 0; lVar30 != 0x80; lVar30 = lVar30 + 0x10) {
    *(undefined8 *)dst = *(undefined8 *)((long)local_2060 + lVar30);
    dst = dst + stride;
  }
  return;
LAB_002fa80d:
  for (; lVar30 != 0x100; lVar30 = lVar30 + 0x20) {
    *(undefined1 (*) [32])((long)local_2060 + lVar30) = auVar67;
  }
LAB_002fc140:
  highbd_transpose8x16_16x8_avx2((__m256i *)local_2060,(__m256i *)local_2460);
  puVar23 = dst;
  for (lVar30 = 0; lVar30 != 0x100; lVar30 = lVar30 + 0x20) {
    uVar4 = *(undefined8 *)(local_2460 + lVar30 + 8);
    *(undefined8 *)puVar23 = *(undefined8 *)(local_2460 + lVar30);
    *(undefined8 *)(puVar23 + 4) = uVar4;
    puVar23 = puVar23 + stride;
  }
  puVar23 = dst + stride * 8;
  for (lVar30 = 0; lVar30 != 0x100; lVar30 = lVar30 + 0x20) {
    uVar4 = *(undefined8 *)(local_2440 + lVar30 + -8);
    *(undefined8 *)(puVar23 + 8) = *(undefined8 *)(local_2460 + lVar30 + 0x10);
    *(undefined8 *)(puVar23 + 0xc) = uVar4;
    puVar23 = puVar23 + stride;
  }
  return;
LAB_002f8a36:
  for (; lVar30 != 0x80; lVar30 = lVar30 + 0x10) {
    *(undefined1 (*) [16])((long)local_2060 + lVar30) = auVar47;
  }
LAB_002fbf07:
  auVar11._8_8_ = local_2060[1];
  auVar11._0_8_ = local_2060[0];
  auVar15._8_8_ = local_2040[1];
  auVar15._0_8_ = local_2040[0];
  auVar18._8_8_ = local_2020[1];
  auVar18._0_8_ = local_2020[0];
  auVar291 = vpunpcklwd_avx(auVar11,(undefined1  [16])alStack_2050);
  auVar325 = vpunpcklwd_avx(auVar15,(undefined1  [16])alStack_2030);
  auVar329 = vpunpcklwd_avx(auVar18,(undefined1  [16])alStack_2010);
  auVar21._8_8_ = local_2000[1];
  auVar21._0_8_ = local_2000[0];
  auVar397 = vpunpcklwd_avx(auVar21,(undefined1  [16])alStack_1ff0);
  auVar179 = vpunpckldq_avx(auVar291,auVar325);
  auVar398 = vpunpckldq_avx(auVar329,auVar397);
  auVar75 = vpunpcklqdq_avx(auVar179,auVar398);
  auVar179 = vpunpckhqdq_avx(auVar179,auVar398);
  auVar291 = vpunpckhdq_avx(auVar291,auVar325);
  auVar325 = vpunpckhdq_avx(auVar329,auVar397);
  auVar329 = vpunpcklqdq_avx(auVar291,auVar325);
  auVar291 = vpunpckhqdq_avx(auVar291,auVar325);
  *(undefined1 (*) [16])dst = auVar75;
  *(undefined1 (*) [16])(dst + stride) = auVar179;
  *(undefined1 (*) [16])(dst + stride * 2) = auVar329;
  *(undefined1 (*) [16])(dst + stride * 3) = auVar291;
  return;
LAB_002fa9c4:
  for (; lVar30 != 0x100; lVar30 = lVar30 + 0x10) {
    *(undefined1 (*) [16])((long)local_2060 + lVar30) = auVar57;
  }
LAB_002fc373:
  lVar30 = 0;
  for (uVar43 = 0; uVar43 < 0x10; uVar43 = uVar43 + 8) {
    highbd_transpose8x8_sse2
              ((__m128i *)((long)local_2060 + lVar30),(__m128i *)((long)alStack_2050 + lVar30),
               (__m128i *)((long)local_2040 + lVar30),(__m128i *)((long)alStack_2030 + lVar30),
               (__m128i *)((long)local_2020 + lVar30),(__m128i *)((long)alStack_2010 + lVar30),
               (__m128i *)((long)local_2000 + lVar30),(__m128i *)((long)alStack_1ff0 + lVar30),
               (__m128i *)(local_2460 + lVar30),(__m128i *)(local_2460 + lVar30 + 0x10),
               (__m128i *)(local_2440 + lVar30),(__m128i *)(local_2440 + lVar30 + 0x10),
               (__m128i *)(local_2420 + lVar30),(__m128i *)(local_2420 + lVar30 + 0x10),
               (__m128i *)(local_2400 + lVar30),(__m128i *)(local_2400 + lVar30 + 0x10));
    lVar30 = lVar30 + 0x80;
  }
  puVar23 = dst + 8;
  for (lVar30 = 0; lVar30 != 0x80; lVar30 = lVar30 + 0x10) {
    uVar4 = *(undefined8 *)(local_2460 + lVar30 + 8);
    *(undefined8 *)(puVar23 + -8) = *(undefined8 *)(local_2460 + lVar30);
    *(undefined8 *)(puVar23 + -4) = uVar4;
    uVar4 = *(undefined8 *)((long)auStack_23e0 + lVar30 + 8);
    *(undefined8 *)puVar23 = *(undefined8 *)((long)auStack_23e0 + lVar30);
    *(undefined8 *)(puVar23 + 4) = uVar4;
    puVar23 = puVar23 + stride;
  }
  return;
LAB_002fa5de:
  for (; lVar30 != 0x400; lVar30 = lVar30 + 0x20) {
    *(undefined1 (*) [32])((long)local_2060 + lVar30) = auVar66;
  }
LAB_002fbaf9:
  for (uVar43 = 0; uVar43 < 0x20; uVar43 = uVar43 + 0x10) {
    highbd_transpose16x16_avx2((__m256i *)(local_2060 + uVar43 * 4),(__m256i *)local_2460);
    pauVar25 = (undefined1 (*) [32])dst;
    for (lVar30 = 0; lVar30 != 0x200; lVar30 = lVar30 + 0x20) {
      *pauVar25 = *(undefined1 (*) [32])(local_2460 + lVar30);
      pauVar25 = (undefined1 (*) [32])(*pauVar25 + stride * 2);
    }
    dst = (uint16_t *)((long)dst + 0x20);
  }
  return;
LAB_002f8d66:
  for (; lVar30 != 0x100; lVar30 = lVar30 + 0x10) {
    *(undefined1 (*) [16])((long)local_2060 + lVar30) = auVar49;
  }
LAB_002fb597:
  auVar10._8_8_ = local_2060[1];
  auVar10._0_8_ = local_2060[0];
  auVar14._8_8_ = local_2040[1];
  auVar14._0_8_ = local_2040[0];
  auVar17._8_8_ = local_2020[1];
  auVar17._0_8_ = local_2020[0];
  auVar20._8_8_ = local_2000[1];
  auVar20._0_8_ = local_2000[0];
  auVar291 = vpunpcklwd_avx(auVar10,(undefined1  [16])alStack_2050);
  auVar325 = vpunpcklwd_avx(auVar14,(undefined1  [16])alStack_2030);
  auVar179 = vpunpcklwd_avx(auVar17,(undefined1  [16])alStack_2010);
  auVar329 = vpunpcklwd_avx(auVar20,(undefined1  [16])alStack_1ff0);
  auVar397 = vpunpcklwd_avx(local_1fe0,local_1fd0);
  auVar398 = vpunpcklwd_avx(local_1fc0,local_1fb0);
  auVar75 = vpunpcklwd_avx(local_1fa0,local_1f90);
  auVar101 = vpunpcklwd_avx(local_1f80,local_1f70);
  auVar330 = vpunpckldq_avx(auVar291,auVar325);
  auVar291 = vpunpckhdq_avx(auVar291,auVar325);
  auVar49 = vpunpckldq_avx(auVar179,auVar329);
  auVar325 = vpunpckhdq_avx(auVar179,auVar329);
  auVar77 = vpunpckldq_avx(auVar397,auVar398);
  auVar179 = vpunpckhdq_avx(auVar397,auVar398);
  auVar398 = vpunpckldq_avx(auVar75,auVar101);
  auVar329 = vpunpckhdq_avx(auVar75,auVar101);
  auVar75 = vpunpcklqdq_avx(auVar330,auVar49);
  auVar101 = vpunpcklqdq_avx(auVar77,auVar398);
  auVar397 = vpunpckhqdq_avx(auVar330,auVar49);
  auVar398 = vpunpckhqdq_avx(auVar77,auVar398);
  auVar330 = vpunpcklqdq_avx(auVar291,auVar325);
  auVar49 = vpunpcklqdq_avx(auVar179,auVar329);
  auVar291 = vpunpckhqdq_avx(auVar291,auVar325);
  auVar325 = vpunpckhqdq_avx(auVar179,auVar329);
  *(undefined1 (*) [16])dst = auVar75;
  *(undefined1 (*) [16])(dst + 8) = auVar101;
  *(undefined1 (*) [16])(dst + stride) = auVar397;
  *(undefined1 (*) [16])(dst + stride + 8) = auVar398;
  *(undefined1 (*) [16])(dst + stride * 2) = auVar330;
  *(undefined1 (*) [16])(dst + stride * 2 + 8) = auVar49;
  *(undefined1 (*) [16])(dst + stride * 3) = auVar291;
  *(undefined1 (*) [16])(dst + stride * 3 + 8) = auVar325;
  return;
LAB_002fa009:
  for (; lVar30 != 0x200; lVar30 = lVar30 + 0x10) {
    *(undefined1 (*) [16])((long)local_2060 + lVar30) = auVar325;
  }
LAB_002faea7:
  lVar30 = 0;
  for (uVar43 = 0; uVar43 < 0x20; uVar43 = uVar43 + 8) {
    highbd_transpose8x8_sse2
              ((__m128i *)((long)local_2060 + lVar30),(__m128i *)((long)alStack_2050 + lVar30),
               (__m128i *)((long)local_2040 + lVar30),(__m128i *)((long)alStack_2030 + lVar30),
               (__m128i *)((long)local_2020 + lVar30),(__m128i *)((long)alStack_2010 + lVar30),
               (__m128i *)((long)local_2000 + lVar30),(__m128i *)((long)alStack_1ff0 + lVar30),
               (__m128i *)(local_2460 + lVar30),(__m128i *)(local_2460 + lVar30 + 0x10),
               (__m128i *)(local_2440 + lVar30),(__m128i *)(local_2440 + lVar30 + 0x10),
               (__m128i *)(local_2420 + lVar30),(__m128i *)(local_2420 + lVar30 + 0x10),
               (__m128i *)(local_2400 + lVar30),(__m128i *)(local_2400 + lVar30 + 0x10));
    lVar30 = lVar30 + 0x80;
  }
  puVar23 = dst + 0x18;
  for (lVar30 = 0; lVar30 != 0x80; lVar30 = lVar30 + 0x10) {
    uVar4 = *(undefined8 *)(local_2460 + lVar30 + 8);
    *(undefined8 *)(puVar23 + -0x18) = *(undefined8 *)(local_2460 + lVar30);
    *(undefined8 *)(puVar23 + -0x14) = uVar4;
    uVar4 = *(undefined8 *)((long)auStack_23e0 + lVar30 + 8);
    *(undefined8 *)(puVar23 + -0x10) = *(undefined8 *)((long)auStack_23e0 + lVar30);
    *(undefined8 *)(puVar23 + -0xc) = uVar4;
    uVar4 = *(undefined8 *)((long)auStack_23e0 + lVar30 + 0x88);
    *(undefined8 *)(puVar23 + -8) = *(undefined8 *)((long)auStack_23e0 + lVar30 + 0x80);
    *(undefined8 *)(puVar23 + -4) = uVar4;
    uVar4 = *(undefined8 *)((long)auStack_23e0 + lVar30 + 0x108);
    *(undefined8 *)puVar23 = *(undefined8 *)((long)auStack_23e0 + lVar30 + 0x100);
    *(undefined8 *)(puVar23 + 4) = uVar4;
    puVar23 = puVar23 + stride;
  }
  return;
LAB_002fa252:
  for (; lVar30 != 0x800; lVar30 = lVar30 + 0x20) {
    *(undefined1 (*) [32])((long)local_2060 + lVar30) = auVar400;
  }
LAB_002fb19d:
  for (uVar43 = 0; uVar43 < 0x40; uVar43 = uVar43 + 0x10) {
    highbd_transpose16x16_avx2((__m256i *)(local_2060 + uVar43 * 4),(__m256i *)local_2460);
    pauVar25 = (undefined1 (*) [32])dst;
    for (lVar30 = 0; lVar30 != 0x200; lVar30 = lVar30 + 0x20) {
      *pauVar25 = *(undefined1 (*) [32])(local_2460 + lVar30);
      pauVar25 = (undefined1 (*) [32])(*pauVar25 + stride * 2);
    }
    dst = (uint16_t *)((long)dst + 0x20);
  }
  return;
}

Assistant:

void av1_highbd_dr_prediction_z3_avx2(uint16_t *dst, ptrdiff_t stride, int bw,
                                      int bh, const uint16_t *above,
                                      const uint16_t *left, int upsample_left,
                                      int dx, int dy, int bd) {
  (void)above;
  (void)dx;

  assert(dx == 1);
  assert(dy > 0);
  if (bw == bh) {
    switch (bw) {
      case 4:
        highbd_dr_prediction_z3_4x4_avx2(dst, stride, left, upsample_left, dy,
                                         bd);
        break;
      case 8:
        highbd_dr_prediction_z3_8x8_avx2(dst, stride, left, upsample_left, dy,
                                         bd);
        break;
      case 16:
        highbd_dr_prediction_z3_16x16_avx2(dst, stride, left, upsample_left, dy,
                                           bd);
        break;
      case 32:
        highbd_dr_prediction_z3_32x32_avx2(dst, stride, left, upsample_left, dy,
                                           bd);
        break;
      case 64:
        highbd_dr_prediction_z3_64x64_avx2(dst, stride, left, upsample_left, dy,
                                           bd);
        break;
    }
  } else {
    if (bw < bh) {
      if (bw + bw == bh) {
        switch (bw) {
          case 4:
            highbd_dr_prediction_z3_4x8_avx2(dst, stride, left, upsample_left,
                                             dy, bd);
            break;
          case 8:
            highbd_dr_prediction_z3_8x16_avx2(dst, stride, left, upsample_left,
                                              dy, bd);
            break;
          case 16:
            highbd_dr_prediction_z3_16x32_avx2(dst, stride, left, upsample_left,
                                               dy, bd);
            break;
          case 32:
            highbd_dr_prediction_z3_32x64_avx2(dst, stride, left, upsample_left,
                                               dy, bd);
            break;
        }
      } else {
        switch (bw) {
#if !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
          case 4:
            highbd_dr_prediction_z3_4x16_avx2(dst, stride, left, upsample_left,
                                              dy, bd);
            break;
          case 8:
            highbd_dr_prediction_z3_8x32_avx2(dst, stride, left, upsample_left,
                                              dy, bd);
            break;
          case 16:
            highbd_dr_prediction_z3_16x64_avx2(dst, stride, left, upsample_left,
                                               dy, bd);
            break;
#endif  // !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
        }
      }
    } else {
      if (bh + bh == bw) {
        switch (bh) {
          case 4:
            highbd_dr_prediction_z3_8x4_avx2(dst, stride, left, upsample_left,
                                             dy, bd);
            break;
          case 8:
            highbd_dr_prediction_z3_16x8_avx2(dst, stride, left, upsample_left,
                                              dy, bd);
            break;
          case 16:
            highbd_dr_prediction_z3_32x16_avx2(dst, stride, left, upsample_left,
                                               dy, bd);
            break;
          case 32:
            highbd_dr_prediction_z3_64x32_avx2(dst, stride, left, upsample_left,
                                               dy, bd);
            break;
        }
      } else {
        switch (bh) {
#if !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
          case 4:
            highbd_dr_prediction_z3_16x4_avx2(dst, stride, left, upsample_left,
                                              dy, bd);
            break;
          case 8:
            highbd_dr_prediction_z3_32x8_avx2(dst, stride, left, upsample_left,
                                              dy, bd);
            break;
          case 16:
            highbd_dr_prediction_z3_64x16_avx2(dst, stride, left, upsample_left,
                                               dy, bd);
            break;
#endif  // !CONFIG_REALTIME_ONLY || CONFIG_AV1_DECODER
        }
      }
    }
  }
  return;
}